

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Primitive PVar22;
  Geometry *pGVar23;
  __int_type_conflict _Var24;
  long lVar25;
  RTCFilterFunctionN p_Var26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [12];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  uint uVar96;
  uint uVar97;
  ulong uVar98;
  undefined1 (*pauVar99) [32];
  uint uVar100;
  uint uVar101;
  ulong uVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  uint uVar106;
  float fVar107;
  float fVar133;
  float fVar134;
  __m128 a;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar135;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar117 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar118 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar136;
  undefined8 extraout_XMM1_Qa;
  float fVar169;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar173;
  float fVar175;
  float fVar176;
  undefined1 auVar154 [32];
  float fVar137;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar174;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar179 [16];
  float fVar178;
  float fVar199;
  undefined1 auVar180 [16];
  float fVar177;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar197;
  float fVar198;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar187 [32];
  float fVar203;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar204;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar183 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar205;
  float fVar229;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [28];
  float fVar228;
  float fVar230;
  float fVar231;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar232;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar233;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar234;
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar254;
  float fVar256;
  float fVar258;
  float fVar260;
  undefined1 auVar245 [28];
  float fVar255;
  float fVar257;
  float fVar259;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar261;
  float fVar271;
  float fVar272;
  undefined1 auVar262 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar267 [32];
  float fVar273;
  undefined1 auVar263 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  float fVar277;
  float fVar278;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  float fVar290;
  float fVar292;
  float fVar296;
  float fVar297;
  float fVar299;
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar294;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar291;
  float fVar293;
  float fVar295;
  float fVar298;
  float fVar300;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar301;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar318;
  float fVar319;
  float fVar323;
  float fVar325;
  float fVar327;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  float fVar321;
  float fVar329;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar320;
  float fVar322;
  float fVar324;
  float fVar326;
  float fVar328;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar335 [32];
  undefined1 auVar339 [64];
  undefined1 auVar340 [64];
  float s;
  undefined1 auVar371 [16];
  float fVar341;
  float fVar347;
  float fVar349;
  float fVar351;
  float fVar353;
  float fVar355;
  float fVar357;
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  float fVar348;
  float fVar350;
  float fVar352;
  float fVar354;
  float fVar356;
  float fVar358;
  float fVar359;
  float fVar360;
  undefined1 auVar346 [32];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  float fVar380;
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [64];
  undefined1 auVar385 [16];
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float in_register_0000151c;
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  undefined1 auVar409 [16];
  float fVar414;
  float fVar417;
  float fVar420;
  float fVar424;
  float fVar427;
  float fVar430;
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  float fVar415;
  float fVar416;
  float fVar418;
  float fVar419;
  float fVar421;
  float fVar422;
  float fVar423;
  float fVar425;
  float fVar426;
  float fVar428;
  float fVar429;
  float fVar431;
  float fVar432;
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar434 [16];
  float fVar433;
  float fVar440;
  float fVar441;
  float fVar443;
  float fVar444;
  float fVar445;
  float in_register_0000159c;
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  float fVar442;
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  float in_register_000015dc;
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c28;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 auStack_a30 [16];
  undefined1 (*local_a10) [16];
  ulong local_a08;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_890 [16];
  undefined1 local_880 [16];
  Primitive *local_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  RTCHitN local_720 [16];
  undefined1 auStack_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  uint local_6b0;
  uint uStack_6ac;
  uint uStack_6a8;
  uint uStack_6a4;
  undefined1 auStack_6a0 [16];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar167 [64];
  
  PVar22 = prim[1];
  uVar98 = (ulong)(byte)PVar22;
  lVar103 = uVar98 * 0x25;
  auVar302 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar302 = vinsertps_avx(auVar302,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar32 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar302 = vsubps_avx(auVar302,*(undefined1 (*) [16])(prim + lVar103 + 6));
  fVar205 = *(float *)(prim + lVar103 + 0x12);
  auVar138._0_4_ = fVar205 * auVar302._0_4_;
  auVar138._4_4_ = fVar205 * auVar302._4_4_;
  auVar138._8_4_ = fVar205 * auVar302._8_4_;
  auVar138._12_4_ = fVar205 * auVar302._12_4_;
  auVar302 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 4 + 6)));
  auVar262._0_4_ = fVar205 * auVar32._0_4_;
  auVar262._4_4_ = fVar205 * auVar32._4_4_;
  auVar262._8_4_ = fVar205 * auVar32._8_4_;
  auVar262._12_4_ = fVar205 * auVar32._12_4_;
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 4 + 10)));
  auVar119._16_16_ = auVar32;
  auVar119._0_16_ = auVar302;
  auVar119 = vcvtdq2ps_avx(auVar119);
  lVar25 = uVar98 * 5;
  auVar302 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar25 + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar25 + 10)));
  auVar187._16_16_ = auVar32;
  auVar187._0_16_ = auVar302;
  auVar302 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 6 + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 6 + 10)));
  auVar164 = vcvtdq2ps_avx(auVar187);
  auVar220._16_16_ = auVar32;
  auVar220._0_16_ = auVar302;
  auVar27 = vcvtdq2ps_avx(auVar220);
  auVar302 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0xf + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0xf + 10)));
  auVar221._16_16_ = auVar32;
  auVar221._0_16_ = auVar302;
  auVar28 = vcvtdq2ps_avx(auVar221);
  lVar105 = (ulong)(byte)PVar22 * 0x10;
  auVar302 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar105 + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar105 + 10)));
  auVar282._16_16_ = auVar32;
  auVar282._0_16_ = auVar302;
  auVar302 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar105 + uVar98 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar282);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar105 + uVar98 + 10)));
  auVar304._16_16_ = auVar32;
  auVar304._0_16_ = auVar302;
  auVar302 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0x1a + 6)));
  auVar157 = vcvtdq2ps_avx(auVar304);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0x1a + 10)));
  auVar305._16_16_ = auVar32;
  auVar305._0_16_ = auVar302;
  auVar268 = vcvtdq2ps_avx(auVar305);
  auVar302 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0x1b + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0x1b + 10)));
  auVar342._16_16_ = auVar32;
  auVar342._0_16_ = auVar302;
  auVar302 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0x1c + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0x1c + 10)));
  auVar30 = vcvtdq2ps_avx(auVar342);
  auVar363._16_16_ = auVar32;
  auVar363._0_16_ = auVar302;
  auVar31 = vcvtdq2ps_avx(auVar363);
  auVar302 = vshufps_avx(auVar262,auVar262,0);
  auVar32 = vshufps_avx(auVar262,auVar262,0x55);
  auVar33 = vshufps_avx(auVar262,auVar262,0xaa);
  fVar205 = auVar33._0_4_;
  fVar137 = auVar33._4_4_;
  fVar228 = auVar33._8_4_;
  fVar170 = auVar33._12_4_;
  fVar203 = auVar32._0_4_;
  fVar173 = auVar32._4_4_;
  fVar229 = auVar32._8_4_;
  fVar178 = auVar32._12_4_;
  fVar230 = auVar302._0_4_;
  fVar231 = auVar302._4_4_;
  fVar232 = auVar302._8_4_;
  fVar234 = auVar302._12_4_;
  auVar386._0_4_ = fVar230 * auVar119._0_4_ + fVar203 * auVar164._0_4_ + fVar205 * auVar27._0_4_;
  auVar386._4_4_ = fVar231 * auVar119._4_4_ + fVar173 * auVar164._4_4_ + fVar137 * auVar27._4_4_;
  auVar386._8_4_ = fVar232 * auVar119._8_4_ + fVar229 * auVar164._8_4_ + fVar228 * auVar27._8_4_;
  auVar386._12_4_ = fVar234 * auVar119._12_4_ + fVar178 * auVar164._12_4_ + fVar170 * auVar27._12_4_
  ;
  auVar386._16_4_ = fVar230 * auVar119._16_4_ + fVar203 * auVar164._16_4_ + fVar205 * auVar27._16_4_
  ;
  auVar386._20_4_ = fVar231 * auVar119._20_4_ + fVar173 * auVar164._20_4_ + fVar137 * auVar27._20_4_
  ;
  auVar386._24_4_ = fVar232 * auVar119._24_4_ + fVar229 * auVar164._24_4_ + fVar228 * auVar27._24_4_
  ;
  auVar386._28_4_ = fVar178 + in_register_000015dc + in_register_0000151c;
  auVar372._0_4_ = fVar230 * auVar28._0_4_ + fVar203 * auVar29._0_4_ + auVar157._0_4_ * fVar205;
  auVar372._4_4_ = fVar231 * auVar28._4_4_ + fVar173 * auVar29._4_4_ + auVar157._4_4_ * fVar137;
  auVar372._8_4_ = fVar232 * auVar28._8_4_ + fVar229 * auVar29._8_4_ + auVar157._8_4_ * fVar228;
  auVar372._12_4_ = fVar234 * auVar28._12_4_ + fVar178 * auVar29._12_4_ + auVar157._12_4_ * fVar170;
  auVar372._16_4_ = fVar230 * auVar28._16_4_ + fVar203 * auVar29._16_4_ + auVar157._16_4_ * fVar205;
  auVar372._20_4_ = fVar231 * auVar28._20_4_ + fVar173 * auVar29._20_4_ + auVar157._20_4_ * fVar137;
  auVar372._24_4_ = fVar232 * auVar28._24_4_ + fVar229 * auVar29._24_4_ + auVar157._24_4_ * fVar228;
  auVar372._28_4_ = fVar178 + in_register_000015dc + in_register_0000159c;
  auVar267._0_4_ = fVar230 * auVar268._0_4_ + fVar203 * auVar30._0_4_ + auVar31._0_4_ * fVar205;
  auVar267._4_4_ = fVar231 * auVar268._4_4_ + fVar173 * auVar30._4_4_ + auVar31._4_4_ * fVar137;
  auVar267._8_4_ = fVar232 * auVar268._8_4_ + fVar229 * auVar30._8_4_ + auVar31._8_4_ * fVar228;
  auVar267._12_4_ = fVar234 * auVar268._12_4_ + fVar178 * auVar30._12_4_ + auVar31._12_4_ * fVar170;
  auVar267._16_4_ = fVar230 * auVar268._16_4_ + fVar203 * auVar30._16_4_ + auVar31._16_4_ * fVar205;
  auVar267._20_4_ = fVar231 * auVar268._20_4_ + fVar173 * auVar30._20_4_ + auVar31._20_4_ * fVar137;
  auVar267._24_4_ = fVar232 * auVar268._24_4_ + fVar229 * auVar30._24_4_ + auVar31._24_4_ * fVar228;
  auVar267._28_4_ = fVar234 + fVar178 + fVar170;
  auVar302 = vshufps_avx(auVar138,auVar138,0);
  auVar32 = vshufps_avx(auVar138,auVar138,0x55);
  auVar33 = vshufps_avx(auVar138,auVar138,0xaa);
  fVar205 = auVar33._0_4_;
  fVar137 = auVar33._4_4_;
  fVar228 = auVar33._8_4_;
  fVar170 = auVar33._12_4_;
  fVar231 = auVar32._0_4_;
  fVar232 = auVar32._4_4_;
  fVar234 = auVar32._8_4_;
  fVar251 = auVar32._12_4_;
  fVar203 = auVar164._28_4_ + auVar27._28_4_;
  fVar173 = auVar302._0_4_;
  fVar229 = auVar302._4_4_;
  fVar178 = auVar302._8_4_;
  fVar230 = auVar302._12_4_;
  auVar154._0_4_ = fVar173 * auVar119._0_4_ + fVar231 * auVar164._0_4_ + fVar205 * auVar27._0_4_;
  auVar154._4_4_ = fVar229 * auVar119._4_4_ + fVar232 * auVar164._4_4_ + fVar137 * auVar27._4_4_;
  auVar154._8_4_ = fVar178 * auVar119._8_4_ + fVar234 * auVar164._8_4_ + fVar228 * auVar27._8_4_;
  auVar154._12_4_ = fVar230 * auVar119._12_4_ + fVar251 * auVar164._12_4_ + fVar170 * auVar27._12_4_
  ;
  auVar154._16_4_ = fVar173 * auVar119._16_4_ + fVar231 * auVar164._16_4_ + fVar205 * auVar27._16_4_
  ;
  auVar154._20_4_ = fVar229 * auVar119._20_4_ + fVar232 * auVar164._20_4_ + fVar137 * auVar27._20_4_
  ;
  auVar154._24_4_ = fVar178 * auVar119._24_4_ + fVar234 * auVar164._24_4_ + fVar228 * auVar27._24_4_
  ;
  auVar154._28_4_ = auVar119._28_4_ + fVar203;
  auVar120._0_4_ = fVar173 * auVar28._0_4_ + auVar157._0_4_ * fVar205 + fVar231 * auVar29._0_4_;
  auVar120._4_4_ = fVar229 * auVar28._4_4_ + auVar157._4_4_ * fVar137 + fVar232 * auVar29._4_4_;
  auVar120._8_4_ = fVar178 * auVar28._8_4_ + auVar157._8_4_ * fVar228 + fVar234 * auVar29._8_4_;
  auVar120._12_4_ = fVar230 * auVar28._12_4_ + auVar157._12_4_ * fVar170 + fVar251 * auVar29._12_4_;
  auVar120._16_4_ = fVar173 * auVar28._16_4_ + auVar157._16_4_ * fVar205 + fVar231 * auVar29._16_4_;
  auVar120._20_4_ = fVar229 * auVar28._20_4_ + auVar157._20_4_ * fVar137 + fVar232 * auVar29._20_4_;
  auVar120._24_4_ = fVar178 * auVar28._24_4_ + auVar157._24_4_ * fVar228 + fVar234 * auVar29._24_4_;
  auVar120._28_4_ = auVar119._28_4_ + auVar157._28_4_ + auVar27._28_4_;
  auVar306._8_4_ = 0x7fffffff;
  auVar306._0_8_ = 0x7fffffff7fffffff;
  auVar306._12_4_ = 0x7fffffff;
  auVar306._16_4_ = 0x7fffffff;
  auVar306._20_4_ = 0x7fffffff;
  auVar306._24_4_ = 0x7fffffff;
  auVar306._28_4_ = 0x7fffffff;
  auVar330._8_4_ = 0x219392ef;
  auVar330._0_8_ = 0x219392ef219392ef;
  auVar330._12_4_ = 0x219392ef;
  auVar330._16_4_ = 0x219392ef;
  auVar330._20_4_ = 0x219392ef;
  auVar330._24_4_ = 0x219392ef;
  auVar330._28_4_ = 0x219392ef;
  auVar119 = vandps_avx(auVar386,auVar306);
  auVar119 = vcmpps_avx(auVar119,auVar330,1);
  auVar164 = vblendvps_avx(auVar386,auVar330,auVar119);
  auVar119 = vandps_avx(auVar372,auVar306);
  auVar119 = vcmpps_avx(auVar119,auVar330,1);
  auVar27 = vblendvps_avx(auVar372,auVar330,auVar119);
  auVar119 = vandps_avx(auVar267,auVar306);
  auVar119 = vcmpps_avx(auVar119,auVar330,1);
  auVar119 = vblendvps_avx(auVar267,auVar330,auVar119);
  auVar188._0_4_ = fVar173 * auVar268._0_4_ + fVar231 * auVar30._0_4_ + auVar31._0_4_ * fVar205;
  auVar188._4_4_ = fVar229 * auVar268._4_4_ + fVar232 * auVar30._4_4_ + auVar31._4_4_ * fVar137;
  auVar188._8_4_ = fVar178 * auVar268._8_4_ + fVar234 * auVar30._8_4_ + auVar31._8_4_ * fVar228;
  auVar188._12_4_ = fVar230 * auVar268._12_4_ + fVar251 * auVar30._12_4_ + auVar31._12_4_ * fVar170;
  auVar188._16_4_ = fVar173 * auVar268._16_4_ + fVar231 * auVar30._16_4_ + auVar31._16_4_ * fVar205;
  auVar188._20_4_ = fVar229 * auVar268._20_4_ + fVar232 * auVar30._20_4_ + auVar31._20_4_ * fVar137;
  auVar188._24_4_ = fVar178 * auVar268._24_4_ + fVar234 * auVar30._24_4_ + auVar31._24_4_ * fVar228;
  auVar188._28_4_ = fVar203 + auVar29._28_4_ + fVar170;
  auVar28 = vrcpps_avx(auVar164);
  fVar205 = auVar28._0_4_;
  fVar228 = auVar28._4_4_;
  auVar29._4_4_ = auVar164._4_4_ * fVar228;
  auVar29._0_4_ = auVar164._0_4_ * fVar205;
  fVar203 = auVar28._8_4_;
  auVar29._8_4_ = auVar164._8_4_ * fVar203;
  fVar229 = auVar28._12_4_;
  auVar29._12_4_ = auVar164._12_4_ * fVar229;
  fVar230 = auVar28._16_4_;
  auVar29._16_4_ = auVar164._16_4_ * fVar230;
  fVar231 = auVar28._20_4_;
  auVar29._20_4_ = auVar164._20_4_ * fVar231;
  fVar232 = auVar28._24_4_;
  auVar29._24_4_ = auVar164._24_4_ * fVar232;
  auVar29._28_4_ = auVar164._28_4_;
  auVar331._8_4_ = 0x3f800000;
  auVar331._0_8_ = 0x3f8000003f800000;
  auVar331._12_4_ = 0x3f800000;
  auVar331._16_4_ = 0x3f800000;
  auVar331._20_4_ = 0x3f800000;
  auVar331._24_4_ = 0x3f800000;
  auVar331._28_4_ = 0x3f800000;
  auVar157 = vsubps_avx(auVar331,auVar29);
  auVar29 = vrcpps_avx(auVar27);
  fVar205 = fVar205 + fVar205 * auVar157._0_4_;
  fVar228 = fVar228 + fVar228 * auVar157._4_4_;
  fVar203 = fVar203 + fVar203 * auVar157._8_4_;
  fVar229 = fVar229 + fVar229 * auVar157._12_4_;
  fVar230 = fVar230 + fVar230 * auVar157._16_4_;
  fVar231 = fVar231 + fVar231 * auVar157._20_4_;
  fVar232 = fVar232 + fVar232 * auVar157._24_4_;
  fVar234 = auVar29._0_4_;
  fVar251 = auVar29._4_4_;
  auVar164._4_4_ = fVar251 * auVar27._4_4_;
  auVar164._0_4_ = fVar234 * auVar27._0_4_;
  fVar252 = auVar29._8_4_;
  auVar164._8_4_ = fVar252 * auVar27._8_4_;
  fVar253 = auVar29._12_4_;
  auVar164._12_4_ = fVar253 * auVar27._12_4_;
  fVar255 = auVar29._16_4_;
  auVar164._16_4_ = fVar255 * auVar27._16_4_;
  fVar257 = auVar29._20_4_;
  auVar164._20_4_ = fVar257 * auVar27._20_4_;
  fVar259 = auVar29._24_4_;
  auVar164._24_4_ = fVar259 * auVar27._24_4_;
  auVar164._28_4_ = auVar27._28_4_;
  auVar27 = vsubps_avx(auVar331,auVar164);
  fVar234 = fVar234 + fVar234 * auVar27._0_4_;
  fVar251 = fVar251 + fVar251 * auVar27._4_4_;
  fVar252 = fVar252 + fVar252 * auVar27._8_4_;
  fVar253 = fVar253 + fVar253 * auVar27._12_4_;
  fVar255 = fVar255 + fVar255 * auVar27._16_4_;
  fVar257 = fVar257 + fVar257 * auVar27._20_4_;
  fVar259 = fVar259 + fVar259 * auVar27._24_4_;
  auVar164 = vrcpps_avx(auVar119);
  fVar261 = auVar164._0_4_;
  fVar271 = auVar164._4_4_;
  auVar268._4_4_ = fVar271 * auVar119._4_4_;
  auVar268._0_4_ = fVar261 * auVar119._0_4_;
  fVar272 = auVar164._8_4_;
  auVar268._8_4_ = fVar272 * auVar119._8_4_;
  fVar273 = auVar164._12_4_;
  auVar268._12_4_ = fVar273 * auVar119._12_4_;
  fVar274 = auVar164._16_4_;
  auVar268._16_4_ = fVar274 * auVar119._16_4_;
  fVar275 = auVar164._20_4_;
  auVar268._20_4_ = fVar275 * auVar119._20_4_;
  fVar276 = auVar164._24_4_;
  auVar268._24_4_ = fVar276 * auVar119._24_4_;
  auVar268._28_4_ = auVar119._28_4_;
  auVar119 = vsubps_avx(auVar331,auVar268);
  fVar261 = fVar261 + fVar261 * auVar119._0_4_;
  fVar271 = fVar271 + fVar271 * auVar119._4_4_;
  fVar272 = fVar272 + fVar272 * auVar119._8_4_;
  fVar273 = fVar273 + fVar273 * auVar119._12_4_;
  fVar274 = fVar274 + fVar274 * auVar119._16_4_;
  fVar275 = fVar275 + fVar275 * auVar119._20_4_;
  fVar276 = fVar276 + fVar276 * auVar119._24_4_;
  auVar302 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar103 + 0x16)) *
                           *(float *)(prim + lVar103 + 0x1a)));
  auVar34 = vshufps_avx(auVar302,auVar302,0);
  auVar302._8_8_ = 0;
  auVar302._0_8_ = *(ulong *)(prim + uVar98 * 7 + 6);
  auVar302 = vpmovsxwd_avx(auVar302);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar98 * 7 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar32);
  auVar307._16_16_ = auVar32;
  auVar307._0_16_ = auVar302;
  auVar119 = vcvtdq2ps_avx(auVar307);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar98 * 0xb + 6);
  auVar302 = vpmovsxwd_avx(auVar33);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar98 * 0xb + 0xe);
  auVar32 = vpmovsxwd_avx(auVar141);
  auVar332._16_16_ = auVar32;
  auVar332._0_16_ = auVar302;
  auVar164 = vcvtdq2ps_avx(auVar332);
  auVar164 = vsubps_avx(auVar164,auVar119);
  fVar137 = auVar34._0_4_;
  fVar170 = auVar34._4_4_;
  fVar173 = auVar34._8_4_;
  fVar178 = auVar34._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar98 * 9 + 6);
  auVar302 = vpmovsxwd_avx(auVar34);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar98 * 9 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar10);
  auVar308._0_4_ = auVar164._0_4_ * fVar137 + auVar119._0_4_;
  auVar308._4_4_ = auVar164._4_4_ * fVar170 + auVar119._4_4_;
  auVar308._8_4_ = auVar164._8_4_ * fVar173 + auVar119._8_4_;
  auVar308._12_4_ = auVar164._12_4_ * fVar178 + auVar119._12_4_;
  auVar308._16_4_ = auVar164._16_4_ * fVar137 + auVar119._16_4_;
  auVar308._20_4_ = auVar164._20_4_ * fVar170 + auVar119._20_4_;
  auVar308._24_4_ = auVar164._24_4_ * fVar173 + auVar119._24_4_;
  auVar308._28_4_ = auVar164._28_4_ + auVar119._28_4_;
  auVar333._16_16_ = auVar32;
  auVar333._0_16_ = auVar302;
  auVar119 = vcvtdq2ps_avx(auVar333);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar98 * 0xd + 6);
  auVar302 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar98 * 0xd + 0xe);
  auVar32 = vpmovsxwd_avx(auVar12);
  auVar343._16_16_ = auVar32;
  auVar343._0_16_ = auVar302;
  auVar164 = vcvtdq2ps_avx(auVar343);
  auVar164 = vsubps_avx(auVar164,auVar119);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + uVar98 * 0x12 + 6);
  auVar302 = vpmovsxwd_avx(auVar216);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *(ulong *)(prim + uVar98 * 0x12 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar180);
  auVar334._0_4_ = auVar119._0_4_ + auVar164._0_4_ * fVar137;
  auVar334._4_4_ = auVar119._4_4_ + auVar164._4_4_ * fVar170;
  auVar334._8_4_ = auVar119._8_4_ + auVar164._8_4_ * fVar173;
  auVar334._12_4_ = auVar119._12_4_ + auVar164._12_4_ * fVar178;
  auVar334._16_4_ = auVar119._16_4_ + auVar164._16_4_ * fVar137;
  auVar334._20_4_ = auVar119._20_4_ + auVar164._20_4_ * fVar170;
  auVar334._24_4_ = auVar119._24_4_ + auVar164._24_4_ * fVar173;
  auVar334._28_4_ = auVar119._28_4_ + auVar164._28_4_;
  auVar344._16_16_ = auVar32;
  auVar344._0_16_ = auVar302;
  auVar119 = vcvtdq2ps_avx(auVar344);
  uVar102 = (ulong)(uint)((int)lVar25 << 2);
  lVar103 = uVar98 * 2 + uVar102;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + lVar103 + 6);
  auVar302 = vpmovsxwd_avx(auVar114);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + lVar103 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar147);
  auVar364._16_16_ = auVar32;
  auVar364._0_16_ = auVar302;
  auVar164 = vcvtdq2ps_avx(auVar364);
  auVar164 = vsubps_avx(auVar164,auVar119);
  auVar371._8_8_ = 0;
  auVar371._0_8_ = *(ulong *)(prim + uVar102 + 6);
  auVar302 = vpmovsxwd_avx(auVar371);
  auVar345._0_4_ = auVar119._0_4_ + auVar164._0_4_ * fVar137;
  auVar345._4_4_ = auVar119._4_4_ + auVar164._4_4_ * fVar170;
  auVar345._8_4_ = auVar119._8_4_ + auVar164._8_4_ * fVar173;
  auVar345._12_4_ = auVar119._12_4_ + auVar164._12_4_ * fVar178;
  auVar345._16_4_ = auVar119._16_4_ + auVar164._16_4_ * fVar137;
  auVar345._20_4_ = auVar119._20_4_ + auVar164._20_4_ * fVar170;
  auVar345._24_4_ = auVar119._24_4_ + auVar164._24_4_ * fVar173;
  auVar345._28_4_ = auVar119._28_4_ + auVar164._28_4_;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *(ulong *)(prim + uVar102 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar148);
  auVar365._16_16_ = auVar32;
  auVar365._0_16_ = auVar302;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar98 * 0x18 + 6);
  auVar302 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar98 * 0x18 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar14);
  auVar119 = vcvtdq2ps_avx(auVar365);
  auVar373._16_16_ = auVar32;
  auVar373._0_16_ = auVar302;
  auVar164 = vcvtdq2ps_avx(auVar373);
  auVar164 = vsubps_avx(auVar164,auVar119);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar98 * 0x1d + 6);
  auVar302 = vpmovsxwd_avx(auVar15);
  auVar366._0_4_ = auVar119._0_4_ + auVar164._0_4_ * fVar137;
  auVar366._4_4_ = auVar119._4_4_ + auVar164._4_4_ * fVar170;
  auVar366._8_4_ = auVar119._8_4_ + auVar164._8_4_ * fVar173;
  auVar366._12_4_ = auVar119._12_4_ + auVar164._12_4_ * fVar178;
  auVar366._16_4_ = auVar119._16_4_ + auVar164._16_4_ * fVar137;
  auVar366._20_4_ = auVar119._20_4_ + auVar164._20_4_ * fVar170;
  auVar366._24_4_ = auVar119._24_4_ + auVar164._24_4_ * fVar173;
  auVar366._28_4_ = auVar119._28_4_ + auVar164._28_4_;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar98 * 0x1d + 0xe);
  auVar32 = vpmovsxwd_avx(auVar116);
  lVar103 = uVar98 + (ulong)(byte)PVar22 * 0x20;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + lVar103 + 6);
  auVar33 = vpmovsxwd_avx(auVar16);
  auVar374._16_16_ = auVar32;
  auVar374._0_16_ = auVar302;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar103 + 0xe);
  auVar302 = vpmovsxwd_avx(auVar17);
  auVar387._16_16_ = auVar302;
  auVar387._0_16_ = auVar33;
  auVar119 = vcvtdq2ps_avx(auVar374);
  auVar164 = vcvtdq2ps_avx(auVar387);
  auVar164 = vsubps_avx(auVar164,auVar119);
  auVar375._0_4_ = auVar119._0_4_ + auVar164._0_4_ * fVar137;
  auVar375._4_4_ = auVar119._4_4_ + auVar164._4_4_ * fVar170;
  auVar375._8_4_ = auVar119._8_4_ + auVar164._8_4_ * fVar173;
  auVar375._12_4_ = auVar119._12_4_ + auVar164._12_4_ * fVar178;
  auVar375._16_4_ = auVar119._16_4_ + auVar164._16_4_ * fVar137;
  auVar375._20_4_ = auVar119._20_4_ + auVar164._20_4_ * fVar170;
  auVar375._24_4_ = auVar119._24_4_ + auVar164._24_4_ * fVar173;
  auVar375._28_4_ = auVar119._28_4_ + auVar164._28_4_;
  lVar103 = (ulong)(byte)PVar22 * 0x20 - uVar98;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar103 + 6);
  auVar302 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar103 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar19);
  auVar388._16_16_ = auVar32;
  auVar388._0_16_ = auVar302;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar98 * 0x23 + 6);
  auVar302 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar98 * 0x23 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar21);
  auVar410._16_16_ = auVar32;
  auVar410._0_16_ = auVar302;
  auVar119 = vcvtdq2ps_avx(auVar388);
  auVar164 = vcvtdq2ps_avx(auVar410);
  auVar164 = vsubps_avx(auVar164,auVar119);
  auVar389._0_4_ = auVar119._0_4_ + auVar164._0_4_ * fVar137;
  auVar389._4_4_ = auVar119._4_4_ + auVar164._4_4_ * fVar170;
  auVar389._8_4_ = auVar119._8_4_ + auVar164._8_4_ * fVar173;
  auVar389._12_4_ = auVar119._12_4_ + auVar164._12_4_ * fVar178;
  auVar389._16_4_ = auVar119._16_4_ + auVar164._16_4_ * fVar137;
  auVar389._20_4_ = auVar119._20_4_ + auVar164._20_4_ * fVar170;
  auVar389._24_4_ = auVar119._24_4_ + auVar164._24_4_ * fVar173;
  auVar389._28_4_ = auVar119._28_4_ + fVar178;
  auVar119 = vsubps_avx(auVar308,auVar154);
  auVar279._0_4_ = fVar205 * auVar119._0_4_;
  auVar279._4_4_ = fVar228 * auVar119._4_4_;
  auVar279._8_4_ = fVar203 * auVar119._8_4_;
  auVar279._12_4_ = fVar229 * auVar119._12_4_;
  auVar30._16_4_ = fVar230 * auVar119._16_4_;
  auVar30._0_16_ = auVar279;
  auVar30._20_4_ = fVar231 * auVar119._20_4_;
  auVar30._24_4_ = fVar232 * auVar119._24_4_;
  auVar30._28_4_ = auVar119._28_4_;
  auVar119 = vsubps_avx(auVar334,auVar154);
  auVar206._0_4_ = fVar205 * auVar119._0_4_;
  auVar206._4_4_ = fVar228 * auVar119._4_4_;
  auVar206._8_4_ = fVar203 * auVar119._8_4_;
  auVar206._12_4_ = fVar229 * auVar119._12_4_;
  auVar31._16_4_ = fVar230 * auVar119._16_4_;
  auVar31._0_16_ = auVar206;
  auVar31._20_4_ = fVar231 * auVar119._20_4_;
  auVar31._24_4_ = fVar232 * auVar119._24_4_;
  auVar31._28_4_ = auVar28._28_4_ + auVar157._28_4_;
  auVar119 = vsubps_avx(auVar345,auVar120);
  auVar139._0_4_ = fVar234 * auVar119._0_4_;
  auVar139._4_4_ = fVar251 * auVar119._4_4_;
  auVar139._8_4_ = fVar252 * auVar119._8_4_;
  auVar139._12_4_ = fVar253 * auVar119._12_4_;
  auVar28._16_4_ = fVar255 * auVar119._16_4_;
  auVar28._0_16_ = auVar139;
  auVar28._20_4_ = fVar257 * auVar119._20_4_;
  auVar28._24_4_ = fVar259 * auVar119._24_4_;
  auVar28._28_4_ = auVar119._28_4_;
  auVar119 = vsubps_avx(auVar366,auVar120);
  auVar235._0_4_ = fVar234 * auVar119._0_4_;
  auVar235._4_4_ = fVar251 * auVar119._4_4_;
  auVar235._8_4_ = fVar252 * auVar119._8_4_;
  auVar235._12_4_ = fVar253 * auVar119._12_4_;
  auVar157._16_4_ = fVar255 * auVar119._16_4_;
  auVar157._0_16_ = auVar235;
  auVar157._20_4_ = fVar257 * auVar119._20_4_;
  auVar157._24_4_ = fVar259 * auVar119._24_4_;
  auVar157._28_4_ = auVar29._28_4_ + auVar27._28_4_;
  auVar119 = vsubps_avx(auVar375,auVar188);
  auVar108._0_4_ = fVar261 * auVar119._0_4_;
  auVar108._4_4_ = fVar271 * auVar119._4_4_;
  auVar108._8_4_ = fVar272 * auVar119._8_4_;
  auVar108._12_4_ = fVar273 * auVar119._12_4_;
  auVar27._16_4_ = fVar274 * auVar119._16_4_;
  auVar27._0_16_ = auVar108;
  auVar27._20_4_ = fVar275 * auVar119._20_4_;
  auVar27._24_4_ = fVar276 * auVar119._24_4_;
  auVar27._28_4_ = auVar119._28_4_;
  auVar119 = vsubps_avx(auVar389,auVar188);
  auVar179._0_4_ = fVar261 * auVar119._0_4_;
  auVar179._4_4_ = fVar271 * auVar119._4_4_;
  auVar179._8_4_ = fVar272 * auVar119._8_4_;
  auVar179._12_4_ = fVar273 * auVar119._12_4_;
  auVar377._16_4_ = fVar274 * auVar119._16_4_;
  auVar377._0_16_ = auVar179;
  auVar377._20_4_ = fVar275 * auVar119._20_4_;
  auVar377._24_4_ = fVar276 * auVar119._24_4_;
  auVar377._28_4_ = auVar119._28_4_;
  auVar302 = vpminsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar32 = vpminsd_avx(auVar279,auVar206);
  auVar335._16_16_ = auVar302;
  auVar335._0_16_ = auVar32;
  auVar302 = vpminsd_avx(auVar28._16_16_,auVar157._16_16_);
  auVar32 = vpminsd_avx(auVar139,auVar235);
  auVar376._16_16_ = auVar302;
  auVar376._0_16_ = auVar32;
  auVar119 = vmaxps_avx(auVar335,auVar376);
  auVar302 = vpminsd_avx(auVar27._16_16_,auVar377._16_16_);
  auVar32 = vpminsd_avx(auVar108,auVar179);
  auVar411._16_16_ = auVar302;
  auVar411._0_16_ = auVar32;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar435._4_4_ = uVar8;
  auVar435._0_4_ = uVar8;
  auVar435._8_4_ = uVar8;
  auVar435._12_4_ = uVar8;
  auVar435._16_4_ = uVar8;
  auVar435._20_4_ = uVar8;
  auVar435._24_4_ = uVar8;
  auVar435._28_4_ = uVar8;
  auVar164 = vmaxps_avx(auVar411,auVar435);
  auVar119 = vmaxps_avx(auVar119,auVar164);
  local_2a0._4_4_ = auVar119._4_4_ * 0.99999964;
  local_2a0._0_4_ = auVar119._0_4_ * 0.99999964;
  local_2a0._8_4_ = auVar119._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar119._12_4_ * 0.99999964;
  local_2a0._16_4_ = auVar119._16_4_ * 0.99999964;
  local_2a0._20_4_ = auVar119._20_4_ * 0.99999964;
  local_2a0._24_4_ = auVar119._24_4_ * 0.99999964;
  local_2a0._28_4_ = auVar119._28_4_;
  auVar302 = vpmaxsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar32 = vpmaxsd_avx(auVar279,auVar206);
  auVar222._16_16_ = auVar302;
  auVar222._0_16_ = auVar32;
  auVar302 = vpmaxsd_avx(auVar28._16_16_,auVar157._16_16_);
  auVar32 = vpmaxsd_avx(auVar139,auVar235);
  auVar155._16_16_ = auVar302;
  auVar155._0_16_ = auVar32;
  auVar119 = vminps_avx(auVar222,auVar155);
  auVar302 = vpmaxsd_avx(auVar27._16_16_,auVar377._16_16_);
  auVar32 = vpmaxsd_avx(auVar108,auVar179);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar189._4_4_ = uVar8;
  auVar189._0_4_ = uVar8;
  auVar189._8_4_ = uVar8;
  auVar189._12_4_ = uVar8;
  auVar189._16_4_ = uVar8;
  auVar189._20_4_ = uVar8;
  auVar189._24_4_ = uVar8;
  auVar189._28_4_ = uVar8;
  auVar121._16_16_ = auVar302;
  auVar121._0_16_ = auVar32;
  auVar164 = vminps_avx(auVar121,auVar189);
  auVar119 = vminps_avx(auVar119,auVar164);
  auVar35._4_4_ = auVar119._4_4_ * 1.0000004;
  auVar35._0_4_ = auVar119._0_4_ * 1.0000004;
  auVar35._8_4_ = auVar119._8_4_ * 1.0000004;
  auVar35._12_4_ = auVar119._12_4_ * 1.0000004;
  auVar35._16_4_ = auVar119._16_4_ * 1.0000004;
  auVar35._20_4_ = auVar119._20_4_ * 1.0000004;
  auVar35._24_4_ = auVar119._24_4_ * 1.0000004;
  auVar35._28_4_ = auVar119._28_4_;
  auVar119 = vcmpps_avx(local_2a0,auVar35,2);
  auVar302 = vpshufd_avx(ZEXT116((byte)PVar22),0);
  auVar156._16_16_ = auVar302;
  auVar156._0_16_ = auVar302;
  auVar164 = vcvtdq2ps_avx(auVar156);
  auVar164 = vcmpps_avx(_DAT_01faff40,auVar164,1);
  auVar119 = vandps_avx(auVar119,auVar164);
  uVar96 = vmovmskps_avx(auVar119);
  if (uVar96 == 0) {
    return;
  }
  uVar96 = uVar96 & 0xff;
  auVar122._16_16_ = mm_lookupmask_ps._240_16_;
  auVar122._0_16_ = mm_lookupmask_ps._240_16_;
  local_4e0 = vblendps_avx(auVar122,ZEXT832(0) << 0x20,0x80);
  local_a10 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_868 = prim;
LAB_011a4e8b:
  lVar103 = 0;
  if (uVar96 != 0) {
    for (; (uVar96 >> lVar103 & 1) == 0; lVar103 = lVar103 + 1) {
    }
  }
  uVar101 = *(uint *)(local_868 + 2);
  local_a08 = (ulong)*(uint *)(local_868 + lVar103 * 4 + 6);
  pGVar23 = (context->scene->geometries).items[uVar101].ptr;
  uVar98 = (ulong)*(uint *)(*(long *)&pGVar23->field_0x58 +
                           local_a08 *
                           pGVar23[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar205 = (pGVar23->time_range).lower;
  fVar205 = pGVar23->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar205) / ((pGVar23->time_range).upper - fVar205));
  auVar302 = vroundss_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar205),9);
  auVar302 = vminss_avx(auVar302,ZEXT416((uint)(pGVar23->fnumTimeSegments + -1.0)));
  auVar302 = vmaxss_avx(ZEXT816(0) << 0x20,auVar302);
  fVar205 = fVar205 - auVar302._0_4_;
  _Var24 = pGVar23[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar104 = (long)(int)auVar302._0_4_ * 0x38;
  lVar25 = *(long *)(_Var24 + lVar104);
  lVar105 = *(long *)(_Var24 + 0x10 + lVar104);
  auVar302 = vshufps_avx(ZEXT416((uint)(1.0 - fVar205)),ZEXT416((uint)(1.0 - fVar205)),0);
  pfVar1 = (float *)(lVar25 + lVar105 * uVar98);
  fVar203 = auVar302._0_4_;
  fVar173 = auVar302._4_4_;
  fVar229 = auVar302._8_4_;
  fVar178 = auVar302._12_4_;
  pfVar2 = (float *)(lVar25 + lVar105 * (uVar98 + 1));
  pfVar3 = (float *)(lVar25 + lVar105 * (uVar98 + 2));
  pfVar4 = (float *)(lVar25 + lVar105 * (uVar98 + 3));
  lVar25 = *(long *)(_Var24 + 0x38 + lVar104);
  lVar105 = *(long *)(_Var24 + 0x48 + lVar104);
  auVar302 = vshufps_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar205),0);
  pfVar5 = (float *)(lVar25 + uVar98 * lVar105);
  fVar230 = auVar302._0_4_;
  fVar231 = auVar302._4_4_;
  fVar232 = auVar302._8_4_;
  fVar234 = auVar302._12_4_;
  pfVar6 = (float *)(lVar25 + (uVar98 + 1) * lVar105);
  pfVar7 = (float *)(lVar25 + (uVar98 + 2) * lVar105);
  auVar236._0_4_ = fVar230 * *pfVar5 + fVar203 * *pfVar1;
  auVar236._4_4_ = fVar231 * pfVar5[1] + fVar173 * pfVar1[1];
  auVar236._8_4_ = fVar232 * pfVar5[2] + fVar229 * pfVar1[2];
  auVar236._12_4_ = fVar234 * pfVar5[3] + fVar178 * pfVar1[3];
  auVar302 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar32 = vinsertps_avx(auVar302,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar339 = ZEXT1664(auVar32);
  fVar205 = *(float *)(ray + k * 4 + 0x40);
  auVar385._4_4_ = fVar205;
  auVar385._0_4_ = fVar205;
  auVar385._8_4_ = fVar205;
  auVar385._12_4_ = fVar205;
  fStack_7d0 = fVar205;
  _local_7e0 = auVar385;
  fStack_7cc = fVar205;
  fStack_7c8 = fVar205;
  fStack_7c4 = fVar205;
  fVar137 = *(float *)(ray + k * 4 + 0x50);
  auVar409._4_4_ = fVar137;
  auVar409._0_4_ = fVar137;
  auVar409._8_4_ = fVar137;
  auVar409._12_4_ = fVar137;
  fStack_7f0 = fVar137;
  _local_800 = auVar409;
  fStack_7ec = fVar137;
  fStack_7e8 = fVar137;
  fStack_7e4 = fVar137;
  auVar263._0_4_ = fVar203 * *pfVar2 + fVar230 * *pfVar6;
  auVar263._4_4_ = fVar173 * pfVar2[1] + fVar231 * pfVar6[1];
  auVar263._8_4_ = fVar229 * pfVar2[2] + fVar232 * pfVar6[2];
  auVar263._12_4_ = fVar178 * pfVar2[3] + fVar234 * pfVar6[3];
  auVar302 = vunpcklps_avx(auVar385,auVar409);
  fVar228 = *(float *)(ray + k * 4 + 0x60);
  auVar434._4_4_ = fVar228;
  auVar434._0_4_ = fVar228;
  auVar434._8_4_ = fVar228;
  auVar434._12_4_ = fVar228;
  fStack_790 = fVar228;
  _local_7a0 = auVar434;
  fStack_78c = fVar228;
  fStack_788 = fVar228;
  uStack_784 = fVar228;
  _local_930 = vinsertps_avx(auVar302,auVar434,0x28);
  auVar109._0_4_ = (auVar236._0_4_ + auVar263._0_4_) * 0.5;
  auVar109._4_4_ = (auVar236._4_4_ + auVar263._4_4_) * 0.5;
  auVar109._8_4_ = (auVar236._8_4_ + auVar263._8_4_) * 0.5;
  auVar109._12_4_ = (auVar236._12_4_ + auVar263._12_4_) * 0.5;
  auVar302 = vsubps_avx(auVar109,auVar32);
  auVar302 = vdpps_avx(auVar302,_local_930,0x7f);
  local_940 = vdpps_avx(_local_930,_local_930,0x7f);
  auVar379 = ZEXT1664(local_940);
  auVar207._0_4_ = fVar203 * *pfVar3 + fVar230 * *pfVar7;
  auVar207._4_4_ = fVar173 * pfVar3[1] + fVar231 * pfVar7[1];
  auVar207._8_4_ = fVar229 * pfVar3[2] + fVar232 * pfVar7[2];
  auVar207._12_4_ = fVar178 * pfVar3[3] + fVar234 * pfVar7[3];
  auVar33 = vrcpss_avx(local_940,local_940);
  fVar170 = auVar302._0_4_ * auVar33._0_4_ * (2.0 - local_940._0_4_ * auVar33._0_4_);
  auVar33 = vshufps_avx(ZEXT416((uint)fVar170),ZEXT416((uint)fVar170),0);
  auVar280._0_4_ = auVar32._0_4_ + local_930._0_4_ * auVar33._0_4_;
  auVar280._4_4_ = auVar32._4_4_ + local_930._4_4_ * auVar33._4_4_;
  auVar280._8_4_ = auVar32._8_4_ + local_930._8_4_ * auVar33._8_4_;
  auVar280._12_4_ = auVar32._12_4_ + local_930._12_4_ * auVar33._12_4_;
  auVar302 = vblendps_avx(auVar280,_DAT_01f7aa10,8);
  auVar34 = vsubps_avx(auVar236,auVar302);
  auVar10 = vsubps_avx(auVar207,auVar302);
  pfVar1 = (float *)(lVar25 + lVar105 * (uVar98 + 3));
  auVar140._0_4_ = fVar203 * *pfVar4 + fVar230 * *pfVar1;
  auVar140._4_4_ = fVar173 * pfVar4[1] + fVar231 * pfVar1[1];
  auVar140._8_4_ = fVar229 * pfVar4[2] + fVar232 * pfVar1[2];
  auVar140._12_4_ = fVar178 * pfVar4[3] + fVar234 * pfVar1[3];
  auVar11 = vsubps_avx(auVar263,auVar302);
  auVar12 = vsubps_avx(auVar140,auVar302);
  auVar302 = vshufps_avx(auVar34,auVar34,0);
  register0x00001250 = auVar302;
  _local_3a0 = auVar302;
  auVar302 = vshufps_avx(auVar34,auVar34,0x55);
  register0x00001250 = auVar302;
  _local_1e0 = auVar302;
  auVar302 = vshufps_avx(auVar34,auVar34,0xaa);
  register0x00001250 = auVar302;
  _local_200 = auVar302;
  auVar302 = vshufps_avx(auVar34,auVar34,0xff);
  register0x00001290 = auVar302;
  _local_220 = auVar302;
  auVar302 = vshufps_avx(auVar11,auVar11,0);
  register0x00001290 = auVar302;
  _local_3c0 = auVar302;
  auVar302 = vshufps_avx(auVar11,auVar11,0x55);
  register0x00001290 = auVar302;
  _local_3e0 = auVar302;
  auVar302 = vshufps_avx(auVar11,auVar11,0xaa);
  register0x00001290 = auVar302;
  _local_400 = auVar302;
  auVar302 = vshufps_avx(auVar11,auVar11,0xff);
  register0x00001290 = auVar302;
  _local_420 = auVar302;
  auVar302 = vshufps_avx(auVar10,auVar10,0);
  local_4c0._16_16_ = auVar302;
  local_4c0._0_16_ = auVar302;
  auVar302 = vshufps_avx(auVar10,auVar10,0x55);
  register0x00001290 = auVar302;
  _local_440 = auVar302;
  auVar302 = vshufps_avx(auVar10,auVar10,0xaa);
  register0x00001290 = auVar302;
  _local_460 = auVar302;
  auVar302 = vshufps_avx(auVar10,auVar10,0xff);
  register0x00001290 = auVar302;
  _local_480 = auVar302;
  auVar302 = vshufps_avx(auVar12,auVar12,0);
  auVar32 = vshufps_avx(auVar12,auVar12,0x55);
  auVar141 = vshufps_avx(auVar12,auVar12,0xaa);
  register0x00001290 = auVar141;
  _local_4a0 = auVar141;
  auVar141 = vshufps_avx(auVar12,auVar12,0xff);
  register0x00001290 = auVar141;
  _local_240 = auVar141;
  auVar141 = ZEXT416((uint)(fVar205 * fVar205 + fVar137 * fVar137 + fVar228 * fVar228));
  auVar141 = vshufps_avx(auVar141,auVar141,0);
  local_260._16_16_ = auVar141;
  local_260._0_16_ = auVar141;
  fVar205 = *(float *)(ray + k * 4 + 0x30);
  local_890 = ZEXT416((uint)fVar170);
  auVar141 = vshufps_avx(ZEXT416((uint)(fVar205 - fVar170)),ZEXT416((uint)(fVar205 - fVar170)),0);
  local_280._16_16_ = auVar141;
  local_280._0_16_ = auVar141;
  local_730 = vpshufd_avx(ZEXT416(uVar101),0);
  local_740 = vpshufd_avx(ZEXT416(*(uint *)(local_868 + lVar103 * 4 + 6)),0);
  register0x00001210 = auVar33;
  _local_8e0 = auVar33;
  uVar106 = 0;
  local_c28 = 1;
  auVar123._8_4_ = 0x7fffffff;
  auVar123._0_8_ = 0x7fffffff7fffffff;
  auVar123._12_4_ = 0x7fffffff;
  auVar123._16_4_ = 0x7fffffff;
  auVar123._20_4_ = 0x7fffffff;
  auVar123._24_4_ = 0x7fffffff;
  auVar123._28_4_ = 0x7fffffff;
  local_500 = vandps_avx(local_260,auVar123);
  auVar33 = vsqrtss_avx(local_940,local_940);
  auVar141 = vsqrtss_avx(local_940,local_940);
  local_550 = ZEXT816(0x3f80000000000000);
  do {
    auVar246._8_4_ = 0x3f800000;
    auVar246._0_8_ = 0x3f8000003f800000;
    auVar246._12_4_ = 0x3f800000;
    auVar246._16_4_ = 0x3f800000;
    auVar246._20_4_ = 0x3f800000;
    auVar246._24_4_ = 0x3f800000;
    auVar246._28_4_ = 0x3f800000;
    auVar216 = vmovshdup_avx(local_550);
    auVar114 = vsubps_avx(auVar216,local_550);
    auVar216 = vshufps_avx(local_550,local_550,0);
    local_9a0._16_16_ = auVar216;
    local_9a0._0_16_ = auVar216;
    auVar180 = vshufps_avx(auVar114,auVar114,0);
    local_9c0._16_16_ = auVar180;
    local_9c0._0_16_ = auVar180;
    fVar136 = auVar180._0_4_;
    fVar168 = auVar180._4_4_;
    fVar169 = auVar180._8_4_;
    fVar171 = auVar180._12_4_;
    fVar107 = auVar216._0_4_;
    auVar223._0_4_ = fVar107 + fVar136 * 0.0;
    fVar133 = auVar216._4_4_;
    auVar223._4_4_ = fVar133 + fVar168 * 0.14285715;
    fVar134 = auVar216._8_4_;
    auVar223._8_4_ = fVar134 + fVar169 * 0.2857143;
    fVar135 = auVar216._12_4_;
    auVar223._12_4_ = fVar135 + fVar171 * 0.42857146;
    auVar223._16_4_ = fVar107 + fVar136 * 0.5714286;
    auVar223._20_4_ = fVar133 + fVar168 * 0.71428573;
    auVar223._24_4_ = fVar134 + fVar169 * 0.8571429;
    auVar223._28_4_ = fVar135 + fVar171;
    auVar119 = vsubps_avx(auVar246,auVar223);
    local_a00._4_4_ = auVar223._4_4_ * auVar223._4_4_;
    local_a00._0_4_ = auVar223._0_4_ * auVar223._0_4_;
    fStack_9f8 = auVar223._8_4_ * auVar223._8_4_;
    fStack_9f4 = auVar223._12_4_ * auVar223._12_4_;
    fStack_9f0 = auVar223._16_4_ * auVar223._16_4_;
    fStack_9ec = auVar223._20_4_ * auVar223._20_4_;
    fStack_9e8 = auVar223._24_4_ * auVar223._24_4_;
    fStack_9e4 = fVar135;
    fVar232 = auVar223._0_4_ * 3.0;
    fVar234 = auVar223._4_4_ * 3.0;
    fVar251 = auVar223._8_4_ * 3.0;
    fVar253 = auVar223._12_4_ * 3.0;
    fVar257 = auVar223._16_4_ * 3.0;
    fVar259 = auVar223._20_4_ * 3.0;
    fVar261 = auVar223._24_4_ * 3.0;
    fVar137 = auVar119._0_4_;
    auVar340._0_4_ = fVar137 * fVar137;
    fVar228 = auVar119._4_4_;
    auVar340._4_4_ = fVar228 * fVar228;
    fVar170 = auVar119._8_4_;
    auVar340._8_4_ = fVar170 * fVar170;
    fVar203 = auVar119._12_4_;
    auVar340._12_4_ = fVar203 * fVar203;
    fVar173 = auVar119._16_4_;
    auVar340._16_4_ = fVar173 * fVar173;
    fVar229 = auVar119._20_4_;
    auVar340._20_4_ = fVar229 * fVar229;
    fVar178 = auVar119._24_4_;
    auVar340._28_36_ = auVar339._28_36_;
    auVar340._24_4_ = fVar178 * fVar178;
    fVar230 = auVar119._28_4_;
    fVar252 = (auVar340._0_4_ * (fVar137 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar255 = (auVar340._4_4_ * (fVar228 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar271 = (auVar340._8_4_ * (fVar170 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar272 = (auVar340._12_4_ * (fVar203 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar273 = (auVar340._16_4_ * (fVar173 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar274 = (auVar340._20_4_ * (fVar229 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar275 = (auVar340._24_4_ * (fVar178 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar276 = -fVar137 * auVar223._0_4_ * auVar223._0_4_ * 0.5;
    fVar347 = -fVar228 * auVar223._4_4_ * auVar223._4_4_ * 0.5;
    fVar349 = -fVar170 * auVar223._8_4_ * auVar223._8_4_ * 0.5;
    fVar351 = -fVar203 * auVar223._12_4_ * auVar223._12_4_ * 0.5;
    fVar353 = -fVar173 * auVar223._16_4_ * auVar223._16_4_ * 0.5;
    fVar355 = -fVar229 * auVar223._20_4_ * auVar223._20_4_ * 0.5;
    fVar357 = -fVar178 * auVar223._24_4_ * auVar223._24_4_ * 0.5;
    fVar420 = auVar302._0_4_;
    fVar254 = auVar302._4_4_;
    fVar256 = auVar302._8_4_;
    fVar258 = auVar302._12_4_;
    fVar381 = auVar32._0_4_;
    fVar390 = auVar32._4_4_;
    fVar260 = auVar32._8_4_;
    fVar396 = auVar32._12_4_;
    fVar231 = local_4c0._28_4_;
    fVar380 = auVar379._28_4_ + fVar231;
    fVar406 = (auVar223._0_4_ * auVar223._0_4_ * (fVar232 + -5.0) + 2.0) * 0.5;
    fVar414 = (auVar223._4_4_ * auVar223._4_4_ * (fVar234 + -5.0) + 2.0) * 0.5;
    fVar417 = (auVar223._8_4_ * auVar223._8_4_ * (fVar251 + -5.0) + 2.0) * 0.5;
    fVar421 = (auVar223._12_4_ * auVar223._12_4_ * (fVar253 + -5.0) + 2.0) * 0.5;
    fVar424 = (auVar223._16_4_ * auVar223._16_4_ * (fVar257 + -5.0) + 2.0) * 0.5;
    fVar427 = (auVar223._20_4_ * auVar223._20_4_ * (fVar259 + -5.0) + 2.0) * 0.5;
    fVar430 = (auVar223._24_4_ * auVar223._24_4_ * (fVar261 + -5.0) + 2.0) * 0.5;
    fVar405 = -auVar223._28_4_;
    fVar382 = -auVar223._0_4_ * fVar137 * fVar137 * 0.5;
    fVar391 = -auVar223._4_4_ * fVar228 * fVar228 * 0.5;
    fVar394 = -auVar223._8_4_ * fVar170 * fVar170 * 0.5;
    fVar397 = -auVar223._12_4_ * fVar203 * fVar203 * 0.5;
    fVar399 = -auVar223._16_4_ * fVar173 * fVar173 * 0.5;
    fVar401 = -auVar223._20_4_ * fVar229 * fVar229 * 0.5;
    fVar403 = -auVar223._24_4_ * fVar178 * fVar178 * 0.5;
    local_900 = fVar382 * (float)local_3a0._0_4_ +
                fVar406 * (float)local_3c0._0_4_ + fVar420 * fVar276 + local_4c0._0_4_ * fVar252;
    fStack_8fc = fVar391 * (float)local_3a0._4_4_ +
                 fVar414 * (float)local_3c0._4_4_ + fVar254 * fVar347 + local_4c0._4_4_ * fVar255;
    fStack_8f8 = fVar394 * fStack_398 +
                 fVar417 * fStack_3b8 + fVar256 * fVar349 + local_4c0._8_4_ * fVar271;
    fStack_8f4 = fVar397 * fStack_394 +
                 fVar421 * fStack_3b4 + fVar258 * fVar351 + local_4c0._12_4_ * fVar272;
    fStack_8f0 = fVar399 * fStack_390 +
                 fVar424 * fStack_3b0 + fVar420 * fVar353 + local_4c0._16_4_ * fVar273;
    fStack_8ec = fVar401 * fStack_38c +
                 fVar427 * fStack_3ac + fVar254 * fVar355 + local_4c0._20_4_ * fVar274;
    fStack_8e8 = fVar403 * fStack_388 +
                 fVar430 * fStack_3a8 + fVar256 * fVar357 + local_4c0._24_4_ * fVar275;
    fStack_8e4 = fVar231 + 2.0 + -fVar230 + fVar258 + fVar231;
    fVar341 = (float)local_1e0._0_4_ * fVar382 +
              fVar406 * (float)local_3e0._0_4_ +
              fVar381 * fVar276 + fVar252 * (float)local_440._0_4_;
    fVar348 = (float)local_1e0._4_4_ * fVar391 +
              fVar414 * (float)local_3e0._4_4_ +
              fVar390 * fVar347 + fVar255 * (float)local_440._4_4_;
    fVar350 = fStack_1d8 * fVar394 + fVar417 * fStack_3d8 + fVar260 * fVar349 + fVar271 * fStack_438
    ;
    fVar352 = fStack_1d4 * fVar397 + fVar421 * fStack_3d4 + fVar396 * fVar351 + fVar272 * fStack_434
    ;
    fVar354 = fStack_1d0 * fVar399 + fVar424 * fStack_3d0 + fVar381 * fVar353 + fVar273 * fStack_430
    ;
    fVar356 = fStack_1cc * fVar401 + fVar427 * fStack_3cc + fVar390 * fVar355 + fVar274 * fStack_42c
    ;
    fVar358 = fStack_1c8 * fVar403 + fVar430 * fStack_3c8 + fVar260 * fVar357 + fVar275 * fStack_428
    ;
    fVar360 = fStack_8e4 + fVar258 + fVar231 + fVar380;
    fVar177 = (float)local_200._0_4_ * fVar382 +
              fVar406 * (float)local_400._0_4_ +
              fVar276 * (float)local_4a0._0_4_ + fVar252 * (float)local_460._0_4_;
    fVar197 = (float)local_200._4_4_ * fVar391 +
              fVar414 * (float)local_400._4_4_ +
              fVar347 * (float)local_4a0._4_4_ + fVar255 * (float)local_460._4_4_;
    fVar198 = fStack_1f8 * fVar394 +
              fVar417 * fStack_3f8 + fVar349 * fStack_498 + fVar271 * fStack_458;
    fVar199 = fStack_1f4 * fVar397 +
              fVar421 * fStack_3f4 + fVar351 * fStack_494 + fVar272 * fStack_454;
    fVar200 = fStack_1f0 * fVar399 +
              fVar424 * fStack_3f0 + fVar353 * fStack_490 + fVar273 * fStack_450;
    fVar201 = fStack_1ec * fVar401 +
              fVar427 * fStack_3ec + fVar355 * fStack_48c + fVar274 * fStack_44c;
    fVar202 = fStack_1e8 * fVar403 +
              fVar430 * fStack_3e8 + fVar357 * fStack_488 + fVar275 * fStack_448;
    fVar204 = fVar360 + fVar380 + fVar396 + fVar231;
    local_9e0._0_4_ =
         (float)local_220._0_4_ * fVar382 +
         fVar406 * (float)local_420._0_4_ +
         fVar276 * (float)local_240._0_4_ + fVar252 * (float)local_480._0_4_;
    local_9e0._4_4_ =
         (float)local_220._4_4_ * fVar391 +
         fVar414 * (float)local_420._4_4_ +
         fVar347 * (float)local_240._4_4_ + fVar255 * (float)local_480._4_4_;
    local_9e0._8_4_ =
         fStack_218 * fVar394 + fVar417 * fStack_418 + fVar349 * fStack_238 + fVar271 * fStack_478;
    local_9e0._12_4_ =
         fStack_214 * fVar397 + fVar421 * fStack_414 + fVar351 * fStack_234 + fVar272 * fStack_474;
    local_9e0._16_4_ =
         fStack_210 * fVar399 + fVar424 * fStack_410 + fVar353 * fStack_230 + fVar273 * fStack_470;
    local_9e0._20_4_ =
         fStack_20c * fVar401 + fVar427 * fStack_40c + fVar355 * fStack_22c + fVar274 * fStack_46c;
    local_9e0._24_4_ =
         fStack_208 * fVar403 + fVar430 * fStack_408 + fVar357 * fStack_228 + fVar275 * fStack_468;
    local_9e0._28_4_ = fVar360 + fVar231 + 2.0 + -fVar230 + -3.0;
    fVar394 = auVar223._28_4_ + auVar223._28_4_;
    auVar36._4_4_ = (fVar228 + fVar228) * auVar223._4_4_;
    auVar36._0_4_ = (fVar137 + fVar137) * auVar223._0_4_;
    auVar36._8_4_ = (fVar170 + fVar170) * auVar223._8_4_;
    auVar36._12_4_ = (fVar203 + fVar203) * auVar223._12_4_;
    auVar36._16_4_ = (fVar173 + fVar173) * auVar223._16_4_;
    auVar36._20_4_ = (fVar229 + fVar229) * auVar223._20_4_;
    auVar36._24_4_ = (fVar178 + fVar178) * auVar223._24_4_;
    auVar36._28_4_ = fVar394;
    auVar119 = vsubps_avx(auVar36,auVar340._0_32_);
    auVar37._4_4_ = (fVar228 + fVar228) * (fVar234 + 2.0);
    auVar37._0_4_ = (fVar137 + fVar137) * (fVar232 + 2.0);
    auVar37._8_4_ = (fVar170 + fVar170) * (fVar251 + 2.0);
    auVar37._12_4_ = (fVar203 + fVar203) * (fVar253 + 2.0);
    auVar37._16_4_ = (fVar173 + fVar173) * (fVar257 + 2.0);
    auVar37._20_4_ = (fVar229 + fVar229) * (fVar259 + 2.0);
    auVar37._24_4_ = (fVar178 + fVar178) * (fVar261 + 2.0);
    auVar37._28_4_ = 0x40400000;
    auVar38._4_4_ = fVar228 * fVar228 * 3.0;
    auVar38._0_4_ = fVar137 * fVar137 * 3.0;
    auVar38._8_4_ = fVar170 * fVar170 * 3.0;
    auVar38._12_4_ = fVar203 * fVar203 * 3.0;
    auVar38._16_4_ = fVar173 * fVar173 * 3.0;
    auVar38._20_4_ = fVar229 * fVar229 * 3.0;
    auVar38._24_4_ = fVar178 * fVar178 * 3.0;
    auVar38._28_4_ = fVar230;
    auVar164 = vsubps_avx(auVar37,auVar38);
    auVar27 = vsubps_avx(_local_a00,auVar36);
    fVar349 = auVar119._0_4_ * 0.5;
    fVar351 = auVar119._4_4_ * 0.5;
    fVar353 = auVar119._8_4_ * 0.5;
    fVar355 = auVar119._12_4_ * 0.5;
    fVar357 = auVar119._16_4_ * 0.5;
    fVar380 = auVar119._20_4_ * 0.5;
    fVar382 = auVar119._24_4_ * 0.5;
    fVar252 = (auVar223._0_4_ * fVar232 + (auVar223._0_4_ + auVar223._0_4_) * (fVar232 + -5.0)) *
              0.5;
    fVar255 = (auVar223._4_4_ * fVar234 + (auVar223._4_4_ + auVar223._4_4_) * (fVar234 + -5.0)) *
              0.5;
    fVar273 = (auVar223._8_4_ * fVar251 + (auVar223._8_4_ + auVar223._8_4_) * (fVar251 + -5.0)) *
              0.5;
    fVar274 = (auVar223._12_4_ * fVar253 + (auVar223._12_4_ + auVar223._12_4_) * (fVar253 + -5.0)) *
              0.5;
    fVar275 = (auVar223._16_4_ * fVar257 + (auVar223._16_4_ + auVar223._16_4_) * (fVar257 + -5.0)) *
              0.5;
    fVar276 = (auVar223._20_4_ * fVar259 + (auVar223._20_4_ + auVar223._20_4_) * (fVar259 + -5.0)) *
              0.5;
    fVar347 = (auVar223._24_4_ * fVar261 + (auVar223._24_4_ + auVar223._24_4_) * (fVar261 + -5.0)) *
              0.5;
    fVar137 = auVar164._0_4_ * 0.5;
    fVar228 = auVar164._4_4_ * 0.5;
    fVar170 = auVar164._8_4_ * 0.5;
    fVar203 = auVar164._12_4_ * 0.5;
    fVar173 = auVar164._16_4_ * 0.5;
    fVar231 = auVar164._20_4_ * 0.5;
    fVar232 = auVar164._24_4_ * 0.5;
    fVar178 = auVar27._0_4_ * 0.5;
    fVar234 = auVar27._4_4_ * 0.5;
    fVar251 = auVar27._8_4_ * 0.5;
    fVar257 = auVar27._12_4_ * 0.5;
    fVar259 = auVar27._16_4_ * 0.5;
    fVar261 = auVar27._20_4_ * 0.5;
    fVar271 = auVar27._24_4_ * 0.5;
    fVar329 = fVar230 + fVar230 + auVar119._28_4_ + fVar230 + fVar230 + -4.0;
    auVar216 = vpermilps_avx(ZEXT416((uint)(auVar114._0_4_ * 0.04761905)),0);
    fVar229 = auVar216._0_4_;
    fVar301 = fVar229 * (fVar349 * (float)local_3a0._0_4_ +
                        fVar252 * (float)local_3c0._0_4_ +
                        fVar137 * local_4c0._0_4_ + fVar420 * fVar178);
    fVar230 = auVar216._4_4_;
    fVar318 = fVar230 * (fVar351 * (float)local_3a0._4_4_ +
                        fVar255 * (float)local_3c0._4_4_ +
                        fVar228 * local_4c0._4_4_ + fVar254 * fVar234);
    local_a00._4_4_ = fVar318;
    local_a00._0_4_ = fVar301;
    fVar253 = auVar216._8_4_;
    fVar319 = fVar253 * (fVar353 * fStack_398 +
                        fVar273 * fStack_3b8 + fVar170 * local_4c0._8_4_ + fVar256 * fVar251);
    fStack_9f8 = fVar319;
    fVar272 = auVar216._12_4_;
    fVar321 = fVar272 * (fVar355 * fStack_394 +
                        fVar274 * fStack_3b4 + fVar203 * local_4c0._12_4_ + fVar258 * fVar257);
    fStack_9f4 = fVar321;
    fVar323 = fVar229 * (fVar357 * fStack_390 +
                        fVar275 * fStack_3b0 + fVar173 * local_4c0._16_4_ + fVar420 * fVar259);
    fStack_9f0 = fVar323;
    fVar325 = fVar230 * (fVar380 * fStack_38c +
                        fVar276 * fStack_3ac + fVar231 * local_4c0._20_4_ + fVar254 * fVar261);
    fStack_9ec = fVar325;
    fVar327 = fVar253 * (fVar382 * fStack_388 +
                        fVar347 * fStack_3a8 + fVar232 * local_4c0._24_4_ + fVar256 * fVar271);
    fStack_9e8 = fVar327;
    fStack_9e4 = fVar329;
    fVar383 = fVar229 * ((float)local_1e0._0_4_ * fVar349 +
                        fVar252 * (float)local_3e0._0_4_ +
                        fVar137 * (float)local_440._0_4_ + fVar178 * fVar381);
    fVar392 = fVar230 * ((float)local_1e0._4_4_ * fVar351 +
                        fVar255 * (float)local_3e0._4_4_ +
                        fVar228 * (float)local_440._4_4_ + fVar234 * fVar390);
    auVar39._4_4_ = fVar392;
    auVar39._0_4_ = fVar383;
    fVar395 = fVar253 * (fStack_1d8 * fVar353 +
                        fVar273 * fStack_3d8 + fVar170 * fStack_438 + fVar251 * fVar260);
    auVar39._8_4_ = fVar395;
    fVar398 = fVar272 * (fStack_1d4 * fVar355 +
                        fVar274 * fStack_3d4 + fVar203 * fStack_434 + fVar257 * fVar396);
    auVar39._12_4_ = fVar398;
    fVar400 = fVar229 * (fStack_1d0 * fVar357 +
                        fVar275 * fStack_3d0 + fVar173 * fStack_430 + fVar259 * fVar381);
    auVar39._16_4_ = fVar400;
    fVar402 = fVar230 * (fStack_1cc * fVar380 +
                        fVar276 * fStack_3cc + fVar231 * fStack_42c + fVar261 * fVar390);
    auVar39._20_4_ = fVar402;
    fVar404 = fVar253 * (fStack_1c8 * fVar382 +
                        fVar347 * fStack_3c8 + fVar232 * fStack_428 + fVar271 * fVar260);
    auVar39._24_4_ = fVar404;
    auVar39._28_4_ = fVar405;
    fVar407 = fVar229 * ((float)local_200._0_4_ * fVar349 +
                        fVar137 * (float)local_460._0_4_ + fVar178 * (float)local_4a0._0_4_ +
                        fVar252 * (float)local_400._0_4_);
    fVar415 = fVar230 * ((float)local_200._4_4_ * fVar351 +
                        fVar228 * (float)local_460._4_4_ + fVar234 * (float)local_4a0._4_4_ +
                        fVar255 * (float)local_400._4_4_);
    auVar40._4_4_ = fVar415;
    auVar40._0_4_ = fVar407;
    fVar418 = fVar253 * (fStack_1f8 * fVar353 +
                        fVar170 * fStack_458 + fVar251 * fStack_498 + fVar273 * fStack_3f8);
    auVar40._8_4_ = fVar418;
    fVar422 = fVar272 * (fStack_1f4 * fVar355 +
                        fVar203 * fStack_454 + fVar257 * fStack_494 + fVar274 * fStack_3f4);
    auVar40._12_4_ = fVar422;
    fVar425 = fVar229 * (fStack_1f0 * fVar357 +
                        fVar173 * fStack_450 + fVar259 * fStack_490 + fVar275 * fStack_3f0);
    auVar40._16_4_ = fVar425;
    fVar428 = fVar230 * (fStack_1ec * fVar380 +
                        fVar231 * fStack_44c + fVar261 * fStack_48c + fVar276 * fStack_3ec);
    auVar40._20_4_ = fVar428;
    fVar431 = fVar253 * (fStack_1e8 * fVar382 +
                        fVar232 * fStack_448 + fVar271 * fStack_488 + fVar347 * fStack_3e8);
    auVar40._24_4_ = fVar431;
    auVar40._28_4_ = uStack_1c4;
    fVar178 = fVar229 * ((float)local_220._0_4_ * fVar349 +
                        fVar252 * (float)local_420._0_4_ +
                        fVar137 * (float)local_480._0_4_ + (float)local_240._0_4_ * fVar178);
    fVar252 = fVar230 * ((float)local_220._4_4_ * fVar351 +
                        fVar255 * (float)local_420._4_4_ +
                        fVar228 * (float)local_480._4_4_ + (float)local_240._4_4_ * fVar234);
    auVar41._4_4_ = fVar252;
    auVar41._0_4_ = fVar178;
    fVar255 = fVar253 * (fStack_218 * fVar353 +
                        fVar273 * fStack_418 + fVar170 * fStack_478 + fStack_238 * fVar251);
    auVar41._8_4_ = fVar255;
    fVar273 = fVar272 * (fStack_214 * fVar355 +
                        fVar274 * fStack_414 + fVar203 * fStack_474 + fStack_234 * fVar257);
    auVar41._12_4_ = fVar273;
    fVar229 = fVar229 * (fStack_210 * fVar357 +
                        fVar275 * fStack_410 + fVar173 * fStack_470 + fStack_230 * fVar259);
    auVar41._16_4_ = fVar229;
    fVar230 = fVar230 * (fStack_20c * fVar380 +
                        fVar276 * fStack_40c + fVar231 * fStack_46c + fStack_22c * fVar261);
    auVar41._20_4_ = fVar230;
    fVar253 = fVar253 * (fStack_208 * fVar382 +
                        fVar347 * fStack_408 + fVar232 * fStack_468 + fStack_228 * fVar271);
    auVar41._24_4_ = fVar253;
    auVar41._28_4_ = fVar272;
    auVar91._4_4_ = fVar348;
    auVar91._0_4_ = fVar341;
    auVar91._8_4_ = fVar350;
    auVar91._12_4_ = fVar352;
    auVar91._16_4_ = fVar354;
    auVar91._20_4_ = fVar356;
    auVar91._24_4_ = fVar358;
    auVar91._28_4_ = fVar360;
    auVar119 = vperm2f128_avx(auVar91,auVar91,1);
    auVar119 = vshufps_avx(auVar119,auVar91,0x30);
    _local_a40 = vshufps_avx(auVar91,auVar119,0x29);
    auVar93._4_4_ = fVar197;
    auVar93._0_4_ = fVar177;
    auVar93._8_4_ = fVar198;
    auVar93._12_4_ = fVar199;
    auVar93._16_4_ = fVar200;
    auVar93._20_4_ = fVar201;
    auVar93._24_4_ = fVar202;
    auVar93._28_4_ = fVar204;
    auVar119 = vperm2f128_avx(auVar93,auVar93,1);
    auVar119 = vshufps_avx(auVar119,auVar93,0x30);
    auVar28 = vshufps_avx(auVar93,auVar119,0x29);
    auVar164 = vsubps_avx(local_9e0,auVar41);
    auVar119 = vperm2f128_avx(auVar164,auVar164,1);
    auVar119 = vshufps_avx(auVar119,auVar164,0x30);
    local_760 = vshufps_avx(auVar164,auVar119,0x29);
    local_5e0 = vsubps_avx(_local_a40,auVar91);
    local_5c0 = vsubps_avx(auVar28,auVar93);
    fVar228 = local_5e0._0_4_;
    fVar231 = local_5e0._4_4_;
    auVar42._4_4_ = fVar415 * fVar231;
    auVar42._0_4_ = fVar407 * fVar228;
    fVar257 = local_5e0._8_4_;
    auVar42._8_4_ = fVar418 * fVar257;
    fVar275 = local_5e0._12_4_;
    auVar42._12_4_ = fVar422 * fVar275;
    fVar357 = local_5e0._16_4_;
    auVar42._16_4_ = fVar425 * fVar357;
    fVar381 = local_5e0._20_4_;
    auVar42._20_4_ = fVar428 * fVar381;
    fVar401 = local_5e0._24_4_;
    auVar42._24_4_ = fVar431 * fVar401;
    auVar42._28_4_ = auVar164._28_4_;
    fVar170 = local_5c0._0_4_;
    fVar232 = local_5c0._4_4_;
    auVar43._4_4_ = fVar392 * fVar232;
    auVar43._0_4_ = fVar383 * fVar170;
    fVar259 = local_5c0._8_4_;
    auVar43._8_4_ = fVar395 * fVar259;
    fVar276 = local_5c0._12_4_;
    auVar43._12_4_ = fVar398 * fVar276;
    fVar380 = local_5c0._16_4_;
    auVar43._16_4_ = fVar400 * fVar380;
    fVar390 = local_5c0._20_4_;
    auVar43._20_4_ = fVar402 * fVar390;
    fVar403 = local_5c0._24_4_;
    auVar43._24_4_ = fVar404 * fVar403;
    auVar43._28_4_ = auVar119._28_4_;
    auVar157 = vsubps_avx(auVar43,auVar42);
    auVar94._4_4_ = fStack_8fc;
    auVar94._0_4_ = local_900;
    auVar94._8_4_ = fStack_8f8;
    auVar94._12_4_ = fStack_8f4;
    auVar94._16_4_ = fStack_8f0;
    auVar94._20_4_ = fStack_8ec;
    auVar94._24_4_ = fStack_8e8;
    auVar94._28_4_ = fStack_8e4;
    auVar119 = vperm2f128_avx(auVar94,auVar94,1);
    auVar119 = vshufps_avx(auVar119,auVar94,0x30);
    auVar29 = vshufps_avx(auVar94,auVar119,0x29);
    local_600 = vsubps_avx(auVar29,auVar94);
    auVar44._4_4_ = fVar232 * fVar318;
    auVar44._0_4_ = fVar170 * fVar301;
    auVar44._8_4_ = fVar259 * fVar319;
    auVar44._12_4_ = fVar276 * fVar321;
    auVar44._16_4_ = fVar380 * fVar323;
    auVar44._20_4_ = fVar390 * fVar325;
    auVar44._24_4_ = fVar403 * fVar327;
    auVar44._28_4_ = auVar29._28_4_;
    fVar203 = local_600._0_4_;
    fVar234 = local_600._4_4_;
    auVar45._4_4_ = fVar415 * fVar234;
    auVar45._0_4_ = fVar407 * fVar203;
    fVar261 = local_600._8_4_;
    auVar45._8_4_ = fVar418 * fVar261;
    fVar347 = local_600._12_4_;
    auVar45._12_4_ = fVar422 * fVar347;
    fVar382 = local_600._16_4_;
    auVar45._16_4_ = fVar425 * fVar382;
    fVar391 = local_600._20_4_;
    auVar45._20_4_ = fVar428 * fVar391;
    fVar406 = local_600._24_4_;
    auVar45._24_4_ = fVar431 * fVar406;
    auVar45._28_4_ = auVar28._28_4_;
    auVar268 = vsubps_avx(auVar45,auVar44);
    auVar46._4_4_ = fVar392 * fVar234;
    auVar46._0_4_ = fVar383 * fVar203;
    auVar46._8_4_ = fVar395 * fVar261;
    auVar46._12_4_ = fVar398 * fVar347;
    auVar46._16_4_ = fVar400 * fVar382;
    auVar46._20_4_ = fVar402 * fVar391;
    auVar46._24_4_ = fVar404 * fVar406;
    auVar46._28_4_ = auVar28._28_4_;
    auVar47._4_4_ = fVar318 * fVar231;
    auVar47._0_4_ = fVar301 * fVar228;
    auVar47._8_4_ = fVar319 * fVar257;
    auVar47._12_4_ = fVar321 * fVar275;
    auVar47._16_4_ = fVar323 * fVar357;
    auVar47._20_4_ = fVar325 * fVar381;
    auVar47._24_4_ = fVar327 * fVar401;
    auVar47._28_4_ = fVar394;
    auVar30 = vsubps_avx(auVar47,auVar46);
    fVar137 = auVar30._28_4_;
    fVar274 = auVar268._28_4_ + fVar137;
    auVar224._0_4_ = fVar203 * fVar203 + fVar228 * fVar228 + fVar170 * fVar170;
    auVar224._4_4_ = fVar234 * fVar234 + fVar231 * fVar231 + fVar232 * fVar232;
    auVar224._8_4_ = fVar261 * fVar261 + fVar257 * fVar257 + fVar259 * fVar259;
    auVar224._12_4_ = fVar347 * fVar347 + fVar275 * fVar275 + fVar276 * fVar276;
    auVar224._16_4_ = fVar382 * fVar382 + fVar357 * fVar357 + fVar380 * fVar380;
    auVar224._20_4_ = fVar391 * fVar391 + fVar381 * fVar381 + fVar390 * fVar390;
    auVar224._24_4_ = fVar406 * fVar406 + fVar401 * fVar401 + fVar403 * fVar403;
    auVar224._28_4_ = fVar137 + fVar137 + fVar274;
    auVar119 = vrcpps_avx(auVar224);
    fVar351 = auVar119._0_4_;
    fVar353 = auVar119._4_4_;
    auVar48._4_4_ = fVar353 * auVar224._4_4_;
    auVar48._0_4_ = fVar351 * auVar224._0_4_;
    fVar355 = auVar119._8_4_;
    auVar48._8_4_ = fVar355 * auVar224._8_4_;
    fVar254 = auVar119._12_4_;
    auVar48._12_4_ = fVar254 * auVar224._12_4_;
    fVar256 = auVar119._16_4_;
    auVar48._16_4_ = fVar256 * auVar224._16_4_;
    fVar258 = auVar119._20_4_;
    auVar48._20_4_ = fVar258 * auVar224._20_4_;
    fVar260 = auVar119._24_4_;
    auVar48._24_4_ = fVar260 * auVar224._24_4_;
    auVar48._28_4_ = fVar394;
    auVar436._8_4_ = 0x3f800000;
    auVar436._0_8_ = 0x3f8000003f800000;
    auVar436._12_4_ = 0x3f800000;
    auVar436._16_4_ = 0x3f800000;
    auVar436._20_4_ = 0x3f800000;
    auVar436._24_4_ = 0x3f800000;
    auVar436._28_4_ = 0x3f800000;
    auVar31 = vsubps_avx(auVar436,auVar48);
    fVar351 = auVar31._0_4_ * fVar351 + fVar351;
    fVar353 = auVar31._4_4_ * fVar353 + fVar353;
    fVar355 = auVar31._8_4_ * fVar355 + fVar355;
    fVar254 = auVar31._12_4_ * fVar254 + fVar254;
    fVar256 = auVar31._16_4_ * fVar256 + fVar256;
    fVar258 = auVar31._20_4_ * fVar258 + fVar258;
    fVar260 = auVar31._24_4_ * fVar260 + fVar260;
    auVar164 = vperm2f128_avx(auVar39,auVar39,1);
    auVar164 = vshufps_avx(auVar164,auVar39,0x30);
    local_960 = vshufps_avx(auVar39,auVar164,0x29);
    auVar164 = vperm2f128_avx(auVar40,auVar40,1);
    auVar164 = vshufps_avx(auVar164,auVar40,0x30);
    auVar27 = vshufps_avx(auVar40,auVar164,0x29);
    fVar408 = auVar27._0_4_;
    fVar416 = auVar27._4_4_;
    auVar49._4_4_ = fVar416 * fVar231;
    auVar49._0_4_ = fVar408 * fVar228;
    fVar419 = auVar27._8_4_;
    auVar49._8_4_ = fVar419 * fVar257;
    fVar423 = auVar27._12_4_;
    auVar49._12_4_ = fVar423 * fVar275;
    fVar426 = auVar27._16_4_;
    auVar49._16_4_ = fVar426 * fVar357;
    fVar429 = auVar27._20_4_;
    auVar49._20_4_ = fVar429 * fVar381;
    fVar432 = auVar27._24_4_;
    auVar49._24_4_ = fVar432 * fVar401;
    auVar49._28_4_ = auVar164._28_4_;
    fVar433 = local_960._0_4_;
    fVar440 = local_960._4_4_;
    auVar50._4_4_ = fVar440 * fVar232;
    auVar50._0_4_ = fVar433 * fVar170;
    fVar441 = local_960._8_4_;
    auVar50._8_4_ = fVar441 * fVar259;
    fVar442 = local_960._12_4_;
    auVar50._12_4_ = fVar442 * fVar276;
    fVar443 = local_960._16_4_;
    auVar50._16_4_ = fVar443 * fVar380;
    fVar444 = local_960._20_4_;
    auVar50._20_4_ = fVar444 * fVar390;
    fVar445 = local_960._24_4_;
    auVar50._24_4_ = fVar445 * fVar403;
    auVar50._28_4_ = fVar405;
    auVar377 = vsubps_avx(auVar50,auVar49);
    auVar164 = vperm2f128_avx(_local_a00,_local_a00,1);
    auVar164 = vshufps_avx(auVar164,_local_a00,0x30);
    local_980 = vshufps_avx(_local_a00,auVar164,0x29);
    fVar173 = local_980._0_4_;
    fVar251 = local_980._4_4_;
    auVar51._4_4_ = fVar232 * fVar251;
    auVar51._0_4_ = fVar170 * fVar173;
    fVar271 = local_980._8_4_;
    auVar51._8_4_ = fVar259 * fVar271;
    fVar349 = local_980._12_4_;
    auVar51._12_4_ = fVar276 * fVar349;
    fVar420 = local_980._16_4_;
    auVar51._16_4_ = fVar380 * fVar420;
    fVar394 = local_980._20_4_;
    auVar51._20_4_ = fVar390 * fVar394;
    fVar414 = local_980._24_4_;
    auVar51._24_4_ = fVar403 * fVar414;
    auVar51._28_4_ = auVar164._28_4_;
    auVar52._4_4_ = fVar416 * fVar234;
    auVar52._0_4_ = fVar408 * fVar203;
    auVar52._8_4_ = fVar419 * fVar261;
    auVar52._12_4_ = fVar423 * fVar347;
    auVar52._16_4_ = fVar426 * fVar382;
    auVar52._20_4_ = fVar429 * fVar391;
    uVar100 = auVar27._28_4_;
    auVar52._24_4_ = fVar432 * fVar406;
    auVar52._28_4_ = uVar100;
    auVar164 = vsubps_avx(auVar52,auVar51);
    auVar53._4_4_ = fVar440 * fVar234;
    auVar53._0_4_ = fVar433 * fVar203;
    auVar53._8_4_ = fVar441 * fVar261;
    auVar53._12_4_ = fVar442 * fVar347;
    auVar53._16_4_ = fVar443 * fVar382;
    auVar53._20_4_ = fVar444 * fVar391;
    auVar53._24_4_ = fVar445 * fVar406;
    auVar53._28_4_ = uVar100;
    auVar54._4_4_ = fVar251 * fVar231;
    auVar54._0_4_ = fVar173 * fVar228;
    auVar54._8_4_ = fVar271 * fVar257;
    auVar54._12_4_ = fVar349 * fVar275;
    auVar54._16_4_ = fVar420 * fVar357;
    auVar54._20_4_ = fVar394 * fVar381;
    fVar137 = local_960._28_4_;
    auVar54._24_4_ = fVar414 * fVar401;
    auVar54._28_4_ = fVar137;
    auVar35 = vsubps_avx(auVar54,auVar53);
    auVar55._4_4_ =
         (auVar157._4_4_ * auVar157._4_4_ +
         auVar268._4_4_ * auVar268._4_4_ + auVar30._4_4_ * auVar30._4_4_) * fVar353;
    auVar55._0_4_ =
         (auVar157._0_4_ * auVar157._0_4_ +
         auVar268._0_4_ * auVar268._0_4_ + auVar30._0_4_ * auVar30._0_4_) * fVar351;
    auVar55._8_4_ =
         (auVar157._8_4_ * auVar157._8_4_ +
         auVar268._8_4_ * auVar268._8_4_ + auVar30._8_4_ * auVar30._8_4_) * fVar355;
    auVar55._12_4_ =
         (auVar157._12_4_ * auVar157._12_4_ +
         auVar268._12_4_ * auVar268._12_4_ + auVar30._12_4_ * auVar30._12_4_) * fVar254;
    auVar55._16_4_ =
         (auVar157._16_4_ * auVar157._16_4_ +
         auVar268._16_4_ * auVar268._16_4_ + auVar30._16_4_ * auVar30._16_4_) * fVar256;
    auVar55._20_4_ =
         (auVar157._20_4_ * auVar157._20_4_ +
         auVar268._20_4_ * auVar268._20_4_ + auVar30._20_4_ * auVar30._20_4_) * fVar258;
    auVar55._24_4_ =
         (auVar157._24_4_ * auVar157._24_4_ +
         auVar268._24_4_ * auVar268._24_4_ + auVar30._24_4_ * auVar30._24_4_) * fVar260;
    auVar55._28_4_ = auVar157._28_4_ + fVar274;
    auVar56._4_4_ =
         (auVar377._4_4_ * auVar377._4_4_ +
         auVar164._4_4_ * auVar164._4_4_ + auVar35._4_4_ * auVar35._4_4_) * fVar353;
    auVar56._0_4_ =
         (auVar377._0_4_ * auVar377._0_4_ +
         auVar164._0_4_ * auVar164._0_4_ + auVar35._0_4_ * auVar35._0_4_) * fVar351;
    auVar56._8_4_ =
         (auVar377._8_4_ * auVar377._8_4_ +
         auVar164._8_4_ * auVar164._8_4_ + auVar35._8_4_ * auVar35._8_4_) * fVar355;
    auVar56._12_4_ =
         (auVar377._12_4_ * auVar377._12_4_ +
         auVar164._12_4_ * auVar164._12_4_ + auVar35._12_4_ * auVar35._12_4_) * fVar254;
    auVar56._16_4_ =
         (auVar377._16_4_ * auVar377._16_4_ +
         auVar164._16_4_ * auVar164._16_4_ + auVar35._16_4_ * auVar35._16_4_) * fVar256;
    auVar56._20_4_ =
         (auVar377._20_4_ * auVar377._20_4_ +
         auVar164._20_4_ * auVar164._20_4_ + auVar35._20_4_ * auVar35._20_4_) * fVar258;
    auVar56._24_4_ =
         (auVar377._24_4_ * auVar377._24_4_ +
         auVar164._24_4_ * auVar164._24_4_ + auVar35._24_4_ * auVar35._24_4_) * fVar260;
    auVar56._28_4_ = auVar31._28_4_ + auVar119._28_4_;
    auVar119 = vmaxps_avx(auVar55,auVar56);
    auVar164 = vperm2f128_avx(local_9e0,local_9e0,1);
    auVar164 = vshufps_avx(auVar164,local_9e0,0x30);
    local_780 = vshufps_avx(local_9e0,auVar164,0x29);
    auVar124._0_4_ = (float)local_9e0._0_4_ + fVar178;
    auVar124._4_4_ = local_9e0._4_4_ + fVar252;
    auVar124._8_4_ = local_9e0._8_4_ + fVar255;
    auVar124._12_4_ = local_9e0._12_4_ + fVar273;
    auVar124._16_4_ = local_9e0._16_4_ + fVar229;
    auVar124._20_4_ = local_9e0._20_4_ + fVar230;
    auVar124._24_4_ = local_9e0._24_4_ + fVar253;
    auVar124._28_4_ = local_9e0._28_4_ + fVar272;
    auVar164 = vmaxps_avx(local_9e0,auVar124);
    auVar27 = vmaxps_avx(local_760,local_780);
    auVar164 = vmaxps_avx(auVar164,auVar27);
    auVar27 = vrsqrtps_avx(auVar224);
    fVar229 = auVar27._0_4_;
    fVar178 = auVar27._4_4_;
    fVar230 = auVar27._8_4_;
    fVar252 = auVar27._12_4_;
    fVar253 = auVar27._16_4_;
    fVar255 = auVar27._20_4_;
    fVar272 = auVar27._24_4_;
    auVar57._4_4_ = fVar178 * fVar178 * fVar178 * auVar224._4_4_ * 0.5;
    auVar57._0_4_ = fVar229 * fVar229 * fVar229 * auVar224._0_4_ * 0.5;
    auVar57._8_4_ = fVar230 * fVar230 * fVar230 * auVar224._8_4_ * 0.5;
    auVar57._12_4_ = fVar252 * fVar252 * fVar252 * auVar224._12_4_ * 0.5;
    auVar57._16_4_ = fVar253 * fVar253 * fVar253 * auVar224._16_4_ * 0.5;
    auVar57._20_4_ = fVar255 * fVar255 * fVar255 * auVar224._20_4_ * 0.5;
    auVar57._24_4_ = fVar272 * fVar272 * fVar272 * auVar224._24_4_ * 0.5;
    auVar57._28_4_ = auVar224._28_4_;
    auVar58._4_4_ = fVar178 * 1.5;
    auVar58._0_4_ = fVar229 * 1.5;
    auVar58._8_4_ = fVar230 * 1.5;
    auVar58._12_4_ = fVar252 * 1.5;
    auVar58._16_4_ = fVar253 * 1.5;
    auVar58._20_4_ = fVar255 * 1.5;
    auVar58._24_4_ = fVar272 * 1.5;
    auVar58._28_4_ = auVar27._28_4_;
    local_2e0 = vsubps_avx(auVar58,auVar57);
    auVar92._4_4_ = fVar348;
    auVar92._0_4_ = fVar341;
    auVar92._8_4_ = fVar350;
    auVar92._12_4_ = fVar352;
    auVar92._16_4_ = fVar354;
    auVar92._20_4_ = fVar356;
    auVar92._24_4_ = fVar358;
    auVar92._28_4_ = fVar360;
    auVar268 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar157 = vsubps_avx(auVar268,auVar92);
    auVar268 = vsubps_avx(auVar268,auVar93);
    fVar229 = auVar268._0_4_;
    fVar252 = auVar268._4_4_;
    fVar272 = auVar268._8_4_;
    fVar351 = auVar268._12_4_;
    fVar254 = auVar268._16_4_;
    fVar260 = auVar268._20_4_;
    fVar417 = auVar268._24_4_;
    fVar178 = auVar157._0_4_;
    fVar253 = auVar157._4_4_;
    fVar273 = auVar157._8_4_;
    fVar353 = auVar157._12_4_;
    fVar256 = auVar157._16_4_;
    fVar397 = auVar157._20_4_;
    fVar421 = auVar157._24_4_;
    auVar30 = vsubps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar94);
    fVar230 = auVar30._0_4_;
    fVar255 = auVar30._4_4_;
    fVar274 = auVar30._8_4_;
    fVar355 = auVar30._12_4_;
    fVar258 = auVar30._16_4_;
    fVar399 = auVar30._20_4_;
    fVar424 = auVar30._24_4_;
    auVar412._0_4_ =
         (float)local_7e0._0_4_ * fVar230 +
         (float)local_800._0_4_ * fVar178 + (float)local_7a0._0_4_ * fVar229;
    auVar412._4_4_ =
         (float)local_7e0._4_4_ * fVar255 +
         (float)local_800._4_4_ * fVar253 + (float)local_7a0._4_4_ * fVar252;
    auVar412._8_4_ = fStack_7d8 * fVar274 + fStack_7f8 * fVar273 + fStack_798 * fVar272;
    auVar412._12_4_ = fStack_7d4 * fVar355 + fStack_7f4 * fVar353 + fStack_794 * fVar351;
    auVar412._16_4_ = fStack_7d0 * fVar258 + fStack_7f0 * fVar256 + fStack_790 * fVar254;
    auVar412._20_4_ = fStack_7cc * fVar399 + fStack_7ec * fVar397 + fStack_78c * fVar260;
    auVar412._24_4_ = fStack_7c8 * fVar424 + fStack_7e8 * fVar421 + fStack_788 * fVar417;
    auVar412._28_4_ = fVar137 + auVar35._28_4_ + auVar27._28_4_;
    auVar437._0_4_ = fVar230 * fVar230 + fVar178 * fVar178 + fVar229 * fVar229;
    auVar437._4_4_ = fVar255 * fVar255 + fVar253 * fVar253 + fVar252 * fVar252;
    auVar437._8_4_ = fVar274 * fVar274 + fVar273 * fVar273 + fVar272 * fVar272;
    auVar437._12_4_ = fVar355 * fVar355 + fVar353 * fVar353 + fVar351 * fVar351;
    auVar437._16_4_ = fVar258 * fVar258 + fVar256 * fVar256 + fVar254 * fVar254;
    auVar437._20_4_ = fVar399 * fVar399 + fVar397 * fVar397 + fVar260 * fVar260;
    auVar437._24_4_ = fVar424 * fVar424 + fVar421 * fVar421 + fVar417 * fVar417;
    auVar437._28_4_ = fStack_8e4 + fStack_8e4 + fVar137;
    fVar278 = local_2e0._0_4_;
    fVar291 = local_2e0._4_4_;
    fVar293 = local_2e0._8_4_;
    fVar295 = local_2e0._12_4_;
    fVar296 = local_2e0._16_4_;
    fVar298 = local_2e0._20_4_;
    fVar300 = local_2e0._24_4_;
    local_540._0_4_ =
         (float)local_7e0._0_4_ * fVar203 * fVar278 +
         fVar278 * fVar228 * (float)local_800._0_4_ + (float)local_7a0._0_4_ * fVar170 * fVar278;
    local_540._4_4_ =
         (float)local_7e0._4_4_ * fVar234 * fVar291 +
         fVar291 * fVar231 * (float)local_800._4_4_ + (float)local_7a0._4_4_ * fVar232 * fVar291;
    local_540._8_4_ =
         fStack_7d8 * fVar261 * fVar293 +
         fVar293 * fVar257 * fStack_7f8 + fStack_798 * fVar259 * fVar293;
    local_540._12_4_ =
         fStack_7d4 * fVar347 * fVar295 +
         fVar295 * fVar275 * fStack_7f4 + fStack_794 * fVar276 * fVar295;
    local_540._16_4_ =
         fStack_7d0 * fVar382 * fVar296 +
         fVar296 * fVar357 * fStack_7f0 + fStack_790 * fVar380 * fVar296;
    local_540._20_4_ =
         fStack_7cc * fVar391 * fVar298 +
         fVar298 * fVar381 * fStack_7ec + fStack_78c * fVar390 * fVar298;
    local_540._24_4_ =
         fStack_7c8 * fVar406 * fVar300 +
         fVar300 * fVar401 * fStack_7e8 + fStack_788 * fVar403 * fVar300;
    local_540._28_4_ = fStack_7c4 + fStack_7e4 + 0.0;
    fVar137 = fStack_7c4 + fStack_7e4 + 0.0;
    local_660._0_4_ =
         fVar230 * fVar203 * fVar278 + fVar278 * fVar228 * fVar178 + fVar170 * fVar278 * fVar229;
    local_660._4_4_ =
         fVar255 * fVar234 * fVar291 + fVar291 * fVar231 * fVar253 + fVar232 * fVar291 * fVar252;
    fStack_658 = fVar274 * fVar261 * fVar293 +
                 fVar293 * fVar257 * fVar273 + fVar259 * fVar293 * fVar272;
    fStack_654 = fVar355 * fVar347 * fVar295 +
                 fVar295 * fVar275 * fVar353 + fVar276 * fVar295 * fVar351;
    fStack_650 = fVar258 * fVar382 * fVar296 +
                 fVar296 * fVar357 * fVar256 + fVar380 * fVar296 * fVar254;
    fStack_64c = fVar399 * fVar391 * fVar298 +
                 fVar298 * fVar381 * fVar397 + fVar390 * fVar298 * fVar260;
    fStack_648 = fVar424 * fVar406 * fVar300 +
                 fVar300 * fVar401 * fVar421 + fVar403 * fVar300 * fVar417;
    fStack_644 = fStack_7e4 + fVar137;
    auVar59._4_4_ = local_540._4_4_ * (float)local_660._4_4_;
    auVar59._0_4_ = local_540._0_4_ * (float)local_660._0_4_;
    auVar59._8_4_ = local_540._8_4_ * fStack_658;
    auVar59._12_4_ = local_540._12_4_ * fStack_654;
    auVar59._16_4_ = local_540._16_4_ * fStack_650;
    auVar59._20_4_ = local_540._20_4_ * fStack_64c;
    auVar59._24_4_ = local_540._24_4_ * fStack_648;
    auVar59._28_4_ = fVar137;
    auVar27 = vsubps_avx(auVar412,auVar59);
    auVar60._4_4_ = (float)local_660._4_4_ * (float)local_660._4_4_;
    auVar60._0_4_ = (float)local_660._0_4_ * (float)local_660._0_4_;
    auVar60._8_4_ = fStack_658 * fStack_658;
    auVar60._12_4_ = fStack_654 * fStack_654;
    auVar60._16_4_ = fStack_650 * fStack_650;
    auVar60._20_4_ = fStack_64c * fStack_64c;
    auVar60._24_4_ = fStack_648 * fStack_648;
    auVar60._28_4_ = fStack_7e4;
    auVar31 = vsubps_avx(auVar437,auVar60);
    local_5a0 = vsqrtps_avx(auVar119);
    fVar137 = (auVar164._0_4_ + local_5a0._0_4_) * 1.0000002;
    fVar427 = (auVar164._4_4_ + local_5a0._4_4_) * 1.0000002;
    fVar430 = (auVar164._8_4_ + local_5a0._8_4_) * 1.0000002;
    fVar172 = (auVar164._12_4_ + local_5a0._12_4_) * 1.0000002;
    fVar174 = (auVar164._16_4_ + local_5a0._16_4_) * 1.0000002;
    fVar175 = (auVar164._20_4_ + local_5a0._20_4_) * 1.0000002;
    fVar176 = (auVar164._24_4_ + local_5a0._24_4_) * 1.0000002;
    auVar61._4_4_ = fVar427 * fVar427;
    auVar61._0_4_ = fVar137 * fVar137;
    auVar61._8_4_ = fVar430 * fVar430;
    auVar61._12_4_ = fVar172 * fVar172;
    auVar61._16_4_ = fVar174 * fVar174;
    auVar61._20_4_ = fVar175 * fVar175;
    auVar61._24_4_ = fVar176 * fVar176;
    auVar61._28_4_ = auVar164._28_4_ + local_5a0._28_4_;
    fVar384 = auVar27._0_4_ + auVar27._0_4_;
    fVar393 = auVar27._4_4_ + auVar27._4_4_;
    local_620._0_8_ = CONCAT44(fVar393,fVar384);
    local_620._8_4_ = auVar27._8_4_ + auVar27._8_4_;
    local_620._12_4_ = auVar27._12_4_ + auVar27._12_4_;
    local_620._16_4_ = auVar27._16_4_ + auVar27._16_4_;
    local_620._20_4_ = auVar27._20_4_ + auVar27._20_4_;
    local_620._24_4_ = auVar27._24_4_ + auVar27._24_4_;
    local_620._28_4_ = auVar27._28_4_ + auVar27._28_4_;
    auVar164 = vsubps_avx(auVar31,auVar61);
    local_300._4_4_ = local_540._4_4_ * local_540._4_4_;
    local_300._0_4_ = local_540._0_4_ * local_540._0_4_;
    local_300._8_4_ = local_540._8_4_ * local_540._8_4_;
    local_300._12_4_ = local_540._12_4_ * local_540._12_4_;
    local_300._16_4_ = local_540._16_4_ * local_540._16_4_;
    local_300._20_4_ = local_540._20_4_ * local_540._20_4_;
    local_300._24_4_ = local_540._24_4_ * local_540._24_4_;
    local_300._28_4_ = uStack_784;
    auVar379 = ZEXT3264(local_300);
    local_520 = vsubps_avx(local_260,local_300);
    auVar62._4_4_ = fVar393 * fVar393;
    auVar62._0_4_ = fVar384 * fVar384;
    auVar62._8_4_ = local_620._8_4_ * local_620._8_4_;
    auVar62._12_4_ = local_620._12_4_ * local_620._12_4_;
    auVar62._16_4_ = local_620._16_4_ * local_620._16_4_;
    auVar62._20_4_ = local_620._20_4_ * local_620._20_4_;
    auVar62._24_4_ = local_620._24_4_ * local_620._24_4_;
    auVar62._28_4_ = auVar31._28_4_;
    fVar427 = local_520._0_4_;
    fVar430 = local_520._4_4_;
    fVar172 = local_520._8_4_;
    fVar174 = local_520._12_4_;
    fVar175 = local_520._16_4_;
    fVar176 = local_520._20_4_;
    fVar359 = local_520._24_4_;
    auVar63._4_4_ = auVar164._4_4_ * fVar430 * 4.0;
    auVar63._0_4_ = auVar164._0_4_ * fVar427 * 4.0;
    auVar63._8_4_ = auVar164._8_4_ * fVar172 * 4.0;
    auVar63._12_4_ = auVar164._12_4_ * fVar174 * 4.0;
    auVar63._16_4_ = auVar164._16_4_ * fVar175 * 4.0;
    auVar63._20_4_ = auVar164._20_4_ * fVar176 * 4.0;
    auVar63._24_4_ = auVar164._24_4_ * fVar359 * 4.0;
    auVar63._28_4_ = 0x40800000;
    auVar27 = vsubps_avx(auVar62,auVar63);
    auVar119 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,5);
    fVar137 = local_520._28_4_;
    if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar119 >> 0x7f,0) == '\0') &&
          (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar119 >> 0xbf,0) == '\0') &&
        (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar119[0x1f])
    {
      auVar309._8_4_ = 0x7f800000;
      auVar309._0_8_ = 0x7f8000007f800000;
      auVar309._12_4_ = 0x7f800000;
      auVar309._16_4_ = 0x7f800000;
      auVar309._20_4_ = 0x7f800000;
      auVar309._24_4_ = 0x7f800000;
      auVar309._28_4_ = 0x7f800000;
      auVar438._8_4_ = 0xff800000;
      auVar438._0_8_ = 0xff800000ff800000;
      auVar438._12_4_ = 0xff800000;
      auVar438._16_4_ = 0xff800000;
      auVar438._20_4_ = 0xff800000;
      auVar438._24_4_ = 0xff800000;
      auVar438._28_4_ = 0xff800000;
    }
    else {
      auVar377 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,5);
      auVar35 = vsqrtps_avx(auVar27);
      auVar283._0_4_ = fVar427 + fVar427;
      auVar283._4_4_ = fVar430 + fVar430;
      auVar283._8_4_ = fVar172 + fVar172;
      auVar283._12_4_ = fVar174 + fVar174;
      auVar283._16_4_ = fVar175 + fVar175;
      auVar283._20_4_ = fVar176 + fVar176;
      auVar283._24_4_ = fVar359 + fVar359;
      auVar283._28_4_ = fVar137 + fVar137;
      auVar27 = vrcpps_avx(auVar283);
      fVar277 = auVar27._0_4_;
      fVar290 = auVar27._4_4_;
      auVar64._4_4_ = auVar283._4_4_ * fVar290;
      auVar64._0_4_ = auVar283._0_4_ * fVar277;
      fVar292 = auVar27._8_4_;
      auVar64._8_4_ = auVar283._8_4_ * fVar292;
      fVar294 = auVar27._12_4_;
      auVar64._12_4_ = auVar283._12_4_ * fVar294;
      fVar233 = auVar27._16_4_;
      auVar64._16_4_ = auVar283._16_4_ * fVar233;
      fVar297 = auVar27._20_4_;
      auVar64._20_4_ = auVar283._20_4_ * fVar297;
      fVar299 = auVar27._24_4_;
      auVar64._24_4_ = auVar283._24_4_ * fVar299;
      auVar64._28_4_ = auVar283._28_4_;
      auVar336._8_4_ = 0x3f800000;
      auVar336._0_8_ = 0x3f8000003f800000;
      auVar336._12_4_ = 0x3f800000;
      auVar336._16_4_ = 0x3f800000;
      auVar336._20_4_ = 0x3f800000;
      auVar336._24_4_ = 0x3f800000;
      auVar336._28_4_ = 0x3f800000;
      auVar120 = vsubps_avx(auVar336,auVar64);
      fVar277 = fVar277 + fVar277 * auVar120._0_4_;
      fVar290 = fVar290 + fVar290 * auVar120._4_4_;
      fVar292 = fVar292 + fVar292 * auVar120._8_4_;
      fVar294 = fVar294 + fVar294 * auVar120._12_4_;
      fVar233 = fVar233 + fVar233 * auVar120._16_4_;
      fVar297 = fVar297 + fVar297 * auVar120._20_4_;
      fVar299 = fVar299 + fVar299 * auVar120._24_4_;
      auVar310._0_8_ = CONCAT44(fVar393,fVar384) ^ 0x8000000080000000;
      auVar310._8_4_ = -local_620._8_4_;
      auVar310._12_4_ = -local_620._12_4_;
      auVar310._16_4_ = -local_620._16_4_;
      auVar310._20_4_ = -local_620._20_4_;
      auVar310._24_4_ = -local_620._24_4_;
      auVar310._28_4_ = -local_620._28_4_;
      auVar121 = vsubps_avx(auVar310,auVar35);
      fVar384 = auVar121._0_4_ * fVar277;
      fVar393 = auVar121._4_4_ * fVar290;
      auVar65._4_4_ = fVar393;
      auVar65._0_4_ = fVar384;
      fVar320 = auVar121._8_4_ * fVar292;
      auVar65._8_4_ = fVar320;
      fVar322 = auVar121._12_4_ * fVar294;
      auVar65._12_4_ = fVar322;
      fVar324 = auVar121._16_4_ * fVar233;
      auVar65._16_4_ = fVar324;
      fVar326 = auVar121._20_4_ * fVar297;
      auVar65._20_4_ = fVar326;
      fVar328 = auVar121._24_4_ * fVar299;
      auVar65._24_4_ = fVar328;
      auVar65._28_4_ = auVar121._28_4_;
      auVar35 = vsubps_avx(auVar35,local_620);
      fVar277 = auVar35._0_4_ * fVar277;
      fVar290 = auVar35._4_4_ * fVar290;
      auVar66._4_4_ = fVar290;
      auVar66._0_4_ = fVar277;
      fVar292 = auVar35._8_4_ * fVar292;
      auVar66._8_4_ = fVar292;
      fVar294 = auVar35._12_4_ * fVar294;
      auVar66._12_4_ = fVar294;
      fVar233 = auVar35._16_4_ * fVar233;
      auVar66._16_4_ = fVar233;
      fVar297 = auVar35._20_4_ * fVar297;
      auVar66._20_4_ = fVar297;
      fVar299 = auVar35._24_4_ * fVar299;
      auVar66._24_4_ = fVar299;
      auVar66._28_4_ = auVar35._28_4_;
      local_680._4_4_ = fVar291 * ((float)local_660._4_4_ + local_540._4_4_ * fVar393);
      local_680._0_4_ = fVar278 * ((float)local_660._0_4_ + local_540._0_4_ * fVar384);
      fStack_678 = fVar293 * (fStack_658 + local_540._8_4_ * fVar320);
      fStack_674 = fVar295 * (fStack_654 + local_540._12_4_ * fVar322);
      fStack_670 = fVar296 * (fStack_650 + local_540._16_4_ * fVar324);
      fStack_66c = fVar298 * (fStack_64c + local_540._20_4_ * fVar326);
      fStack_668 = fVar300 * (fStack_648 + local_540._24_4_ * fVar328);
      fStack_664 = fStack_644 + auVar27._28_4_ + auVar120._28_4_;
      auVar284._8_4_ = 0x7fffffff;
      auVar284._0_8_ = 0x7fffffff7fffffff;
      auVar284._12_4_ = 0x7fffffff;
      auVar284._16_4_ = 0x7fffffff;
      auVar284._20_4_ = 0x7fffffff;
      auVar284._24_4_ = 0x7fffffff;
      auVar284._28_4_ = 0x7fffffff;
      auVar27 = vandps_avx(local_300,auVar284);
      auVar35 = vmaxps_avx(local_500,auVar27);
      auVar67._4_4_ = auVar35._4_4_ * 1.9073486e-06;
      auVar67._0_4_ = auVar35._0_4_ * 1.9073486e-06;
      auVar67._8_4_ = auVar35._8_4_ * 1.9073486e-06;
      auVar67._12_4_ = auVar35._12_4_ * 1.9073486e-06;
      auVar67._16_4_ = auVar35._16_4_ * 1.9073486e-06;
      auVar67._20_4_ = auVar35._20_4_ * 1.9073486e-06;
      auVar67._24_4_ = auVar35._24_4_ * 1.9073486e-06;
      auVar67._28_4_ = auVar35._28_4_;
      auVar27 = vandps_avx(local_520,auVar284);
      auVar27 = vcmpps_avx(auVar27,auVar67,1);
      auVar337._8_4_ = 0x7f800000;
      auVar337._0_8_ = 0x7f8000007f800000;
      auVar337._12_4_ = 0x7f800000;
      auVar337._16_4_ = 0x7f800000;
      auVar337._20_4_ = 0x7f800000;
      auVar337._24_4_ = 0x7f800000;
      auVar337._28_4_ = 0x7f800000;
      auVar309 = vblendvps_avx(auVar337,auVar65,auVar377);
      local_2c0 = fVar278 * ((float)local_660._0_4_ + local_540._0_4_ * fVar277);
      fStack_2bc = fVar291 * ((float)local_660._4_4_ + local_540._4_4_ * fVar290);
      fStack_2b8 = fVar293 * (fStack_658 + local_540._8_4_ * fVar292);
      fStack_2b4 = fVar295 * (fStack_654 + local_540._12_4_ * fVar294);
      fStack_2b0 = fVar296 * (fStack_650 + local_540._16_4_ * fVar233);
      fStack_2ac = fVar298 * (fStack_64c + local_540._20_4_ * fVar297);
      fStack_2a8 = fVar300 * (fStack_648 + local_540._24_4_ * fVar299);
      fStack_2a4 = fStack_644 + auVar35._28_4_;
      auVar285._8_4_ = 0xff800000;
      auVar285._0_8_ = 0xff800000ff800000;
      auVar285._12_4_ = 0xff800000;
      auVar285._16_4_ = 0xff800000;
      auVar285._20_4_ = 0xff800000;
      auVar285._24_4_ = 0xff800000;
      auVar285._28_4_ = 0xff800000;
      auVar438 = vblendvps_avx(auVar285,auVar66,auVar377);
      auVar35 = auVar377 & auVar27;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar35 >> 0x7f,0) != '\0') ||
            (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar35 >> 0xbf,0) != '\0') ||
          (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar35[0x1f] < '\0') {
        auVar119 = vandps_avx(auVar27,auVar377);
        auVar216 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
        auVar27 = vcmpps_avx(auVar164,ZEXT832(0) << 0x20,2);
        auVar446._8_4_ = 0xff800000;
        auVar446._0_8_ = 0xff800000ff800000;
        auVar446._12_4_ = 0xff800000;
        auVar446._16_4_ = 0xff800000;
        auVar446._20_4_ = 0xff800000;
        auVar446._24_4_ = 0xff800000;
        auVar446._28_4_ = 0xff800000;
        auVar316._8_4_ = 0x7f800000;
        auVar316._0_8_ = 0x7f8000007f800000;
        auVar316._12_4_ = 0x7f800000;
        auVar316._16_4_ = 0x7f800000;
        auVar316._20_4_ = 0x7f800000;
        auVar316._24_4_ = 0x7f800000;
        auVar316._28_4_ = 0x7f800000;
        auVar164 = vblendvps_avx(auVar316,auVar446,auVar27);
        auVar180 = vpmovsxwd_avx(auVar216);
        auVar216 = vpunpckhwd_avx(auVar216,auVar216);
        auVar270._16_16_ = auVar216;
        auVar270._0_16_ = auVar180;
        auVar309 = vblendvps_avx(auVar309,auVar164,auVar270);
        auVar317._8_4_ = 0x7f800000;
        auVar317._0_8_ = 0x7f8000007f800000;
        auVar317._12_4_ = 0x7f800000;
        auVar317._16_4_ = 0x7f800000;
        auVar317._20_4_ = 0x7f800000;
        auVar317._24_4_ = 0x7f800000;
        auVar317._28_4_ = 0x7f800000;
        auVar164 = vblendvps_avx(auVar446,auVar317,auVar27);
        auVar438 = vblendvps_avx(auVar438,auVar164,auVar270);
        auVar164 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar166._0_4_ = auVar119._0_4_ ^ auVar164._0_4_;
        auVar166._4_4_ = auVar119._4_4_ ^ auVar164._4_4_;
        auVar166._8_4_ = auVar119._8_4_ ^ auVar164._8_4_;
        auVar166._12_4_ = auVar119._12_4_ ^ auVar164._12_4_;
        auVar166._16_4_ = auVar119._16_4_ ^ auVar164._16_4_;
        auVar166._20_4_ = auVar119._20_4_ ^ auVar164._20_4_;
        auVar166._24_4_ = auVar119._24_4_ ^ auVar164._24_4_;
        auVar166._28_4_ = auVar119._28_4_ ^ auVar164._28_4_;
        auVar119 = vorps_avx(auVar27,auVar166);
        auVar119 = vandps_avx(auVar377,auVar119);
      }
    }
    auVar339 = ZEXT3264(local_540);
    auVar164 = local_4e0 & auVar119;
    if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar164 >> 0x7f,0) != '\0') ||
          (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar164 >> 0xbf,0) != '\0') ||
        (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar164[0x1f] < '\0') {
      auVar180 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      local_640._0_16_ = auVar180;
      auVar216 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_890._0_4_));
      auVar216 = vshufps_avx(auVar216,auVar216,0);
      auVar269._16_16_ = auVar216;
      auVar269._0_16_ = auVar216;
      auVar377 = vminps_avx(auVar269,auVar438);
      fVar233 = auVar157._28_4_ + auVar268._28_4_;
      auVar190._0_4_ =
           (float)local_7e0._0_4_ * fVar301 +
           (float)local_800._0_4_ * fVar383 + (float)local_7a0._0_4_ * fVar407;
      auVar190._4_4_ =
           (float)local_7e0._4_4_ * fVar318 +
           (float)local_800._4_4_ * fVar392 + (float)local_7a0._4_4_ * fVar415;
      auVar190._8_4_ = fStack_7d8 * fVar319 + fStack_7f8 * fVar395 + fStack_798 * fVar418;
      auVar190._12_4_ = fStack_7d4 * fVar321 + fStack_7f4 * fVar398 + fStack_794 * fVar422;
      auVar190._16_4_ = fStack_7d0 * fVar323 + fStack_7f0 * fVar400 + fStack_790 * fVar425;
      auVar190._20_4_ = fStack_7cc * fVar325 + fStack_7ec * fVar402 + fStack_78c * fVar428;
      auVar190._24_4_ = fStack_7c8 * fVar327 + fStack_7e8 * fVar404 + fStack_788 * fVar431;
      auVar190._28_4_ = fVar233 + fVar405 + fVar233;
      auVar164 = vrcpps_avx(auVar190);
      fVar384 = auVar164._0_4_;
      fVar393 = auVar164._4_4_;
      auVar68._4_4_ = auVar190._4_4_ * fVar393;
      auVar68._0_4_ = auVar190._0_4_ * fVar384;
      fVar405 = auVar164._8_4_;
      auVar68._8_4_ = auVar190._8_4_ * fVar405;
      fVar277 = auVar164._12_4_;
      auVar68._12_4_ = auVar190._12_4_ * fVar277;
      fVar290 = auVar164._16_4_;
      auVar68._16_4_ = auVar190._16_4_ * fVar290;
      fVar292 = auVar164._20_4_;
      auVar68._20_4_ = auVar190._20_4_ * fVar292;
      fVar294 = auVar164._24_4_;
      auVar68._24_4_ = auVar190._24_4_ * fVar294;
      auVar68._28_4_ = fVar329;
      auVar367._8_4_ = 0x3f800000;
      auVar367._0_8_ = 0x3f8000003f800000;
      auVar367._12_4_ = 0x3f800000;
      auVar367._16_4_ = 0x3f800000;
      auVar367._20_4_ = 0x3f800000;
      auVar367._24_4_ = 0x3f800000;
      auVar367._28_4_ = 0x3f800000;
      auVar157 = vsubps_avx(auVar367,auVar68);
      auVar311._8_4_ = 0x7fffffff;
      auVar311._0_8_ = 0x7fffffff7fffffff;
      auVar311._12_4_ = 0x7fffffff;
      auVar311._16_4_ = 0x7fffffff;
      auVar311._20_4_ = 0x7fffffff;
      auVar311._24_4_ = 0x7fffffff;
      auVar311._28_4_ = 0x7fffffff;
      auVar164 = vandps_avx(auVar190,auVar311);
      auVar346._8_4_ = 0x219392ef;
      auVar346._0_8_ = 0x219392ef219392ef;
      auVar346._12_4_ = 0x219392ef;
      auVar346._16_4_ = 0x219392ef;
      auVar346._20_4_ = 0x219392ef;
      auVar346._24_4_ = 0x219392ef;
      auVar346._28_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar164,auVar346,1);
      auVar69._4_4_ =
           (fVar393 + fVar393 * auVar157._4_4_) *
           -(fVar318 * fVar255 + fVar392 * fVar253 + fVar415 * fVar252);
      auVar69._0_4_ =
           (fVar384 + fVar384 * auVar157._0_4_) *
           -(fVar301 * fVar230 + fVar383 * fVar178 + fVar407 * fVar229);
      auVar69._8_4_ =
           (fVar405 + fVar405 * auVar157._8_4_) *
           -(fVar319 * fVar274 + fVar395 * fVar273 + fVar418 * fVar272);
      auVar69._12_4_ =
           (fVar277 + fVar277 * auVar157._12_4_) *
           -(fVar321 * fVar355 + fVar398 * fVar353 + fVar422 * fVar351);
      auVar69._16_4_ =
           (fVar290 + fVar290 * auVar157._16_4_) *
           -(fVar323 * fVar258 + fVar400 * fVar256 + fVar425 * fVar254);
      auVar69._20_4_ =
           (fVar292 + fVar292 * auVar157._20_4_) *
           -(fVar325 * fVar399 + fVar402 * fVar397 + fVar428 * fVar260);
      auVar69._24_4_ =
           (fVar294 + fVar294 * auVar157._24_4_) *
           -(fVar327 * fVar424 + fVar404 * fVar421 + fVar431 * fVar417);
      auVar69._28_4_ = -(auVar30._28_4_ + fVar233);
      auVar90 = ZEXT412(0);
      auVar379 = ZEXT1264(auVar90) << 0x20;
      auVar164 = vcmpps_avx(auVar190,ZEXT1232(auVar90) << 0x20,1);
      auVar164 = vorps_avx(auVar27,auVar164);
      auVar338._8_4_ = 0xff800000;
      auVar338._0_8_ = 0xff800000ff800000;
      auVar338._12_4_ = 0xff800000;
      auVar338._16_4_ = 0xff800000;
      auVar338._20_4_ = 0xff800000;
      auVar338._24_4_ = 0xff800000;
      auVar338._28_4_ = 0xff800000;
      auVar339 = ZEXT3264(auVar338);
      auVar164 = vblendvps_avx(auVar69,auVar338,auVar164);
      auVar157 = vcmpps_avx(auVar190,ZEXT1232(auVar90) << 0x20,6);
      auVar27 = vorps_avx(auVar27,auVar157);
      auVar413._8_4_ = 0x7f800000;
      auVar413._0_8_ = 0x7f8000007f800000;
      auVar413._12_4_ = 0x7f800000;
      auVar413._16_4_ = 0x7f800000;
      auVar413._20_4_ = 0x7f800000;
      auVar413._24_4_ = 0x7f800000;
      auVar413._28_4_ = 0x7f800000;
      auVar27 = vblendvps_avx(auVar69,auVar413,auVar27);
      auVar157 = vmaxps_avx(local_280,auVar309);
      auVar157 = vmaxps_avx(auVar157,auVar164);
      auVar268 = vminps_avx(auVar377,auVar27);
      auVar377 = ZEXT1232(auVar90) << 0x20;
      auVar164 = vsubps_avx(auVar377,_local_a40);
      auVar27 = vsubps_avx(auVar377,auVar28);
      auVar70._4_4_ = auVar27._4_4_ * -fVar416;
      auVar70._0_4_ = auVar27._0_4_ * -fVar408;
      auVar70._8_4_ = auVar27._8_4_ * -fVar419;
      auVar70._12_4_ = auVar27._12_4_ * -fVar423;
      auVar70._16_4_ = auVar27._16_4_ * -fVar426;
      auVar70._20_4_ = auVar27._20_4_ * -fVar429;
      auVar70._24_4_ = auVar27._24_4_ * -fVar432;
      auVar70._28_4_ = auVar27._28_4_;
      auVar71._4_4_ = fVar440 * auVar164._4_4_;
      auVar71._0_4_ = fVar433 * auVar164._0_4_;
      auVar71._8_4_ = fVar441 * auVar164._8_4_;
      auVar71._12_4_ = fVar442 * auVar164._12_4_;
      auVar71._16_4_ = fVar443 * auVar164._16_4_;
      auVar71._20_4_ = fVar444 * auVar164._20_4_;
      auVar71._24_4_ = fVar445 * auVar164._24_4_;
      auVar71._28_4_ = auVar164._28_4_;
      auVar164 = vsubps_avx(auVar70,auVar71);
      auVar27 = vsubps_avx(auVar377,auVar29);
      auVar72._4_4_ = fVar251 * auVar27._4_4_;
      auVar72._0_4_ = fVar173 * auVar27._0_4_;
      auVar72._8_4_ = fVar271 * auVar27._8_4_;
      auVar72._12_4_ = fVar349 * auVar27._12_4_;
      auVar72._16_4_ = fVar420 * auVar27._16_4_;
      auVar72._20_4_ = fVar394 * auVar27._20_4_;
      uVar8 = auVar27._28_4_;
      auVar72._24_4_ = fVar414 * auVar27._24_4_;
      auVar72._28_4_ = uVar8;
      auVar28 = vsubps_avx(auVar164,auVar72);
      auVar73._4_4_ = (float)local_7a0._4_4_ * -fVar416;
      auVar73._0_4_ = (float)local_7a0._0_4_ * -fVar408;
      auVar73._8_4_ = fStack_798 * -fVar419;
      auVar73._12_4_ = fStack_794 * -fVar423;
      auVar73._16_4_ = fStack_790 * -fVar426;
      auVar73._20_4_ = fStack_78c * -fVar429;
      auVar73._24_4_ = fStack_788 * -fVar432;
      auVar73._28_4_ = uVar100 ^ 0x80000000;
      auVar74._4_4_ = (float)local_800._4_4_ * fVar440;
      auVar74._0_4_ = (float)local_800._0_4_ * fVar433;
      auVar74._8_4_ = fStack_7f8 * fVar441;
      auVar74._12_4_ = fStack_7f4 * fVar442;
      auVar74._16_4_ = fStack_7f0 * fVar443;
      auVar74._20_4_ = fStack_7ec * fVar444;
      auVar74._24_4_ = fStack_7e8 * fVar445;
      auVar74._28_4_ = uVar8;
      auVar164 = vsubps_avx(auVar73,auVar74);
      auVar75._4_4_ = fVar251 * (float)local_7e0._4_4_;
      auVar75._0_4_ = fVar173 * (float)local_7e0._0_4_;
      auVar75._8_4_ = fVar271 * fStack_7d8;
      auVar75._12_4_ = fVar349 * fStack_7d4;
      auVar75._16_4_ = fVar420 * fStack_7d0;
      auVar75._20_4_ = fVar394 * fStack_7cc;
      auVar75._24_4_ = fVar414 * fStack_7c8;
      auVar75._28_4_ = uVar8;
      auVar368._8_4_ = 0x3f800000;
      auVar368._0_8_ = 0x3f8000003f800000;
      auVar368._12_4_ = 0x3f800000;
      auVar368._16_4_ = 0x3f800000;
      auVar368._20_4_ = 0x3f800000;
      auVar368._24_4_ = 0x3f800000;
      auVar368._28_4_ = 0x3f800000;
      auVar29 = vsubps_avx(auVar164,auVar75);
      auVar164 = vrcpps_avx(auVar29);
      fVar173 = auVar164._0_4_;
      fVar229 = auVar164._4_4_;
      auVar76._4_4_ = auVar29._4_4_ * fVar229;
      auVar76._0_4_ = auVar29._0_4_ * fVar173;
      fVar178 = auVar164._8_4_;
      auVar76._8_4_ = auVar29._8_4_ * fVar178;
      fVar230 = auVar164._12_4_;
      auVar76._12_4_ = auVar29._12_4_ * fVar230;
      fVar251 = auVar164._16_4_;
      auVar76._16_4_ = auVar29._16_4_ * fVar251;
      fVar252 = auVar164._20_4_;
      auVar76._20_4_ = auVar29._20_4_ * fVar252;
      fVar253 = auVar164._24_4_;
      auVar76._24_4_ = auVar29._24_4_ * fVar253;
      auVar76._28_4_ = fStack_7c4;
      auVar30 = vsubps_avx(auVar368,auVar76);
      auVar164 = vandps_avx(auVar29,auVar311);
      auVar27 = vcmpps_avx(auVar164,auVar346,1);
      auVar77._4_4_ = (fVar229 + fVar229 * auVar30._4_4_) * -auVar28._4_4_;
      auVar77._0_4_ = (fVar173 + fVar173 * auVar30._0_4_) * -auVar28._0_4_;
      auVar77._8_4_ = (fVar178 + fVar178 * auVar30._8_4_) * -auVar28._8_4_;
      auVar77._12_4_ = (fVar230 + fVar230 * auVar30._12_4_) * -auVar28._12_4_;
      auVar77._16_4_ = (fVar251 + fVar251 * auVar30._16_4_) * -auVar28._16_4_;
      auVar77._20_4_ = (fVar252 + fVar252 * auVar30._20_4_) * -auVar28._20_4_;
      auVar77._24_4_ = (fVar253 + fVar253 * auVar30._24_4_) * -auVar28._24_4_;
      auVar77._28_4_ = auVar28._28_4_ ^ 0x80000000;
      auVar164 = vcmpps_avx(auVar29,auVar377,1);
      auVar164 = vorps_avx(auVar27,auVar164);
      auVar164 = vblendvps_avx(auVar77,auVar338,auVar164);
      _local_7c0 = vmaxps_avx(auVar157,auVar164);
      auVar164 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,6);
      auVar164 = vorps_avx(auVar27,auVar164);
      auVar164 = vblendvps_avx(auVar77,auVar413,auVar164);
      auVar119 = vandps_avx(auVar119,local_4e0);
      local_320 = vminps_avx(auVar268,auVar164);
      auVar164 = vcmpps_avx(_local_7c0,local_320,2);
      auVar27 = auVar119 & auVar164;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0x7f,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0xbf,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar27[0x1f] < '\0') {
        auVar27 = vminps_avx(local_9e0,auVar124);
        auVar28 = vminps_avx(local_760,local_780);
        auVar27 = vminps_avx(auVar27,auVar28);
        auVar27 = vsubps_avx(auVar27,local_5a0);
        auVar119 = vandps_avx(auVar164,auVar119);
        auVar164 = vminps_avx(_local_680,auVar368);
        auVar164 = vmaxps_avx(auVar164,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar107 + fVar136 * (auVar164._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar133 + fVar168 * (auVar164._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar134 + fVar169 * (auVar164._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar135 + fVar171 * (auVar164._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar107 + fVar136 * (auVar164._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar133 + fVar168 * (auVar164._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar134 + fVar169 * (auVar164._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar135 + auVar164._28_4_ + 7.0;
        auVar95._4_4_ = fStack_2bc;
        auVar95._0_4_ = local_2c0;
        auVar95._8_4_ = fStack_2b8;
        auVar95._12_4_ = fStack_2b4;
        auVar95._16_4_ = fStack_2b0;
        auVar95._20_4_ = fStack_2ac;
        auVar95._24_4_ = fStack_2a8;
        auVar95._28_4_ = fStack_2a4;
        auVar164 = vminps_avx(auVar95,auVar368);
        auVar164 = vmaxps_avx(auVar164,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar107 + fVar136 * (auVar164._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar133 + fVar168 * (auVar164._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar134 + fVar169 * (auVar164._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar135 + fVar171 * (auVar164._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar107 + fVar136 * (auVar164._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar133 + fVar168 * (auVar164._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar134 + fVar169 * (auVar164._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar135 + auVar164._28_4_ + 7.0;
        auVar78._4_4_ = auVar27._4_4_ * 0.99999976;
        auVar78._0_4_ = auVar27._0_4_ * 0.99999976;
        auVar78._8_4_ = auVar27._8_4_ * 0.99999976;
        auVar78._12_4_ = auVar27._12_4_ * 0.99999976;
        auVar78._16_4_ = auVar27._16_4_ * 0.99999976;
        auVar78._20_4_ = auVar27._20_4_ * 0.99999976;
        auVar78._24_4_ = auVar27._24_4_ * 0.99999976;
        auVar78._28_4_ = 0x3f7ffffc;
        auVar164 = vmaxps_avx(ZEXT832(0) << 0x20,auVar78);
        auVar79._4_4_ = auVar164._4_4_ * auVar164._4_4_;
        auVar79._0_4_ = auVar164._0_4_ * auVar164._0_4_;
        auVar79._8_4_ = auVar164._8_4_ * auVar164._8_4_;
        auVar79._12_4_ = auVar164._12_4_ * auVar164._12_4_;
        auVar79._16_4_ = auVar164._16_4_ * auVar164._16_4_;
        auVar79._20_4_ = auVar164._20_4_ * auVar164._20_4_;
        auVar79._24_4_ = auVar164._24_4_ * auVar164._24_4_;
        auVar79._28_4_ = auVar164._28_4_;
        auVar27 = vsubps_avx(auVar31,auVar79);
        auVar80._4_4_ = auVar27._4_4_ * fVar430 * 4.0;
        auVar80._0_4_ = auVar27._0_4_ * fVar427 * 4.0;
        auVar80._8_4_ = auVar27._8_4_ * fVar172 * 4.0;
        auVar80._12_4_ = auVar27._12_4_ * fVar174 * 4.0;
        auVar80._16_4_ = auVar27._16_4_ * fVar175 * 4.0;
        auVar80._20_4_ = auVar27._20_4_ * fVar176 * 4.0;
        auVar80._24_4_ = auVar27._24_4_ * fVar359 * 4.0;
        auVar80._28_4_ = auVar164._28_4_;
        auVar378 = vsubps_avx(auVar62,auVar80);
        auVar164 = vcmpps_avx(auVar378,ZEXT832(0) << 0x20,5);
        if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar164 >> 0x7f,0) == '\0') &&
              (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar164 >> 0xbf,0) == '\0') &&
            (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar164[0x1f]) {
          auVar157 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_840 = ZEXT832(0) << 0x20;
          _local_860 = ZEXT832(0) << 0x20;
          auVar219 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar245 = ZEXT828(0) << 0x20;
          auVar286._8_4_ = 0x7f800000;
          auVar286._0_8_ = 0x7f8000007f800000;
          auVar286._12_4_ = 0x7f800000;
          auVar286._16_4_ = 0x7f800000;
          auVar286._20_4_ = 0x7f800000;
          auVar286._24_4_ = 0x7f800000;
          auVar286._28_4_ = 0x7f800000;
          auVar312._8_4_ = 0xff800000;
          auVar312._0_8_ = 0xff800000ff800000;
          auVar312._12_4_ = 0xff800000;
          auVar312._16_4_ = 0xff800000;
          auVar312._20_4_ = 0xff800000;
          auVar312._24_4_ = 0xff800000;
          auVar312._28_4_ = 0xff800000;
          _local_820 = _local_840;
        }
        else {
          auVar29 = vsqrtps_avx(auVar378);
          auVar225._0_4_ = fVar427 + fVar427;
          auVar225._4_4_ = fVar430 + fVar430;
          auVar225._8_4_ = fVar172 + fVar172;
          auVar225._12_4_ = fVar174 + fVar174;
          auVar225._16_4_ = fVar175 + fVar175;
          auVar225._20_4_ = fVar176 + fVar176;
          auVar225._24_4_ = fVar359 + fVar359;
          auVar225._28_4_ = fVar137 + fVar137;
          auVar28 = vrcpps_avx(auVar225);
          fVar137 = auVar28._0_4_;
          fVar173 = auVar28._4_4_;
          auVar81._4_4_ = auVar225._4_4_ * fVar173;
          auVar81._0_4_ = auVar225._0_4_ * fVar137;
          fVar229 = auVar28._8_4_;
          auVar81._8_4_ = auVar225._8_4_ * fVar229;
          fVar178 = auVar28._12_4_;
          auVar81._12_4_ = auVar225._12_4_ * fVar178;
          fVar230 = auVar28._16_4_;
          auVar81._16_4_ = auVar225._16_4_ * fVar230;
          fVar251 = auVar28._20_4_;
          auVar81._20_4_ = auVar225._20_4_ * fVar251;
          fVar252 = auVar28._24_4_;
          auVar81._24_4_ = auVar225._24_4_ * fVar252;
          auVar81._28_4_ = auVar225._28_4_;
          auVar157 = vsubps_avx(auVar368,auVar81);
          fVar137 = fVar137 + fVar137 * auVar157._0_4_;
          fVar173 = fVar173 + fVar173 * auVar157._4_4_;
          fVar229 = fVar229 + fVar229 * auVar157._8_4_;
          fVar178 = fVar178 + fVar178 * auVar157._12_4_;
          fVar230 = fVar230 + fVar230 * auVar157._16_4_;
          fVar251 = fVar251 + fVar251 * auVar157._20_4_;
          fVar252 = fVar252 + fVar252 * auVar157._24_4_;
          fVar253 = auVar28._28_4_ + auVar157._28_4_;
          auVar247._0_8_ = local_620._0_8_ ^ 0x8000000080000000;
          auVar247._8_4_ = -local_620._8_4_;
          auVar247._12_4_ = -local_620._12_4_;
          auVar247._16_4_ = -local_620._16_4_;
          auVar247._20_4_ = -local_620._20_4_;
          auVar247._24_4_ = -local_620._24_4_;
          auVar247._28_4_ = -local_620._28_4_;
          auVar28 = vsubps_avx(auVar247,auVar29);
          fVar353 = auVar28._0_4_ * fVar137;
          fVar355 = auVar28._4_4_ * fVar173;
          auVar82._4_4_ = fVar355;
          auVar82._0_4_ = fVar353;
          fVar420 = auVar28._8_4_ * fVar229;
          auVar82._8_4_ = fVar420;
          fVar254 = auVar28._12_4_ * fVar178;
          auVar82._12_4_ = fVar254;
          fVar256 = auVar28._16_4_ * fVar230;
          auVar82._16_4_ = fVar256;
          fVar258 = auVar28._20_4_ * fVar251;
          auVar82._20_4_ = fVar258;
          fVar394 = auVar28._24_4_ * fVar252;
          auVar82._24_4_ = fVar394;
          auVar82._28_4_ = 0x7f800000;
          auVar29 = vsubps_avx(auVar29,local_620);
          fVar137 = auVar29._0_4_ * fVar137;
          fVar173 = auVar29._4_4_ * fVar173;
          auVar83._4_4_ = fVar173;
          auVar83._0_4_ = fVar137;
          fVar229 = auVar29._8_4_ * fVar229;
          auVar83._8_4_ = fVar229;
          fVar178 = auVar29._12_4_ * fVar178;
          auVar83._12_4_ = fVar178;
          fVar230 = auVar29._16_4_ * fVar230;
          auVar83._16_4_ = fVar230;
          fVar251 = auVar29._20_4_ * fVar251;
          auVar83._20_4_ = fVar251;
          fVar252 = auVar29._24_4_ * fVar252;
          auVar83._24_4_ = fVar252;
          auVar83._28_4_ = fVar396;
          fVar255 = fVar278 * (fVar353 * local_540._0_4_ + (float)local_660._0_4_);
          fVar271 = fVar291 * (fVar355 * local_540._4_4_ + (float)local_660._4_4_);
          fVar272 = fVar293 * (fVar420 * local_540._8_4_ + fStack_658);
          fVar273 = fVar295 * (fVar254 * local_540._12_4_ + fStack_654);
          fVar274 = fVar296 * (fVar256 * local_540._16_4_ + fStack_650);
          fVar349 = fVar298 * (fVar258 * local_540._20_4_ + fStack_64c);
          fVar351 = fVar300 * (fVar394 * local_540._24_4_ + fStack_648);
          auVar158._0_4_ = local_900 + fVar203 * fVar255;
          auVar158._4_4_ = fStack_8fc + fVar234 * fVar271;
          auVar158._8_4_ = fStack_8f8 + fVar261 * fVar272;
          auVar158._12_4_ = fStack_8f4 + fVar347 * fVar273;
          auVar158._16_4_ = fStack_8f0 + fVar382 * fVar274;
          auVar158._20_4_ = fStack_8ec + fVar391 * fVar349;
          auVar158._24_4_ = fStack_8e8 + fVar406 * fVar351;
          auVar158._28_4_ = fStack_8e4 + auVar29._28_4_ + fStack_644;
          auVar84._4_4_ = (float)local_7e0._4_4_ * fVar355;
          auVar84._0_4_ = (float)local_7e0._0_4_ * fVar353;
          auVar84._8_4_ = fStack_7d8 * fVar420;
          auVar84._12_4_ = fStack_7d4 * fVar254;
          auVar84._16_4_ = fStack_7d0 * fVar256;
          auVar84._20_4_ = fStack_7cc * fVar258;
          auVar84._24_4_ = fStack_7c8 * fVar394;
          auVar84._28_4_ = fVar253;
          auVar157 = vsubps_avx(auVar84,auVar158);
          auVar226._0_4_ = fVar341 + fVar228 * fVar255;
          auVar226._4_4_ = fVar348 + fVar231 * fVar271;
          auVar226._8_4_ = fVar350 + fVar257 * fVar272;
          auVar226._12_4_ = fVar352 + fVar275 * fVar273;
          auVar226._16_4_ = fVar354 + fVar357 * fVar274;
          auVar226._20_4_ = fVar356 + fVar381 * fVar349;
          auVar226._24_4_ = fVar358 + fVar401 * fVar351;
          auVar226._28_4_ = fVar360 + fVar253;
          auVar287._0_4_ = (float)local_800._0_4_ * fVar353;
          auVar287._4_4_ = (float)local_800._4_4_ * fVar355;
          auVar287._8_4_ = fStack_7f8 * fVar420;
          auVar287._12_4_ = fStack_7f4 * fVar254;
          auVar287._16_4_ = fStack_7f0 * fVar256;
          auVar287._20_4_ = fStack_7ec * fVar258;
          auVar287._24_4_ = fStack_7e8 * fVar394;
          auVar287._28_4_ = 0;
          _local_a00 = vsubps_avx(auVar287,auVar226);
          auVar248._0_4_ = fVar177 + fVar170 * fVar255;
          auVar248._4_4_ = fVar197 + fVar232 * fVar271;
          auVar248._8_4_ = fVar198 + fVar259 * fVar272;
          auVar248._12_4_ = fVar199 + fVar276 * fVar273;
          auVar248._16_4_ = fVar200 + fVar380 * fVar274;
          auVar248._20_4_ = fVar201 + fVar390 * fVar349;
          auVar248._24_4_ = fVar202 + fVar403 * fVar351;
          auVar248._28_4_ = fVar204 + auVar28._28_4_;
          auVar85._4_4_ = (float)local_7a0._4_4_ * fVar355;
          auVar85._0_4_ = (float)local_7a0._0_4_ * fVar353;
          auVar85._8_4_ = fStack_798 * fVar420;
          auVar85._12_4_ = fStack_794 * fVar254;
          auVar85._16_4_ = fStack_790 * fVar256;
          auVar85._20_4_ = fStack_78c * fVar258;
          auVar85._24_4_ = fStack_788 * fVar394;
          auVar85._28_4_ = 0;
          auVar28 = vsubps_avx(auVar85,auVar248);
          auVar245 = auVar28._0_28_;
          fVar278 = fVar278 * (fVar137 * local_540._0_4_ + (float)local_660._0_4_);
          fVar291 = fVar291 * (fVar173 * local_540._4_4_ + (float)local_660._4_4_);
          fVar293 = fVar293 * (fVar229 * local_540._8_4_ + fStack_658);
          fVar295 = fVar295 * (fVar178 * local_540._12_4_ + fStack_654);
          fVar296 = fVar296 * (fVar230 * local_540._16_4_ + fStack_650);
          fVar298 = fVar298 * (fVar251 * local_540._20_4_ + fStack_64c);
          fVar300 = fVar300 * (fVar252 * local_540._24_4_ + fStack_648);
          auVar313._0_4_ = local_900 + fVar203 * fVar278;
          auVar313._4_4_ = fStack_8fc + fVar234 * fVar291;
          auVar313._8_4_ = fStack_8f8 + fVar261 * fVar293;
          auVar313._12_4_ = fStack_8f4 + fVar347 * fVar295;
          auVar313._16_4_ = fStack_8f0 + fVar382 * fVar296;
          auVar313._20_4_ = fStack_8ec + fVar391 * fVar298;
          auVar313._24_4_ = fStack_8e8 + fVar406 * fVar300;
          auVar313._28_4_ = fStack_8e4 + (float)local_600._28_4_;
          auVar86._4_4_ = (float)local_7e0._4_4_ * fVar173;
          auVar86._0_4_ = (float)local_7e0._0_4_ * fVar137;
          auVar86._8_4_ = fStack_7d8 * fVar229;
          auVar86._12_4_ = fStack_7d4 * fVar178;
          auVar86._16_4_ = fStack_7d0 * fVar230;
          auVar86._20_4_ = fStack_7cc * fVar251;
          auVar86._24_4_ = fStack_7c8 * fVar252;
          auVar86._28_4_ = fStack_7c4;
          _local_820 = vsubps_avx(auVar86,auVar313);
          auVar314._0_4_ = fVar341 + fVar228 * fVar278;
          auVar314._4_4_ = fVar348 + fVar231 * fVar291;
          auVar314._8_4_ = fVar350 + fVar257 * fVar293;
          auVar314._12_4_ = fVar352 + fVar275 * fVar295;
          auVar314._16_4_ = fVar354 + fVar357 * fVar296;
          auVar314._20_4_ = fVar356 + fVar381 * fVar298;
          auVar314._24_4_ = fVar358 + fVar401 * fVar300;
          auVar314._28_4_ = fVar360 + local_820._28_4_;
          auVar87._4_4_ = (float)local_800._4_4_ * fVar173;
          auVar87._0_4_ = (float)local_800._0_4_ * fVar137;
          auVar87._8_4_ = fStack_7f8 * fVar229;
          auVar87._12_4_ = fStack_7f4 * fVar178;
          auVar87._16_4_ = fStack_7f0 * fVar230;
          auVar87._20_4_ = fStack_7ec * fVar251;
          auVar87._24_4_ = fStack_7e8 * fVar252;
          auVar87._28_4_ = fStack_7c4;
          _local_840 = vsubps_avx(auVar87,auVar314);
          auVar288._0_4_ = fVar177 + fVar170 * fVar278;
          auVar288._4_4_ = fVar197 + fVar232 * fVar291;
          auVar288._8_4_ = fVar198 + fVar259 * fVar293;
          auVar288._12_4_ = fVar199 + fVar276 * fVar295;
          auVar288._16_4_ = fVar200 + fVar380 * fVar296;
          auVar288._20_4_ = fVar201 + fVar390 * fVar298;
          auVar288._24_4_ = fVar202 + fVar403 * fVar300;
          auVar288._28_4_ = fVar204 + fStack_644 + 0.0;
          auVar88._4_4_ = (float)local_7a0._4_4_ * fVar173;
          auVar88._0_4_ = (float)local_7a0._0_4_ * fVar137;
          auVar88._8_4_ = fStack_798 * fVar229;
          auVar88._12_4_ = fStack_794 * fVar178;
          auVar88._16_4_ = fStack_790 * fVar230;
          auVar88._20_4_ = fStack_78c * fVar251;
          auVar88._24_4_ = fStack_788 * fVar252;
          auVar88._28_4_ = local_840._28_4_;
          _local_860 = vsubps_avx(auVar88,auVar288);
          auVar29 = vcmpps_avx(auVar378,_DAT_01faff00,5);
          auVar289._8_4_ = 0x7f800000;
          auVar289._0_8_ = 0x7f8000007f800000;
          auVar289._12_4_ = 0x7f800000;
          auVar289._16_4_ = 0x7f800000;
          auVar289._20_4_ = 0x7f800000;
          auVar289._24_4_ = 0x7f800000;
          auVar289._28_4_ = 0x7f800000;
          auVar286 = vblendvps_avx(auVar289,auVar82,auVar29);
          auVar369._8_4_ = 0x7fffffff;
          auVar369._0_8_ = 0x7fffffff7fffffff;
          auVar369._12_4_ = 0x7fffffff;
          auVar369._16_4_ = 0x7fffffff;
          auVar369._20_4_ = 0x7fffffff;
          auVar369._24_4_ = 0x7fffffff;
          auVar369._28_4_ = 0x7fffffff;
          auVar28 = vandps_avx(auVar369,local_300);
          auVar28 = vmaxps_avx(local_500,auVar28);
          auVar378._8_4_ = 0x36000000;
          auVar378._0_8_ = 0x3600000036000000;
          auVar378._12_4_ = 0x36000000;
          auVar378._16_4_ = 0x36000000;
          auVar378._20_4_ = 0x36000000;
          auVar378._24_4_ = 0x36000000;
          auVar378._28_4_ = 0x36000000;
          auVar89._4_4_ = auVar28._4_4_ * 1.9073486e-06;
          auVar89._0_4_ = auVar28._0_4_ * 1.9073486e-06;
          auVar89._8_4_ = auVar28._8_4_ * 1.9073486e-06;
          auVar89._12_4_ = auVar28._12_4_ * 1.9073486e-06;
          auVar89._16_4_ = auVar28._16_4_ * 1.9073486e-06;
          auVar89._20_4_ = auVar28._20_4_ * 1.9073486e-06;
          auVar89._24_4_ = auVar28._24_4_ * 1.9073486e-06;
          auVar89._28_4_ = auVar28._28_4_;
          auVar28 = vandps_avx(auVar369,local_520);
          auVar28 = vcmpps_avx(auVar28,auVar89,1);
          auVar315._8_4_ = 0xff800000;
          auVar315._0_8_ = 0xff800000ff800000;
          auVar315._12_4_ = 0xff800000;
          auVar315._16_4_ = 0xff800000;
          auVar315._20_4_ = 0xff800000;
          auVar315._24_4_ = 0xff800000;
          auVar315._28_4_ = 0xff800000;
          auVar312 = vblendvps_avx(auVar315,auVar83,auVar29);
          auVar268 = auVar29 & auVar28;
          if ((((((((auVar268 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar268 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar268 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar268 >> 0x7f,0) != '\0') ||
                (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar268 >> 0xbf,0) != '\0') ||
              (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar268[0x1f] < '\0') {
            auVar164 = vandps_avx(auVar28,auVar29);
            auVar216 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
            auVar268 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar28 = vcmpps_avx(auVar27,auVar268,2);
            auVar439._8_4_ = 0xff800000;
            auVar439._0_8_ = 0xff800000ff800000;
            auVar439._12_4_ = 0xff800000;
            auVar439._16_4_ = 0xff800000;
            auVar439._20_4_ = 0xff800000;
            auVar439._24_4_ = 0xff800000;
            auVar439._28_4_ = 0xff800000;
            auVar447._8_4_ = 0x7f800000;
            auVar447._0_8_ = 0x7f8000007f800000;
            auVar447._12_4_ = 0x7f800000;
            auVar447._16_4_ = 0x7f800000;
            auVar447._20_4_ = 0x7f800000;
            auVar447._24_4_ = 0x7f800000;
            auVar447._28_4_ = 0x7f800000;
            auVar27 = vblendvps_avx(auVar447,auVar439,auVar28);
            auVar114 = vpmovsxwd_avx(auVar216);
            auVar216 = vpunpckhwd_avx(auVar216,auVar216);
            auVar370._16_16_ = auVar216;
            auVar370._0_16_ = auVar114;
            auVar286 = vblendvps_avx(auVar286,auVar27,auVar370);
            auVar378 = vblendvps_avx(auVar439,auVar447,auVar28);
            auVar312 = vblendvps_avx(auVar312,auVar378,auVar370);
            auVar27 = vcmpps_avx(auVar268,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar131._0_4_ = auVar27._0_4_ ^ auVar164._0_4_;
            auVar131._4_4_ = auVar27._4_4_ ^ auVar164._4_4_;
            auVar131._8_4_ = auVar27._8_4_ ^ auVar164._8_4_;
            auVar131._12_4_ = auVar27._12_4_ ^ auVar164._12_4_;
            auVar131._16_4_ = auVar27._16_4_ ^ auVar164._16_4_;
            auVar131._20_4_ = auVar27._20_4_ ^ auVar164._20_4_;
            auVar131._24_4_ = auVar27._24_4_ ^ auVar164._24_4_;
            auVar131._28_4_ = auVar27._28_4_ ^ auVar164._28_4_;
            auVar164 = vorps_avx(auVar28,auVar131);
            auVar164 = vandps_avx(auVar29,auVar164);
          }
          auVar219 = local_a00._0_28_;
          _local_a40 = auVar119;
        }
        auVar379 = ZEXT3264(auVar378);
        _local_380 = _local_7c0;
        local_360 = vminps_avx(local_320,auVar286);
        local_340 = vmaxps_avx(_local_7c0,auVar312);
        auVar27 = vcmpps_avx(_local_7c0,local_360,2);
        local_5a0 = vandps_avx(auVar27,auVar119);
        auVar27 = vcmpps_avx(local_340,local_320,2);
        local_5c0 = vandps_avx(auVar27,auVar119);
        auVar119 = vorps_avx(local_5c0,local_5a0);
        auVar339 = ZEXT1664(auVar180);
        if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar119 >> 0x7f,0) != '\0') ||
              (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar119 >> 0xbf,0) != '\0') ||
            (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar119[0x1f] < '\0') {
          _local_680 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_5e0._0_4_ = auVar164._0_4_ ^ local_680._0_4_;
          local_5e0._4_4_ = auVar164._4_4_ ^ local_680._4_4_;
          local_5e0._8_4_ = auVar164._8_4_ ^ local_680._8_4_;
          local_5e0._12_4_ = auVar164._12_4_ ^ local_680._12_4_;
          local_5e0._16_4_ = auVar164._16_4_ ^ local_680._16_4_;
          local_5e0._20_4_ = auVar164._20_4_ ^ local_680._20_4_;
          local_5e0._24_4_ = auVar164._24_4_ ^ local_680._24_4_;
          local_5e0._28_4_ = (uint)auVar164._28_4_ ^ (uint)local_680._28_4_;
          auVar125._0_4_ =
               auVar157._0_4_ * (float)local_7e0._0_4_ +
               auVar219._0_4_ * (float)local_800._0_4_ + (float)local_7a0._0_4_ * auVar245._0_4_;
          auVar125._4_4_ =
               auVar157._4_4_ * (float)local_7e0._4_4_ +
               auVar219._4_4_ * (float)local_800._4_4_ + (float)local_7a0._4_4_ * auVar245._4_4_;
          auVar125._8_4_ =
               auVar157._8_4_ * fStack_7d8 +
               auVar219._8_4_ * fStack_7f8 + fStack_798 * auVar245._8_4_;
          auVar125._12_4_ =
               auVar157._12_4_ * fStack_7d4 +
               auVar219._12_4_ * fStack_7f4 + fStack_794 * auVar245._12_4_;
          auVar125._16_4_ =
               auVar157._16_4_ * fStack_7d0 +
               auVar219._16_4_ * fStack_7f0 + fStack_790 * auVar245._16_4_;
          auVar125._20_4_ =
               auVar157._20_4_ * fStack_7cc +
               auVar219._20_4_ * fStack_7ec + fStack_78c * auVar245._20_4_;
          auVar125._24_4_ =
               auVar157._24_4_ * fStack_7c8 +
               auVar219._24_4_ * fStack_7e8 + fStack_788 * auVar245._24_4_;
          auVar125._28_4_ = auVar164._28_4_ + auVar157._28_4_ + local_680._28_4_;
          auVar159._8_4_ = 0x7fffffff;
          auVar159._0_8_ = 0x7fffffff7fffffff;
          auVar159._12_4_ = 0x7fffffff;
          auVar159._16_4_ = 0x7fffffff;
          auVar159._20_4_ = 0x7fffffff;
          auVar159._24_4_ = 0x7fffffff;
          auVar159._28_4_ = 0x7fffffff;
          auVar119 = vandps_avx(auVar125,auVar159);
          auVar160._8_4_ = 0x3e99999a;
          auVar160._0_8_ = 0x3e99999a3e99999a;
          auVar160._12_4_ = 0x3e99999a;
          auVar160._16_4_ = 0x3e99999a;
          auVar160._20_4_ = 0x3e99999a;
          auVar160._24_4_ = 0x3e99999a;
          auVar160._28_4_ = 0x3e99999a;
          auVar119 = vcmpps_avx(auVar119,auVar160,1);
          auVar119 = vorps_avx(auVar119,local_5e0);
          auVar161._8_4_ = 3;
          auVar161._0_8_ = 0x300000003;
          auVar161._12_4_ = 3;
          auVar161._16_4_ = 3;
          auVar161._20_4_ = 3;
          auVar161._24_4_ = 3;
          auVar161._28_4_ = 3;
          auVar191._8_4_ = 2;
          auVar191._0_8_ = 0x200000002;
          auVar191._12_4_ = 2;
          auVar191._16_4_ = 2;
          auVar191._20_4_ = 2;
          auVar191._24_4_ = 2;
          auVar191._28_4_ = 2;
          auVar119 = vblendvps_avx(auVar191,auVar161,auVar119);
          local_600 = ZEXT432(local_c28);
          auVar114 = vpshufd_avx(ZEXT416(local_c28),0);
          auVar216 = vpcmpgtd_avx(auVar119._16_16_,auVar114);
          local_620._0_16_ = auVar114;
          auVar114 = vpcmpgtd_avx(auVar119._0_16_,auVar114);
          auVar162._16_16_ = auVar216;
          auVar162._0_16_ = auVar114;
          _local_660 = vblendps_avx(ZEXT1632(auVar114),auVar162,0xf0);
          local_580 = vandnps_avx(_local_660,local_5a0);
          auVar339 = ZEXT3264(local_580);
          auVar119 = local_5a0 & ~_local_660;
          local_ab0 = auVar12._0_4_;
          fStack_aac = auVar12._4_4_;
          fStack_aa8 = auVar12._8_4_;
          fStack_aa4 = auVar12._12_4_;
          local_a90 = auVar10._0_4_;
          fStack_a8c = auVar10._4_4_;
          fStack_a88 = auVar10._8_4_;
          fStack_a84 = auVar10._12_4_;
          local_aa0 = auVar11._0_4_;
          fStack_a9c = auVar11._4_4_;
          fStack_a98 = auVar11._8_4_;
          fStack_a94 = auVar11._12_4_;
          local_a80 = auVar34._0_4_;
          fStack_a7c = auVar34._4_4_;
          fStack_a78 = auVar34._8_4_;
          fStack_a74 = auVar34._12_4_;
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar119 >> 0x7f,0) == '\0') &&
                (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar119 >> 0xbf,0) == '\0') &&
              (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar119[0x1f]) {
            auVar216 = vshufps_avx(auVar180,auVar180,0);
            auVar126._16_16_ = auVar216;
            auVar126._0_16_ = auVar216;
            auVar245 = local_7e0._0_28_;
            auVar119 = local_340;
          }
          else {
            local_920._4_4_ = (float)local_7c0._4_4_ + (float)local_8e0._4_4_;
            local_920._0_4_ = (float)local_7c0._0_4_ + (float)local_8e0._0_4_;
            fStack_918 = fStack_7b8 + fStack_8d8;
            fStack_914 = fStack_7b4 + fStack_8d4;
            fStack_910 = fStack_7b0 + fStack_8d0;
            fStack_90c = fStack_7ac + fStack_8cc;
            fStack_908 = fStack_7a8 + fStack_8c8;
            fStack_904 = fStack_7a4 + fStack_8c4;
            local_640 = local_340;
            do {
              auVar127._8_4_ = 0x7f800000;
              auVar127._0_8_ = 0x7f8000007f800000;
              auVar127._12_4_ = 0x7f800000;
              auVar127._16_4_ = 0x7f800000;
              auVar127._20_4_ = 0x7f800000;
              auVar127._24_4_ = 0x7f800000;
              auVar127._28_4_ = 0x7f800000;
              auVar119 = auVar339._0_32_;
              auVar164 = vblendvps_avx(auVar127,_local_7c0,auVar119);
              auVar27 = vshufps_avx(auVar164,auVar164,0xb1);
              auVar27 = vminps_avx(auVar164,auVar27);
              auVar28 = vshufpd_avx(auVar27,auVar27,5);
              auVar27 = vminps_avx(auVar27,auVar28);
              auVar28 = vperm2f128_avx(auVar27,auVar27,1);
              auVar27 = vminps_avx(auVar27,auVar28);
              auVar164 = vcmpps_avx(auVar164,auVar27,0);
              auVar27 = auVar119 & auVar164;
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0x7f,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0xbf,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar27[0x1f] < '\0') {
                auVar119 = vandps_avx(auVar164,auVar119);
              }
              uVar97 = vmovmskps_avx(auVar119);
              uVar100 = 0;
              if (uVar97 != 0) {
                for (; (uVar97 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
                }
              }
              uVar98 = (ulong)uVar100;
              *(undefined4 *)(local_580 + uVar98 * 4) = 0;
              fVar137 = local_1a0[uVar98];
              uVar100 = *(uint *)(local_380 + uVar98 * 4);
              fVar228 = auVar33._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                fVar228 = sqrtf((float)local_940._0_4_);
              }
              auVar180 = vminps_avx(auVar34,auVar11);
              auVar216 = vmaxps_avx(auVar34,auVar11);
              auVar114 = vminps_avx(auVar10,auVar12);
              auVar147 = vminps_avx(auVar180,auVar114);
              auVar180 = vmaxps_avx(auVar10,auVar12);
              auVar114 = vmaxps_avx(auVar216,auVar180);
              auVar208._8_4_ = 0x7fffffff;
              auVar208._0_8_ = 0x7fffffff7fffffff;
              auVar208._12_4_ = 0x7fffffff;
              auVar216 = vandps_avx(auVar147,auVar208);
              auVar180 = vandps_avx(auVar114,auVar208);
              auVar216 = vmaxps_avx(auVar216,auVar180);
              auVar180 = vmovshdup_avx(auVar216);
              auVar180 = vmaxss_avx(auVar180,auVar216);
              auVar216 = vshufpd_avx(auVar216,auVar216,1);
              auVar216 = vmaxss_avx(auVar216,auVar180);
              local_900 = auVar216._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar228 * 1.9073486e-06;
              local_780._0_16_ = vshufps_avx(auVar114,auVar114,0xff);
              auVar216 = vinsertps_avx(ZEXT416(uVar100),ZEXT416((uint)fVar137),0x10);
              auVar379 = ZEXT1664(auVar216);
              lVar103 = 5;
              do {
                auVar371 = auVar379._0_16_;
                auVar216 = vshufps_avx(auVar371,auVar371,0);
                auVar110._0_4_ = auVar216._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar110._4_4_ = auVar216._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar110._8_4_ = auVar216._8_4_ * fStack_928 + 0.0;
                auVar110._12_4_ = auVar216._12_4_ * fStack_924 + 0.0;
                auVar216 = vmovshdup_avx(auVar371);
                fVar229 = auVar216._0_4_;
                fVar203 = 1.0 - fVar229;
                fVar228 = fVar229 * fVar229;
                fVar170 = fVar229 * 3.0;
                fVar137 = fVar170 + -5.0;
                auVar216 = ZEXT416((uint)(fVar229 * fVar229 * -fVar203 * 0.5));
                auVar216 = vshufps_avx(auVar216,auVar216,0);
                auVar180 = ZEXT416((uint)((fVar203 * fVar203 * (fVar203 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar180 = vshufps_avx(auVar180,auVar180,0);
                auVar114 = ZEXT416((uint)((fVar228 * fVar137 + 2.0) * 0.5));
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                auVar147 = ZEXT416((uint)(fVar203 * fVar203 * -fVar229 * 0.5));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar181._0_4_ =
                     auVar147._0_4_ * local_a80 +
                     auVar114._0_4_ * local_aa0 +
                     auVar180._0_4_ * local_a90 + auVar216._0_4_ * local_ab0;
                auVar181._4_4_ =
                     auVar147._4_4_ * fStack_a7c +
                     auVar114._4_4_ * fStack_a9c +
                     auVar180._4_4_ * fStack_a8c + auVar216._4_4_ * fStack_aac;
                auVar181._8_4_ =
                     auVar147._8_4_ * fStack_a78 +
                     auVar114._8_4_ * fStack_a98 +
                     auVar180._8_4_ * fStack_a88 + auVar216._8_4_ * fStack_aa8;
                auVar181._12_4_ =
                     auVar147._12_4_ * fStack_a74 +
                     auVar114._12_4_ * fStack_a94 +
                     auVar180._12_4_ * fStack_a84 + auVar216._12_4_ * fStack_aa4;
                _local_a00 = auVar181;
                auVar216 = vsubps_avx(auVar110,auVar181);
                _local_a40 = auVar216;
                auVar216 = vdpps_avx(auVar216,auVar216,0x7f);
                fVar173 = auVar216._0_4_;
                if (fVar173 < 0.0) {
                  local_960._0_4_ = fVar228;
                  local_9a0._0_4_ = fVar170;
                  local_9c0._0_4_ = fVar229 * 9.0;
                  local_9e0._0_4_ = fVar137;
                  local_760._0_4_ = fVar203 * -2.0;
                  fVar178 = sqrtf(fVar173);
                  fVar231 = (float)local_9c0._0_4_;
                  fVar230 = (float)local_760._0_4_;
                  fVar228 = (float)local_9a0._0_4_;
                  fVar137 = (float)local_9e0._0_4_;
                }
                else {
                  auVar180 = vsqrtss_avx(auVar216,auVar216);
                  fVar178 = auVar180._0_4_;
                  fVar231 = fVar229 * 9.0;
                  fVar230 = fVar203 * -2.0;
                  local_960._0_4_ = fVar228;
                  fVar228 = fVar170;
                }
                auVar180 = ZEXT416((uint)(((float)local_960._0_4_ + fVar229 * fVar230) * 0.5));
                auVar180 = vshufps_avx(auVar180,auVar180,0);
                auVar114 = ZEXT416((uint)(((fVar203 + fVar203) * (fVar228 + 2.0) +
                                          fVar203 * fVar203 * -3.0) * 0.5));
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                auVar147 = ZEXT416((uint)((fVar137 * (fVar229 + fVar229) + fVar229 * fVar228) * 0.5)
                                  );
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar148 = ZEXT416((uint)((fVar229 * (fVar203 + fVar203) - fVar203 * fVar203) * 0.5)
                                  );
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                auVar361._0_4_ =
                     local_a80 * auVar148._0_4_ +
                     local_aa0 * auVar147._0_4_ +
                     local_ab0 * auVar180._0_4_ + local_a90 * auVar114._0_4_;
                auVar361._4_4_ =
                     fStack_a7c * auVar148._4_4_ +
                     fStack_a9c * auVar147._4_4_ +
                     fStack_aac * auVar180._4_4_ + fStack_a8c * auVar114._4_4_;
                auVar361._8_4_ =
                     fStack_a78 * auVar148._8_4_ +
                     fStack_a98 * auVar147._8_4_ +
                     fStack_aa8 * auVar180._8_4_ + fStack_a88 * auVar114._8_4_;
                auVar361._12_4_ =
                     fStack_a74 * auVar148._12_4_ +
                     fStack_a94 * auVar147._12_4_ +
                     fStack_aa4 * auVar180._12_4_ + fStack_a84 * auVar114._12_4_;
                auVar148 = vpermilps_avx(ZEXT416((uint)(fVar170 + -1.0)),0);
                auVar13 = vpermilps_avx(ZEXT416((uint)(fVar229 * -9.0 + 4.0)),0);
                auVar180 = vshufps_avx(ZEXT416((uint)(fVar231 + -5.0)),
                                       ZEXT416((uint)(fVar231 + -5.0)),0);
                auVar114 = ZEXT416((uint)(fVar229 * -3.0 + 2.0));
                auVar147 = vshufps_avx(auVar114,auVar114,0);
                auVar114 = vdpps_avx(auVar361,auVar361,0x7f);
                auVar142._0_4_ =
                     local_a80 * auVar147._0_4_ +
                     local_aa0 * auVar180._0_4_ +
                     local_a90 * auVar13._0_4_ + local_ab0 * auVar148._0_4_;
                auVar142._4_4_ =
                     fStack_a7c * auVar147._4_4_ +
                     fStack_a9c * auVar180._4_4_ +
                     fStack_a8c * auVar13._4_4_ + fStack_aac * auVar148._4_4_;
                auVar142._8_4_ =
                     fStack_a78 * auVar147._8_4_ +
                     fStack_a98 * auVar180._8_4_ +
                     fStack_a88 * auVar13._8_4_ + fStack_aa8 * auVar148._8_4_;
                auVar142._12_4_ =
                     fStack_a74 * auVar147._12_4_ +
                     fStack_a94 * auVar180._12_4_ +
                     fStack_a84 * auVar13._12_4_ + fStack_aa4 * auVar148._12_4_;
                auVar180 = vblendps_avx(auVar114,_DAT_01f7aa10,0xe);
                auVar147 = vrsqrtss_avx(auVar180,auVar180);
                fVar228 = auVar147._0_4_;
                fVar137 = auVar114._0_4_;
                auVar147 = vdpps_avx(auVar361,auVar142,0x7f);
                auVar148 = vshufps_avx(auVar114,auVar114,0);
                auVar143._0_4_ = auVar142._0_4_ * auVar148._0_4_;
                auVar143._4_4_ = auVar142._4_4_ * auVar148._4_4_;
                auVar143._8_4_ = auVar142._8_4_ * auVar148._8_4_;
                auVar143._12_4_ = auVar142._12_4_ * auVar148._12_4_;
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar237._0_4_ = auVar361._0_4_ * auVar147._0_4_;
                auVar237._4_4_ = auVar361._4_4_ * auVar147._4_4_;
                auVar237._8_4_ = auVar361._8_4_ * auVar147._8_4_;
                auVar237._12_4_ = auVar361._12_4_ * auVar147._12_4_;
                auVar13 = vsubps_avx(auVar143,auVar237);
                auVar147 = vrcpss_avx(auVar180,auVar180);
                auVar180 = vmaxss_avx(ZEXT416((uint)local_900),
                                      ZEXT416((uint)(auVar379._0_4_ * (float)local_980._0_4_)));
                auVar147 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - fVar137 * auVar147._0_4_)));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                uVar98 = CONCAT44(auVar361._4_4_,auVar361._0_4_);
                auVar303._0_8_ = uVar98 ^ 0x8000000080000000;
                auVar303._8_4_ = -auVar361._8_4_;
                auVar303._12_4_ = -auVar361._12_4_;
                auVar148 = ZEXT416((uint)(fVar228 * 1.5 +
                                         fVar137 * -0.5 * fVar228 * fVar228 * fVar228));
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                auVar209._0_4_ = auVar148._0_4_ * auVar13._0_4_ * auVar147._0_4_;
                auVar209._4_4_ = auVar148._4_4_ * auVar13._4_4_ * auVar147._4_4_;
                auVar209._8_4_ = auVar148._8_4_ * auVar13._8_4_ * auVar147._8_4_;
                auVar209._12_4_ = auVar148._12_4_ * auVar13._12_4_ * auVar147._12_4_;
                local_960._0_4_ = auVar361._0_4_ * auVar148._0_4_;
                local_960._4_4_ = auVar361._4_4_ * auVar148._4_4_;
                local_960._8_4_ = auVar361._8_4_ * auVar148._8_4_;
                local_960._12_4_ = auVar361._12_4_ * auVar148._12_4_;
                if (fVar137 < 0.0) {
                  fVar137 = sqrtf(fVar137);
                }
                else {
                  auVar114 = vsqrtss_avx(auVar114,auVar114);
                  fVar137 = auVar114._0_4_;
                }
                auVar114 = vdpps_avx(_local_a40,local_960._0_16_,0x7f);
                fVar137 = (local_900 / fVar137) * (fVar178 + 1.0) +
                          auVar180._0_4_ + fVar178 * local_900;
                auVar147 = vdpps_avx(auVar303,local_960._0_16_,0x7f);
                auVar148 = vdpps_avx(_local_a40,auVar209,0x7f);
                auVar13 = vdpps_avx(_local_930,local_960._0_16_,0x7f);
                auVar14 = vdpps_avx(_local_a40,auVar303,0x7f);
                fVar228 = auVar147._0_4_ + auVar148._0_4_;
                fVar170 = auVar114._0_4_;
                auVar111._0_4_ = fVar170 * fVar170;
                auVar111._4_4_ = auVar114._4_4_ * auVar114._4_4_;
                auVar111._8_4_ = auVar114._8_4_ * auVar114._8_4_;
                auVar111._12_4_ = auVar114._12_4_ * auVar114._12_4_;
                auVar148 = vsubps_avx(auVar216,auVar111);
                local_960._0_16_ = ZEXT416((uint)fVar228);
                auVar147 = vdpps_avx(_local_a40,_local_930,0x7f);
                fVar203 = auVar14._0_4_ - fVar170 * fVar228;
                fVar170 = auVar147._0_4_ - fVar170 * auVar13._0_4_;
                auVar147 = vrsqrtss_avx(auVar148,auVar148);
                fVar229 = auVar148._0_4_;
                fVar228 = auVar147._0_4_;
                fVar228 = fVar228 * 1.5 + fVar229 * -0.5 * fVar228 * fVar228 * fVar228;
                if (fVar229 < 0.0) {
                  local_9a0._0_4_ = fVar203;
                  local_9c0._0_4_ = fVar170;
                  local_9e0._0_4_ = fVar228;
                  fVar229 = sqrtf(fVar229);
                  fVar228 = (float)local_9e0._0_4_;
                  fVar203 = (float)local_9a0._0_4_;
                  fVar170 = (float)local_9c0._0_4_;
                }
                else {
                  auVar147 = vsqrtss_avx(auVar148,auVar148);
                  fVar229 = auVar147._0_4_;
                }
                auVar14 = vpermilps_avx(_local_a00,0xff);
                auVar15 = vshufps_avx(auVar361,auVar361,0xff);
                fVar203 = fVar203 * fVar228 - auVar15._0_4_;
                auVar238._0_8_ = auVar13._0_8_ ^ 0x8000000080000000;
                auVar238._8_4_ = auVar13._8_4_ ^ 0x80000000;
                auVar238._12_4_ = auVar13._12_4_ ^ 0x80000000;
                auVar264._0_4_ = -fVar203;
                auVar264._4_4_ = 0x80000000;
                auVar264._8_4_ = 0x80000000;
                auVar264._12_4_ = 0x80000000;
                auVar147 = vinsertps_avx(auVar264,ZEXT416((uint)(fVar170 * fVar228)),0x1c);
                auVar13 = vmovsldup_avx(ZEXT416((uint)(local_960._0_4_ * fVar170 * fVar228 -
                                                      auVar13._0_4_ * fVar203)));
                auVar147 = vdivps_avx(auVar147,auVar13);
                auVar148 = vinsertps_avx(local_960._0_16_,auVar238,0x10);
                auVar148 = vdivps_avx(auVar148,auVar13);
                auVar13 = vmovsldup_avx(auVar114);
                auVar116 = ZEXT416((uint)(fVar229 - auVar14._0_4_));
                auVar14 = vmovsldup_avx(auVar116);
                auVar182._0_4_ = auVar13._0_4_ * auVar147._0_4_ + auVar14._0_4_ * auVar148._0_4_;
                auVar182._4_4_ = auVar13._4_4_ * auVar147._4_4_ + auVar14._4_4_ * auVar148._4_4_;
                auVar182._8_4_ = auVar13._8_4_ * auVar147._8_4_ + auVar14._8_4_ * auVar148._8_4_;
                auVar182._12_4_ =
                     auVar13._12_4_ * auVar147._12_4_ + auVar14._12_4_ * auVar148._12_4_;
                auVar147 = vsubps_avx(auVar371,auVar182);
                auVar379 = ZEXT1664(auVar147);
                auVar183._8_4_ = 0x7fffffff;
                auVar183._0_8_ = 0x7fffffff7fffffff;
                auVar183._12_4_ = 0x7fffffff;
                auVar114 = vandps_avx(auVar114,auVar183);
                if (auVar114._0_4_ < fVar137) {
                  auVar210._8_4_ = 0x7fffffff;
                  auVar210._0_8_ = 0x7fffffff7fffffff;
                  auVar210._12_4_ = 0x7fffffff;
                  auVar114 = vandps_avx(auVar116,auVar210);
                  if (auVar114._0_4_ <
                      (float)local_780._0_4_ * 1.9073486e-06 + auVar180._0_4_ + fVar137) {
                    fVar137 = auVar147._0_4_ + (float)local_890._0_4_;
                    if ((fVar205 <= fVar137) &&
                       (fVar228 = *(float *)(ray + k * 4 + 0x80), fVar137 <= fVar228)) {
                      auVar180 = vmovshdup_avx(auVar147);
                      fVar170 = auVar180._0_4_;
                      if ((0.0 <= fVar170) && (fVar170 <= 1.0)) {
                        auVar216 = vrsqrtss_avx(auVar216,auVar216);
                        fVar203 = auVar216._0_4_;
                        pGVar23 = (context->scene->geometries).items[uVar101].ptr;
                        if ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          auVar216 = ZEXT416((uint)(fVar203 * 1.5 +
                                                   fVar173 * -0.5 * fVar203 * fVar203 * fVar203));
                          auVar216 = vshufps_avx(auVar216,auVar216,0);
                          auVar211._0_4_ = auVar216._0_4_ * (float)local_a40._0_4_;
                          auVar211._4_4_ = auVar216._4_4_ * (float)local_a40._4_4_;
                          auVar211._8_4_ = auVar216._8_4_ * fStack_a38;
                          auVar211._12_4_ = auVar216._12_4_ * fStack_a34;
                          auVar144._0_4_ = auVar361._0_4_ + auVar15._0_4_ * auVar211._0_4_;
                          auVar144._4_4_ = auVar361._4_4_ + auVar15._4_4_ * auVar211._4_4_;
                          auVar144._8_4_ = auVar361._8_4_ + auVar15._8_4_ * auVar211._8_4_;
                          auVar144._12_4_ = auVar361._12_4_ + auVar15._12_4_ * auVar211._12_4_;
                          auVar216 = vshufps_avx(auVar211,auVar211,0xc9);
                          auVar180 = vshufps_avx(auVar361,auVar361,0xc9);
                          auVar212._0_4_ = auVar180._0_4_ * auVar211._0_4_;
                          auVar212._4_4_ = auVar180._4_4_ * auVar211._4_4_;
                          auVar212._8_4_ = auVar180._8_4_ * auVar211._8_4_;
                          auVar212._12_4_ = auVar180._12_4_ * auVar211._12_4_;
                          auVar239._0_4_ = auVar361._0_4_ * auVar216._0_4_;
                          auVar239._4_4_ = auVar361._4_4_ * auVar216._4_4_;
                          auVar239._8_4_ = auVar361._8_4_ * auVar216._8_4_;
                          auVar239._12_4_ = auVar361._12_4_ * auVar216._12_4_;
                          auVar114 = vsubps_avx(auVar239,auVar212);
                          auVar216 = vshufps_avx(auVar114,auVar114,0xc9);
                          auVar180 = vshufps_avx(auVar144,auVar144,0xc9);
                          auVar240._0_4_ = auVar180._0_4_ * auVar216._0_4_;
                          auVar240._4_4_ = auVar180._4_4_ * auVar216._4_4_;
                          auVar240._8_4_ = auVar180._8_4_ * auVar216._8_4_;
                          auVar240._12_4_ = auVar180._12_4_ * auVar216._12_4_;
                          auVar216 = vshufps_avx(auVar114,auVar114,0xd2);
                          auVar145._0_4_ = auVar144._0_4_ * auVar216._0_4_;
                          auVar145._4_4_ = auVar144._4_4_ * auVar216._4_4_;
                          auVar145._8_4_ = auVar144._8_4_ * auVar216._8_4_;
                          auVar145._12_4_ = auVar144._12_4_ * auVar216._12_4_;
                          auVar216 = vsubps_avx(auVar240,auVar145);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar23->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar137;
                            uVar8 = vextractps_avx(auVar216,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                            uVar8 = vextractps_avx(auVar216,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                            *(int *)(ray + k * 4 + 0xe0) = auVar216._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar170;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_a08;
                            *(uint *)(ray + k * 4 + 0x120) = uVar101;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_6f0 = vshufps_avx(auVar147,auVar147,0x55);
                            auVar180 = vshufps_avx(auVar216,auVar216,0x55);
                            auStack_710 = vshufps_avx(auVar216,auVar216,0xaa);
                            local_700 = vshufps_avx(auVar216,auVar216,0);
                            local_720 = (RTCHitN  [16])auVar180;
                            local_6e0 = ZEXT816(0) << 0x20;
                            local_6d0 = local_740._0_8_;
                            uStack_6c8 = local_740._8_8_;
                            local_6c0 = local_730._0_8_;
                            uStack_6b8 = local_730._8_8_;
                            uVar100 = context->user->instID[0];
                            _local_6b0 = CONCAT44(uVar100,uVar100);
                            _uStack_6a8 = CONCAT44(uVar100,uVar100);
                            uVar100 = context->user->instPrimID[0];
                            auVar146._4_4_ = uVar100;
                            auVar146._0_4_ = uVar100;
                            auVar146._8_4_ = uVar100;
                            auVar146._12_4_ = uVar100;
                            auStack_6a0 = auVar146;
                            *(float *)(ray + k * 4 + 0x80) = fVar137;
                            local_8c0._0_16_ = *local_a10;
                            local_a70.valid = (int *)local_8c0;
                            local_a70.geometryUserPtr = pGVar23->userPtr;
                            local_a70.context = context->user;
                            local_a70.hit = local_720;
                            local_a70.N = 4;
                            auVar216 = *local_a10;
                            local_a70.ray = (RTCRayN *)ray;
                            if (pGVar23->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar379 = ZEXT1664(auVar147);
                              (*pGVar23->intersectionFilterN)(&local_a70);
                              auVar339._8_56_ = extraout_var;
                              auVar339._0_8_ = extraout_XMM1_Qa;
                              auVar146 = auVar339._0_16_;
                              auVar216 = local_8c0._0_16_;
                            }
                            if (auVar216 == (undefined1  [16])0x0) {
                              auVar180 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar216 = vpcmpeqd_avx(auVar146,auVar146);
                              auVar180 = auVar180 ^ auVar216;
                            }
                            else {
                              p_Var26 = context->args->filter;
                              auVar114 = vpcmpeqd_avx(auVar180,auVar180);
                              if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar23->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar379 = ZEXT1664(auVar379._0_16_);
                                (*p_Var26)(&local_a70);
                                auVar114 = vpcmpeqd_avx(auVar114,auVar114);
                                auVar216 = local_8c0._0_16_;
                              }
                              auVar147 = vpcmpeqd_avx(auVar216,_DAT_01f7aa10);
                              auVar180 = auVar147 ^ auVar114;
                              if (auVar216 != (undefined1  [16])0x0) {
                                auVar147 = auVar147 ^ auVar114;
                                auVar216 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                    local_a70.hit);
                                *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar216;
                                auVar216 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x10));
                                *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar216;
                                auVar216 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x20));
                                *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar216;
                                auVar216 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x30));
                                *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar216;
                                auVar216 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x40));
                                *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar216;
                                auVar216 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x50));
                                *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar216;
                                auVar216 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x60));
                                *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar216;
                                auVar216 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x70));
                                *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar216;
                                auVar216 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x80));
                                *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar216;
                              }
                            }
                            auVar112._8_8_ = 0x100000001;
                            auVar112._0_8_ = 0x100000001;
                            if ((auVar112 & auVar180) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar228;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar103 = lVar103 + -1;
              } while (lVar103 != 0);
              auVar164 = local_580;
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar126._4_4_ = uVar8;
              auVar126._0_4_ = uVar8;
              auVar126._8_4_ = uVar8;
              auVar126._12_4_ = uVar8;
              auVar126._16_4_ = uVar8;
              auVar126._20_4_ = uVar8;
              auVar126._24_4_ = uVar8;
              auVar126._28_4_ = uVar8;
              auVar119 = vcmpps_avx(_local_920,auVar126,2);
              local_580 = vandps_avx(auVar119,local_580);
              auVar339 = ZEXT3264(local_580);
              auVar164 = auVar164 & auVar119;
              auVar245 = local_7e0._0_28_;
            } while ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar164 >> 0x7f,0) != '\0') ||
                       (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar164 >> 0xbf,0) != '\0') ||
                     (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar164[0x1f] < '\0');
            auVar339 = ZEXT3264(local_340);
            auVar119 = local_640;
          }
          auVar163._0_4_ =
               auVar245._0_4_ * (float)local_820._0_4_ +
               (float)local_800._0_4_ * (float)local_840._0_4_ +
               (float)local_7a0._0_4_ * (float)local_860._0_4_;
          auVar163._4_4_ =
               auVar245._4_4_ * (float)local_820._4_4_ +
               (float)local_800._4_4_ * (float)local_840._4_4_ +
               (float)local_7a0._4_4_ * (float)local_860._4_4_;
          auVar163._8_4_ =
               auVar245._8_4_ * fStack_818 + fStack_7f8 * fStack_838 + fStack_798 * fStack_858;
          auVar163._12_4_ =
               auVar245._12_4_ * fStack_814 + fStack_7f4 * fStack_834 + fStack_794 * fStack_854;
          auVar163._16_4_ =
               auVar245._16_4_ * fStack_810 + fStack_7f0 * fStack_830 + fStack_790 * fStack_850;
          auVar163._20_4_ =
               auVar245._20_4_ * fStack_80c + fStack_7ec * fStack_82c + fStack_78c * fStack_84c;
          auVar163._24_4_ =
               auVar245._24_4_ * fStack_808 + fStack_7e8 * fStack_828 + fStack_788 * fStack_848;
          auVar163._28_4_ = fStack_7e4 + fStack_7e4 + auVar339._28_4_;
          auVar192._8_4_ = 0x7fffffff;
          auVar192._0_8_ = 0x7fffffff7fffffff;
          auVar192._12_4_ = 0x7fffffff;
          auVar192._16_4_ = 0x7fffffff;
          auVar192._20_4_ = 0x7fffffff;
          auVar192._24_4_ = 0x7fffffff;
          auVar192._28_4_ = 0x7fffffff;
          auVar164 = vandps_avx(auVar163,auVar192);
          auVar193._8_4_ = 0x3e99999a;
          auVar193._0_8_ = 0x3e99999a3e99999a;
          auVar193._12_4_ = 0x3e99999a;
          auVar193._16_4_ = 0x3e99999a;
          auVar193._20_4_ = 0x3e99999a;
          auVar193._24_4_ = 0x3e99999a;
          auVar193._28_4_ = 0x3e99999a;
          auVar164 = vcmpps_avx(auVar164,auVar193,1);
          auVar164 = vorps_avx(auVar164,local_5e0);
          auVar194._0_4_ = (float)local_8e0._0_4_ + auVar119._0_4_;
          auVar194._4_4_ = (float)local_8e0._4_4_ + auVar119._4_4_;
          auVar194._8_4_ = fStack_8d8 + auVar119._8_4_;
          auVar194._12_4_ = fStack_8d4 + auVar119._12_4_;
          auVar194._16_4_ = fStack_8d0 + auVar119._16_4_;
          auVar194._20_4_ = fStack_8cc + auVar119._20_4_;
          auVar194._24_4_ = fStack_8c8 + auVar119._24_4_;
          auVar194._28_4_ = fStack_8c4 + auVar119._28_4_;
          auVar119 = vcmpps_avx(auVar194,auVar126,2);
          _local_860 = vandps_avx(auVar119,local_5c0);
          auVar195._8_4_ = 3;
          auVar195._0_8_ = 0x300000003;
          auVar195._12_4_ = 3;
          auVar195._16_4_ = 3;
          auVar195._20_4_ = 3;
          auVar195._24_4_ = 3;
          auVar195._28_4_ = 3;
          auVar227._8_4_ = 2;
          auVar227._0_8_ = 0x200000002;
          auVar227._12_4_ = 2;
          auVar227._16_4_ = 2;
          auVar227._20_4_ = 2;
          auVar227._24_4_ = 2;
          auVar227._28_4_ = 2;
          auVar119 = vblendvps_avx(auVar227,auVar195,auVar164);
          auVar216 = vpcmpgtd_avx(auVar119._16_16_,local_620._0_16_);
          auVar180 = vpshufd_avx(local_600._0_16_,0);
          auVar180 = vpcmpgtd_avx(auVar119._0_16_,auVar180);
          auVar196._16_16_ = auVar216;
          auVar196._0_16_ = auVar126._0_16_;
          _local_840 = vblendps_avx(ZEXT1632(auVar180),auVar196,0xf0);
          auVar119 = vandnps_avx(_local_840,_local_860);
          auVar164 = _local_860 & ~_local_840;
          local_8c0 = auVar119;
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar164[0x1f] < '\0') {
            local_820._4_4_ = (float)local_8e0._4_4_ + local_340._4_4_;
            local_820._0_4_ = (float)local_8e0._0_4_ + local_340._0_4_;
            fStack_818 = fStack_8d8 + local_340._8_4_;
            fStack_814 = fStack_8d4 + local_340._12_4_;
            fStack_810 = fStack_8d0 + local_340._16_4_;
            fStack_80c = fStack_8cc + local_340._20_4_;
            fStack_808 = fStack_8c8 + local_340._24_4_;
            fStack_804 = fStack_8c4 + local_340._28_4_;
            _local_920 = local_340;
            do {
              auVar128._8_4_ = 0x7f800000;
              auVar128._0_8_ = 0x7f8000007f800000;
              auVar128._12_4_ = 0x7f800000;
              auVar128._16_4_ = 0x7f800000;
              auVar128._20_4_ = 0x7f800000;
              auVar128._24_4_ = 0x7f800000;
              auVar128._28_4_ = 0x7f800000;
              auVar164 = vblendvps_avx(auVar128,_local_920,auVar119);
              auVar27 = vshufps_avx(auVar164,auVar164,0xb1);
              auVar27 = vminps_avx(auVar164,auVar27);
              auVar28 = vshufpd_avx(auVar27,auVar27,5);
              auVar27 = vminps_avx(auVar27,auVar28);
              auVar28 = vperm2f128_avx(auVar27,auVar27,1);
              auVar27 = vminps_avx(auVar27,auVar28);
              auVar27 = vcmpps_avx(auVar164,auVar27,0);
              auVar28 = auVar119 & auVar27;
              auVar164 = auVar119;
              if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar28 >> 0x7f,0) != '\0') ||
                    (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0xbf,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar28[0x1f] < '\0') {
                auVar164 = vandps_avx(auVar27,auVar119);
              }
              uVar97 = vmovmskps_avx(auVar164);
              uVar100 = 0;
              if (uVar97 != 0) {
                for (; (uVar97 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
                }
              }
              uVar98 = (ulong)uVar100;
              local_8c0 = auVar119;
              *(undefined4 *)(local_8c0 + uVar98 * 4) = 0;
              fVar137 = local_1c0[uVar98];
              uVar100 = *(uint *)(local_320 + uVar98 * 4);
              fVar228 = auVar141._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                fVar228 = sqrtf((float)local_940._0_4_);
              }
              auVar180 = vminps_avx(auVar34,auVar11);
              auVar216 = vmaxps_avx(auVar34,auVar11);
              auVar114 = vminps_avx(auVar10,auVar12);
              auVar147 = vminps_avx(auVar180,auVar114);
              auVar180 = vmaxps_avx(auVar10,auVar12);
              auVar114 = vmaxps_avx(auVar216,auVar180);
              auVar213._8_4_ = 0x7fffffff;
              auVar213._0_8_ = 0x7fffffff7fffffff;
              auVar213._12_4_ = 0x7fffffff;
              auVar216 = vandps_avx(auVar147,auVar213);
              auVar180 = vandps_avx(auVar114,auVar213);
              auVar216 = vmaxps_avx(auVar216,auVar180);
              auVar180 = vmovshdup_avx(auVar216);
              auVar180 = vmaxss_avx(auVar180,auVar216);
              auVar216 = vshufpd_avx(auVar216,auVar216,1);
              auVar216 = vmaxss_avx(auVar216,auVar180);
              local_900 = auVar216._0_4_ * 1.9073486e-06;
              local_960._0_4_ = fVar228 * 1.9073486e-06;
              local_780._0_16_ = vshufps_avx(auVar114,auVar114,0xff);
              auVar216 = vinsertps_avx(ZEXT416(uVar100),ZEXT416((uint)fVar137),0x10);
              auVar379 = ZEXT1664(auVar216);
              lVar103 = 5;
              do {
                auVar371 = auVar379._0_16_;
                auVar216 = vshufps_avx(auVar371,auVar371,0);
                auVar113._0_4_ = auVar216._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar113._4_4_ = auVar216._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar113._8_4_ = auVar216._8_4_ * fStack_928 + 0.0;
                auVar113._12_4_ = auVar216._12_4_ * fStack_924 + 0.0;
                auVar216 = vmovshdup_avx(auVar371);
                fVar229 = auVar216._0_4_;
                fVar203 = 1.0 - fVar229;
                fVar228 = fVar229 * fVar229;
                fVar170 = fVar229 * 3.0;
                fVar137 = fVar170 + -5.0;
                auVar216 = ZEXT416((uint)(fVar229 * fVar229 * -fVar203 * 0.5));
                auVar216 = vshufps_avx(auVar216,auVar216,0);
                auVar180 = ZEXT416((uint)((fVar203 * fVar203 * (fVar203 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar180 = vshufps_avx(auVar180,auVar180,0);
                auVar114 = ZEXT416((uint)((fVar228 * fVar137 + 2.0) * 0.5));
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                auVar147 = ZEXT416((uint)(fVar203 * fVar203 * -fVar229 * 0.5));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar184._0_4_ =
                     auVar147._0_4_ * local_a80 +
                     auVar114._0_4_ * local_aa0 +
                     auVar180._0_4_ * local_a90 + auVar216._0_4_ * local_ab0;
                auVar184._4_4_ =
                     auVar147._4_4_ * fStack_a7c +
                     auVar114._4_4_ * fStack_a9c +
                     auVar180._4_4_ * fStack_a8c + auVar216._4_4_ * fStack_aac;
                auVar184._8_4_ =
                     auVar147._8_4_ * fStack_a78 +
                     auVar114._8_4_ * fStack_a98 +
                     auVar180._8_4_ * fStack_a88 + auVar216._8_4_ * fStack_aa8;
                auVar184._12_4_ =
                     auVar147._12_4_ * fStack_a74 +
                     auVar114._12_4_ * fStack_a94 +
                     auVar180._12_4_ * fStack_a84 + auVar216._12_4_ * fStack_aa4;
                _local_a00 = auVar184;
                auVar216 = vsubps_avx(auVar113,auVar184);
                _local_a40 = auVar216;
                auVar216 = vdpps_avx(auVar216,auVar216,0x7f);
                fVar173 = auVar216._0_4_;
                if (fVar173 < 0.0) {
                  local_980._0_4_ = fVar228;
                  local_9a0._0_4_ = fVar170;
                  local_9c0._0_4_ = fVar229 * 9.0;
                  local_9e0._0_4_ = fVar137;
                  local_760._0_4_ = fVar203 * -2.0;
                  fVar178 = sqrtf(fVar173);
                  fVar232 = (float)local_9c0._0_4_;
                  fVar230 = (float)local_760._0_4_;
                  fVar228 = (float)local_980._0_4_;
                  fVar231 = (float)local_9a0._0_4_;
                  fVar137 = (float)local_9e0._0_4_;
                }
                else {
                  auVar180 = vsqrtss_avx(auVar216,auVar216);
                  fVar178 = auVar180._0_4_;
                  fVar232 = fVar229 * 9.0;
                  fVar230 = fVar203 * -2.0;
                  fVar231 = fVar170;
                }
                auVar180 = ZEXT416((uint)((fVar228 + fVar229 * fVar230) * 0.5));
                auVar180 = vshufps_avx(auVar180,auVar180,0);
                auVar114 = ZEXT416((uint)(((fVar203 + fVar203) * (fVar231 + 2.0) +
                                          fVar203 * fVar203 * -3.0) * 0.5));
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                auVar147 = ZEXT416((uint)((fVar137 * (fVar229 + fVar229) + fVar229 * fVar231) * 0.5)
                                  );
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar148 = ZEXT416((uint)((fVar229 * (fVar203 + fVar203) - fVar203 * fVar203) * 0.5)
                                  );
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                auVar362._0_4_ =
                     local_a80 * auVar148._0_4_ +
                     local_aa0 * auVar147._0_4_ +
                     local_ab0 * auVar180._0_4_ + local_a90 * auVar114._0_4_;
                auVar362._4_4_ =
                     fStack_a7c * auVar148._4_4_ +
                     fStack_a9c * auVar147._4_4_ +
                     fStack_aac * auVar180._4_4_ + fStack_a8c * auVar114._4_4_;
                auVar362._8_4_ =
                     fStack_a78 * auVar148._8_4_ +
                     fStack_a98 * auVar147._8_4_ +
                     fStack_aa8 * auVar180._8_4_ + fStack_a88 * auVar114._8_4_;
                auVar362._12_4_ =
                     fStack_a74 * auVar148._12_4_ +
                     fStack_a94 * auVar147._12_4_ +
                     fStack_aa4 * auVar180._12_4_ + fStack_a84 * auVar114._12_4_;
                auVar148 = vpermilps_avx(ZEXT416((uint)(fVar170 + -1.0)),0);
                auVar13 = vpermilps_avx(ZEXT416((uint)(fVar229 * -9.0 + 4.0)),0);
                auVar180 = vshufps_avx(ZEXT416((uint)(fVar232 + -5.0)),
                                       ZEXT416((uint)(fVar232 + -5.0)),0);
                auVar114 = ZEXT416((uint)(fVar229 * -3.0 + 2.0));
                auVar147 = vshufps_avx(auVar114,auVar114,0);
                auVar114 = vdpps_avx(auVar362,auVar362,0x7f);
                auVar149._0_4_ =
                     local_a80 * auVar147._0_4_ +
                     local_aa0 * auVar180._0_4_ +
                     local_a90 * auVar13._0_4_ + local_ab0 * auVar148._0_4_;
                auVar149._4_4_ =
                     fStack_a7c * auVar147._4_4_ +
                     fStack_a9c * auVar180._4_4_ +
                     fStack_a8c * auVar13._4_4_ + fStack_aac * auVar148._4_4_;
                auVar149._8_4_ =
                     fStack_a78 * auVar147._8_4_ +
                     fStack_a98 * auVar180._8_4_ +
                     fStack_a88 * auVar13._8_4_ + fStack_aa8 * auVar148._8_4_;
                auVar149._12_4_ =
                     fStack_a74 * auVar147._12_4_ +
                     fStack_a94 * auVar180._12_4_ +
                     fStack_a84 * auVar13._12_4_ + fStack_aa4 * auVar148._12_4_;
                auVar180 = vblendps_avx(auVar114,_DAT_01f7aa10,0xe);
                auVar147 = vrsqrtss_avx(auVar180,auVar180);
                fVar228 = auVar147._0_4_;
                fVar137 = auVar114._0_4_;
                auVar147 = vdpps_avx(auVar362,auVar149,0x7f);
                auVar148 = vshufps_avx(auVar114,auVar114,0);
                auVar150._0_4_ = auVar149._0_4_ * auVar148._0_4_;
                auVar150._4_4_ = auVar149._4_4_ * auVar148._4_4_;
                auVar150._8_4_ = auVar149._8_4_ * auVar148._8_4_;
                auVar150._12_4_ = auVar149._12_4_ * auVar148._12_4_;
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar241._0_4_ = auVar362._0_4_ * auVar147._0_4_;
                auVar241._4_4_ = auVar362._4_4_ * auVar147._4_4_;
                auVar241._8_4_ = auVar362._8_4_ * auVar147._8_4_;
                auVar241._12_4_ = auVar362._12_4_ * auVar147._12_4_;
                auVar13 = vsubps_avx(auVar150,auVar241);
                auVar147 = vrcpss_avx(auVar180,auVar180);
                auVar180 = vmaxss_avx(ZEXT416((uint)local_900),
                                      ZEXT416((uint)(auVar379._0_4_ * (float)local_960._0_4_)));
                auVar147 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - fVar137 * auVar147._0_4_)));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                uVar98 = CONCAT44(auVar362._4_4_,auVar362._0_4_);
                auVar265._0_8_ = uVar98 ^ 0x8000000080000000;
                auVar265._8_4_ = -auVar362._8_4_;
                auVar265._12_4_ = -auVar362._12_4_;
                auVar148 = ZEXT416((uint)(fVar228 * 1.5 +
                                         fVar137 * -0.5 * fVar228 * fVar228 * fVar228));
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                auVar214._0_4_ = auVar148._0_4_ * auVar13._0_4_ * auVar147._0_4_;
                auVar214._4_4_ = auVar148._4_4_ * auVar13._4_4_ * auVar147._4_4_;
                auVar214._8_4_ = auVar148._8_4_ * auVar13._8_4_ * auVar147._8_4_;
                auVar214._12_4_ = auVar148._12_4_ * auVar13._12_4_ * auVar147._12_4_;
                auVar281._0_4_ = auVar362._0_4_ * auVar148._0_4_;
                auVar281._4_4_ = auVar362._4_4_ * auVar148._4_4_;
                auVar281._8_4_ = auVar362._8_4_ * auVar148._8_4_;
                auVar281._12_4_ = auVar362._12_4_ * auVar148._12_4_;
                if (fVar137 < 0.0) {
                  local_980._0_16_ = auVar281;
                  fVar137 = sqrtf(fVar137);
                  auVar281 = local_980._0_16_;
                }
                else {
                  auVar114 = vsqrtss_avx(auVar114,auVar114);
                  fVar137 = auVar114._0_4_;
                }
                auVar114 = vdpps_avx(_local_a40,auVar281,0x7f);
                fVar137 = (local_900 / fVar137) * (fVar178 + 1.0) +
                          auVar180._0_4_ + fVar178 * local_900;
                auVar147 = vdpps_avx(auVar265,auVar281,0x7f);
                auVar148 = vdpps_avx(_local_a40,auVar214,0x7f);
                auVar13 = vdpps_avx(_local_930,auVar281,0x7f);
                auVar14 = vdpps_avx(_local_a40,auVar265,0x7f);
                fVar228 = auVar147._0_4_ + auVar148._0_4_;
                fVar170 = auVar114._0_4_;
                auVar115._0_4_ = fVar170 * fVar170;
                auVar115._4_4_ = auVar114._4_4_ * auVar114._4_4_;
                auVar115._8_4_ = auVar114._8_4_ * auVar114._8_4_;
                auVar115._12_4_ = auVar114._12_4_ * auVar114._12_4_;
                auVar148 = vsubps_avx(auVar216,auVar115);
                auVar147 = vdpps_avx(_local_a40,_local_930,0x7f);
                fVar203 = auVar14._0_4_ - fVar170 * fVar228;
                fVar229 = auVar147._0_4_ - fVar170 * auVar13._0_4_;
                auVar147 = vrsqrtss_avx(auVar148,auVar148);
                fVar178 = auVar148._0_4_;
                fVar170 = auVar147._0_4_;
                fVar170 = fVar170 * 1.5 + fVar178 * -0.5 * fVar170 * fVar170 * fVar170;
                if (fVar178 < 0.0) {
                  local_980._0_16_ = auVar114;
                  local_9a0._0_4_ = fVar203;
                  local_9c0._0_4_ = fVar229;
                  local_9e0._0_4_ = fVar170;
                  fVar178 = sqrtf(fVar178);
                  fVar170 = (float)local_9e0._0_4_;
                  fVar203 = (float)local_9a0._0_4_;
                  fVar229 = (float)local_9c0._0_4_;
                  auVar114 = local_980._0_16_;
                }
                else {
                  auVar147 = vsqrtss_avx(auVar148,auVar148);
                  fVar178 = auVar147._0_4_;
                }
                auVar14 = vpermilps_avx(_local_a00,0xff);
                auVar15 = vshufps_avx(auVar362,auVar362,0xff);
                fVar203 = fVar203 * fVar170 - auVar15._0_4_;
                auVar242._0_8_ = auVar13._0_8_ ^ 0x8000000080000000;
                auVar242._8_4_ = auVar13._8_4_ ^ 0x80000000;
                auVar242._12_4_ = auVar13._12_4_ ^ 0x80000000;
                auVar266._0_4_ = -fVar203;
                auVar266._4_4_ = 0x80000000;
                auVar266._8_4_ = 0x80000000;
                auVar266._12_4_ = 0x80000000;
                auVar147 = vinsertps_avx(auVar266,ZEXT416((uint)(fVar229 * fVar170)),0x1c);
                auVar13 = vmovsldup_avx(ZEXT416((uint)(fVar228 * fVar229 * fVar170 -
                                                      auVar13._0_4_ * fVar203)));
                auVar147 = vdivps_avx(auVar147,auVar13);
                auVar148 = vinsertps_avx(ZEXT416((uint)fVar228),auVar242,0x10);
                auVar148 = vdivps_avx(auVar148,auVar13);
                auVar13 = vmovsldup_avx(auVar114);
                auVar116 = ZEXT416((uint)(fVar178 - auVar14._0_4_));
                auVar14 = vmovsldup_avx(auVar116);
                auVar185._0_4_ = auVar13._0_4_ * auVar147._0_4_ + auVar14._0_4_ * auVar148._0_4_;
                auVar185._4_4_ = auVar13._4_4_ * auVar147._4_4_ + auVar14._4_4_ * auVar148._4_4_;
                auVar185._8_4_ = auVar13._8_4_ * auVar147._8_4_ + auVar14._8_4_ * auVar148._8_4_;
                auVar185._12_4_ =
                     auVar13._12_4_ * auVar147._12_4_ + auVar14._12_4_ * auVar148._12_4_;
                auVar147 = vsubps_avx(auVar371,auVar185);
                auVar379 = ZEXT1664(auVar147);
                auVar186._8_4_ = 0x7fffffff;
                auVar186._0_8_ = 0x7fffffff7fffffff;
                auVar186._12_4_ = 0x7fffffff;
                auVar114 = vandps_avx(auVar114,auVar186);
                if (auVar114._0_4_ < fVar137) {
                  auVar215._8_4_ = 0x7fffffff;
                  auVar215._0_8_ = 0x7fffffff7fffffff;
                  auVar215._12_4_ = 0x7fffffff;
                  auVar114 = vandps_avx(auVar116,auVar215);
                  if (auVar114._0_4_ <
                      (float)local_780._0_4_ * 1.9073486e-06 + auVar180._0_4_ + fVar137) {
                    fVar137 = auVar147._0_4_ + (float)local_890._0_4_;
                    if ((fVar205 <= fVar137) &&
                       (fVar228 = *(float *)(ray + k * 4 + 0x80), fVar137 <= fVar228)) {
                      auVar180 = vmovshdup_avx(auVar147);
                      fVar170 = auVar180._0_4_;
                      if ((0.0 <= fVar170) && (fVar170 <= 1.0)) {
                        auVar216 = vrsqrtss_avx(auVar216,auVar216);
                        fVar203 = auVar216._0_4_;
                        pGVar23 = (context->scene->geometries).items[uVar101].ptr;
                        if ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          auVar216 = ZEXT416((uint)(fVar203 * 1.5 +
                                                   fVar173 * -0.5 * fVar203 * fVar203 * fVar203));
                          auVar216 = vshufps_avx(auVar216,auVar216,0);
                          auVar217._0_4_ = auVar216._0_4_ * (float)local_a40._0_4_;
                          auVar217._4_4_ = auVar216._4_4_ * (float)local_a40._4_4_;
                          auVar217._8_4_ = auVar216._8_4_ * fStack_a38;
                          auVar217._12_4_ = auVar216._12_4_ * fStack_a34;
                          auVar151._0_4_ = auVar362._0_4_ + auVar15._0_4_ * auVar217._0_4_;
                          auVar151._4_4_ = auVar362._4_4_ + auVar15._4_4_ * auVar217._4_4_;
                          auVar151._8_4_ = auVar362._8_4_ + auVar15._8_4_ * auVar217._8_4_;
                          auVar151._12_4_ = auVar362._12_4_ + auVar15._12_4_ * auVar217._12_4_;
                          auVar216 = vshufps_avx(auVar217,auVar217,0xc9);
                          auVar180 = vshufps_avx(auVar362,auVar362,0xc9);
                          auVar218._0_4_ = auVar180._0_4_ * auVar217._0_4_;
                          auVar218._4_4_ = auVar180._4_4_ * auVar217._4_4_;
                          auVar218._8_4_ = auVar180._8_4_ * auVar217._8_4_;
                          auVar218._12_4_ = auVar180._12_4_ * auVar217._12_4_;
                          auVar243._0_4_ = auVar362._0_4_ * auVar216._0_4_;
                          auVar243._4_4_ = auVar362._4_4_ * auVar216._4_4_;
                          auVar243._8_4_ = auVar362._8_4_ * auVar216._8_4_;
                          auVar243._12_4_ = auVar362._12_4_ * auVar216._12_4_;
                          auVar114 = vsubps_avx(auVar243,auVar218);
                          auVar216 = vshufps_avx(auVar114,auVar114,0xc9);
                          auVar180 = vshufps_avx(auVar151,auVar151,0xc9);
                          auVar244._0_4_ = auVar180._0_4_ * auVar216._0_4_;
                          auVar244._4_4_ = auVar180._4_4_ * auVar216._4_4_;
                          auVar244._8_4_ = auVar180._8_4_ * auVar216._8_4_;
                          auVar244._12_4_ = auVar180._12_4_ * auVar216._12_4_;
                          auVar216 = vshufps_avx(auVar114,auVar114,0xd2);
                          auVar152._0_4_ = auVar151._0_4_ * auVar216._0_4_;
                          auVar152._4_4_ = auVar151._4_4_ * auVar216._4_4_;
                          auVar152._8_4_ = auVar151._8_4_ * auVar216._8_4_;
                          auVar152._12_4_ = auVar151._12_4_ * auVar216._12_4_;
                          auVar216 = vsubps_avx(auVar244,auVar152);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar23->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar137;
                            uVar8 = vextractps_avx(auVar216,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                            uVar8 = vextractps_avx(auVar216,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                            *(int *)(ray + k * 4 + 0xe0) = auVar216._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar170;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_a08;
                            *(uint *)(ray + k * 4 + 0x120) = uVar101;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_6f0 = vshufps_avx(auVar147,auVar147,0x55);
                            auVar180 = vshufps_avx(auVar216,auVar216,0x55);
                            auStack_710 = vshufps_avx(auVar216,auVar216,0xaa);
                            local_700 = vshufps_avx(auVar216,auVar216,0);
                            local_720 = (RTCHitN  [16])auVar180;
                            local_6e0 = ZEXT816(0) << 0x20;
                            local_6d0 = local_740._0_8_;
                            uStack_6c8 = local_740._8_8_;
                            local_6c0 = local_730._0_8_;
                            uStack_6b8 = local_730._8_8_;
                            uVar100 = context->user->instID[0];
                            _local_6b0 = CONCAT44(uVar100,uVar100);
                            _uStack_6a8 = CONCAT44(uVar100,uVar100);
                            uVar100 = context->user->instPrimID[0];
                            auVar153._4_4_ = uVar100;
                            auVar153._0_4_ = uVar100;
                            auVar153._8_4_ = uVar100;
                            auVar153._12_4_ = uVar100;
                            auStack_6a0 = auVar153;
                            *(float *)(ray + k * 4 + 0x80) = fVar137;
                            local_880 = *local_a10;
                            local_a70.valid = (int *)local_880;
                            local_a70.geometryUserPtr = pGVar23->userPtr;
                            local_a70.context = context->user;
                            local_a70.hit = local_720;
                            local_a70.N = 4;
                            local_a70.ray = (RTCRayN *)ray;
                            if (pGVar23->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar379 = ZEXT1664(auVar147);
                              (*pGVar23->intersectionFilterN)(&local_a70);
                              auVar167._8_56_ = extraout_var_00;
                              auVar167._0_8_ = extraout_XMM1_Qa_00;
                              auVar153 = auVar167._0_16_;
                            }
                            if (local_880 == (undefined1  [16])0x0) {
                              auVar216 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar180 = vpcmpeqd_avx(auVar153,auVar153);
                              auVar216 = auVar216 ^ auVar180;
                            }
                            else {
                              p_Var26 = context->args->filter;
                              auVar180 = vpcmpeqd_avx(auVar180,auVar180);
                              if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar23->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar379 = ZEXT1664(auVar379._0_16_);
                                (*p_Var26)(&local_a70);
                                auVar180 = vpcmpeqd_avx(auVar180,auVar180);
                              }
                              auVar114 = vpcmpeqd_avx(local_880,_DAT_01f7aa10);
                              auVar216 = auVar114 ^ auVar180;
                              if (local_880 != (undefined1  [16])0x0) {
                                auVar114 = auVar114 ^ auVar180;
                                auVar180 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])
                                                                    local_a70.hit);
                                *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar180;
                                auVar180 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x10));
                                *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar180;
                                auVar180 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x20));
                                *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar180;
                                auVar180 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x30));
                                *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar180;
                                auVar180 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x40));
                                *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar180;
                                auVar180 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x50));
                                *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar180;
                                auVar180 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x60));
                                *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar180;
                                auVar180 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x70));
                                *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar180;
                                auVar180 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])
                                                                    (local_a70.hit + 0x80));
                                *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar180;
                              }
                            }
                            auVar117._8_8_ = 0x100000001;
                            auVar117._0_8_ = 0x100000001;
                            if ((auVar117 & auVar216) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar228;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar103 = lVar103 + -1;
              } while (lVar103 != 0);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar126._4_4_ = uVar8;
              auVar126._0_4_ = uVar8;
              auVar126._8_4_ = uVar8;
              auVar126._12_4_ = uVar8;
              auVar126._16_4_ = uVar8;
              auVar126._20_4_ = uVar8;
              auVar126._24_4_ = uVar8;
              auVar126._28_4_ = uVar8;
              auVar164 = vcmpps_avx(_local_820,auVar126,2);
              auVar119 = vandps_avx(auVar164,local_8c0);
              auVar164 = local_8c0 & auVar164;
              local_8c0 = auVar119;
            } while ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar164 >> 0x7f,0) != '\0') ||
                       (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar164 >> 0xbf,0) != '\0') ||
                     (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar164[0x1f] < '\0');
          }
          auVar339 = ZEXT3264(local_340);
          auVar119 = vandps_avx(_local_660,local_5a0);
          auVar164 = vandps_avx(_local_860,_local_840);
          auVar249._0_4_ = (float)local_8e0._0_4_ + local_380._0_4_;
          auVar249._4_4_ = (float)local_8e0._4_4_ + local_380._4_4_;
          auVar249._8_4_ = fStack_8d8 + local_380._8_4_;
          auVar249._12_4_ = fStack_8d4 + local_380._12_4_;
          auVar249._16_4_ = fStack_8d0 + local_380._16_4_;
          auVar249._20_4_ = fStack_8cc + local_380._20_4_;
          auVar249._24_4_ = fStack_8c8 + local_380._24_4_;
          auVar249._28_4_ = fStack_8c4 + local_380._28_4_;
          auVar27 = vcmpps_avx(auVar249,auVar126,2);
          auVar119 = vandps_avx(auVar27,auVar119);
          auVar250._0_4_ = local_340._0_4_ + (float)local_8e0._0_4_;
          auVar250._4_4_ = local_340._4_4_ + (float)local_8e0._4_4_;
          auVar250._8_4_ = local_340._8_4_ + fStack_8d8;
          auVar250._12_4_ = local_340._12_4_ + fStack_8d4;
          auVar250._16_4_ = local_340._16_4_ + fStack_8d0;
          auVar250._20_4_ = local_340._20_4_ + fStack_8cc;
          auVar250._24_4_ = local_340._24_4_ + fStack_8c8;
          auVar250._28_4_ = local_340._28_4_ + fStack_8c4;
          auVar27 = vcmpps_avx(auVar250,auVar126,2);
          auVar164 = vandps_avx(auVar27,auVar164);
          auVar164 = vorps_avx(auVar119,auVar164);
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar164[0x1f] < '\0') {
            uVar98 = (ulong)uVar106;
            *(undefined1 (*) [32])(auStack_180 + uVar98 * 0x60) = auVar164;
            auVar119 = vblendvps_avx(local_340,_local_380,auVar119);
            *(undefined1 (*) [32])(auStack_160 + uVar98 * 0x60) = auVar119;
            uVar9 = vmovlps_avx(local_550);
            (&uStack_140)[uVar98 * 0xc] = uVar9;
            aiStack_138[uVar98 * 0x18] = local_c28 + 1;
            uVar106 = uVar106 + 1;
          }
        }
      }
    }
    if (uVar106 == 0) break;
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar129._4_4_ = uVar8;
    auVar129._0_4_ = uVar8;
    auVar129._8_4_ = uVar8;
    auVar129._12_4_ = uVar8;
    auVar129._16_4_ = uVar8;
    auVar129._20_4_ = uVar8;
    auVar129._24_4_ = uVar8;
    auVar129._28_4_ = uVar8;
    uVar100 = -uVar106;
    pauVar99 = (undefined1 (*) [32])(auStack_180 + (ulong)(uVar106 - 1) * 0x60);
    while( true ) {
      auVar119 = pauVar99[1];
      auVar165._0_4_ = (float)local_8e0._0_4_ + auVar119._0_4_;
      auVar165._4_4_ = (float)local_8e0._4_4_ + auVar119._4_4_;
      auVar165._8_4_ = fStack_8d8 + auVar119._8_4_;
      auVar165._12_4_ = fStack_8d4 + auVar119._12_4_;
      auVar165._16_4_ = fStack_8d0 + auVar119._16_4_;
      auVar165._20_4_ = fStack_8cc + auVar119._20_4_;
      auVar165._24_4_ = fStack_8c8 + auVar119._24_4_;
      auVar165._28_4_ = fStack_8c4 + auVar119._28_4_;
      auVar27 = vcmpps_avx(auVar165,auVar129,2);
      auVar164 = vandps_avx(auVar27,*pauVar99);
      _local_720 = auVar164;
      auVar27 = *pauVar99 & auVar27;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0x7f,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0xbf,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar27[0x1f] < '\0') break;
      pauVar99 = pauVar99 + -3;
      uVar100 = uVar100 + 1;
      if (uVar100 == 0) goto LAB_011a7dd6;
    }
    auVar130._8_4_ = 0x7f800000;
    auVar130._0_8_ = 0x7f8000007f800000;
    auVar130._12_4_ = 0x7f800000;
    auVar130._16_4_ = 0x7f800000;
    auVar130._20_4_ = 0x7f800000;
    auVar130._24_4_ = 0x7f800000;
    auVar130._28_4_ = 0x7f800000;
    auVar119 = vblendvps_avx(auVar130,auVar119,auVar164);
    auVar27 = vshufps_avx(auVar119,auVar119,0xb1);
    auVar27 = vminps_avx(auVar119,auVar27);
    auVar28 = vshufpd_avx(auVar27,auVar27,5);
    auVar27 = vminps_avx(auVar27,auVar28);
    auVar28 = vperm2f128_avx(auVar27,auVar27,1);
    auVar27 = vminps_avx(auVar27,auVar28);
    auVar119 = vcmpps_avx(auVar119,auVar27,0);
    auVar27 = auVar164 & auVar119;
    if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0x7f,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar27 >> 0xbf,0) != '\0') ||
        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar27[0x1f] < '\0')
    {
      auVar164 = vandps_avx(auVar119,auVar164);
    }
    auVar118._8_8_ = 0;
    auVar118._0_8_ = *(ulong *)pauVar99[2];
    local_c28 = *(uint *)(pauVar99[2] + 8);
    uVar106 = vmovmskps_avx(auVar164);
    uVar97 = 0;
    if (uVar106 != 0) {
      for (; (uVar106 >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
      }
    }
    *(undefined4 *)(local_720 + (ulong)uVar97 * 4) = 0;
    *pauVar99 = _local_720;
    uVar106 = ~uVar100;
    if ((((((((_local_720 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_720 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_720 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_720 >> 0x7f,0) != '\0') ||
          (_local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_720 >> 0xbf,0) != '\0') ||
        (_local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_720[0x1f] < '\0') {
      uVar106 = -uVar100;
    }
    auVar216 = vshufps_avx(auVar118,auVar118,0);
    auVar180 = vshufps_avx(auVar118,auVar118,0x55);
    auVar180 = vsubps_avx(auVar180,auVar216);
    local_380._4_4_ = auVar216._4_4_ + auVar180._4_4_ * 0.14285715;
    local_380._0_4_ = auVar216._0_4_ + auVar180._0_4_ * 0.0;
    fStack_378 = auVar216._8_4_ + auVar180._8_4_ * 0.2857143;
    fStack_374 = auVar216._12_4_ + auVar180._12_4_ * 0.42857146;
    fStack_370 = auVar216._0_4_ + auVar180._0_4_ * 0.5714286;
    fStack_36c = auVar216._4_4_ + auVar180._4_4_ * 0.71428573;
    fStack_368 = auVar216._8_4_ + auVar180._8_4_ * 0.8571429;
    fStack_364 = auVar216._12_4_ + auVar180._12_4_;
    local_550._8_8_ = 0;
    local_550._0_8_ = *(ulong *)(local_380 + (ulong)uVar97 * 4);
  } while( true );
LAB_011a7dd6:
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar132._4_4_ = uVar8;
  auVar132._0_4_ = uVar8;
  auVar132._8_4_ = uVar8;
  auVar132._12_4_ = uVar8;
  auVar132._16_4_ = uVar8;
  auVar132._20_4_ = uVar8;
  auVar132._24_4_ = uVar8;
  auVar132._28_4_ = uVar8;
  auVar119 = vcmpps_avx(local_2a0,auVar132,2);
  uVar101 = vmovmskps_avx(auVar119);
  uVar96 = uVar96 - 1 & uVar96 & uVar101;
  if (uVar96 == 0) {
    return;
  }
  goto LAB_011a4e8b;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }